

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [32];
  undefined4 uVar13;
  Primitive PVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined4 uVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  RTCFilterFunctionN p_Var22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [12];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [24];
  undefined1 auVar123 [28];
  uint uVar124;
  uint uVar125;
  uint uVar126;
  ulong uVar127;
  ulong uVar128;
  uint uVar129;
  long lVar130;
  undefined1 auVar131 [8];
  long lVar132;
  float fVar133;
  float fVar156;
  float fVar157;
  vint4 bi_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar160;
  float fVar163;
  float fVar165;
  float fVar167;
  undefined1 auVar141 [32];
  float fVar158;
  float fVar161;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar159;
  float fVar162;
  float fVar164;
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  float fVar170;
  float fVar190;
  float fVar191;
  vint4 bi;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar195;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar196;
  float fVar209;
  float fVar210;
  vint4 bi_2;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar211;
  float fVar212;
  undefined1 auVar206 [32];
  float fVar213;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar214;
  float fVar227;
  float fVar229;
  vint4 ai_1;
  undefined1 auVar215 [16];
  float fVar231;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar234;
  float fVar235;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar230;
  float fVar232;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar228;
  float fVar233;
  float fVar236;
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar249;
  float fVar252;
  vint4 ai_2;
  undefined1 auVar240 [16];
  float fVar254;
  undefined1 auVar241 [16];
  float fVar250;
  undefined1 auVar243 [16];
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar256;
  float fVar263;
  float fVar264;
  undefined1 auVar257 [16];
  float fVar266;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar265;
  undefined1 auVar262 [64];
  float fVar274;
  float fVar275;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar276;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar277;
  undefined1 auVar273 [32];
  vint4 ai;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float fVar298;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar299;
  float fVar301;
  undefined1 auVar295 [32];
  float fVar300;
  float fVar302;
  undefined1 auVar296 [32];
  undefined1 auVar297 [64];
  float fVar303;
  float fVar310;
  float fVar311;
  undefined1 auVar304 [16];
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar305 [32];
  float fVar316;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  undefined1 auVar317 [16];
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  float fVar327;
  float fVar330;
  float fVar331;
  undefined1 auVar328 [16];
  float fVar332;
  float fVar333;
  undefined1 auVar329 [32];
  float fVar334;
  float fVar342;
  undefined1 auVar335 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar343;
  float fVar347;
  float fVar348;
  undefined1 auVar344 [16];
  float fVar349;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar350;
  float fVar351;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar353 [32];
  float fVar358;
  float fVar359;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 uStack_8d8;
  undefined8 uStack_858;
  undefined8 uStack_848;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [8];
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 *local_758;
  undefined1 (*local_750) [16];
  undefined1 (*local_748) [32];
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  LinearSpace3fa *local_610;
  Primitive *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  uint local_380;
  uint local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  RTCHitN local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar242 [16];
  undefined1 auVar336 [16];
  undefined1 auVar352 [16];
  undefined1 auVar360 [16];
  
  PVar14 = prim[1];
  uVar127 = (ulong)(byte)PVar14;
  lVar23 = uVar127 * 0x25;
  fVar327 = *(float *)(prim + lVar23 + 0x12);
  auVar176 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar176 = vinsertps_avx(auVar176,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar202 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar202 = vinsertps_avx(auVar202,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar176 = vsubps_avx(auVar176,*(undefined1 (*) [16])(prim + lVar23 + 6));
  auVar171._0_4_ = fVar327 * auVar176._0_4_;
  auVar171._4_4_ = fVar327 * auVar176._4_4_;
  auVar171._8_4_ = fVar327 * auVar176._8_4_;
  auVar171._12_4_ = fVar327 * auVar176._12_4_;
  auVar278._0_4_ = fVar327 * auVar202._0_4_;
  auVar278._4_4_ = fVar327 * auVar202._4_4_;
  auVar278._8_4_ = fVar327 * auVar202._8_4_;
  auVar278._12_4_ = fVar327 * auVar202._12_4_;
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 4 + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 5 + 6)));
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 6 + 6)));
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar219 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0xf + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + 6)));
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar127 + 6)));
  auVar220 = vcvtdq2ps_avx(auVar220);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1a + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1b + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vshufps_avx(auVar278,auVar278,0);
  auVar29 = vshufps_avx(auVar278,auVar278,0x55);
  auVar30 = vshufps_avx(auVar278,auVar278,0xaa);
  fVar327 = auVar30._0_4_;
  fVar228 = auVar30._4_4_;
  fVar212 = auVar30._8_4_;
  fVar233 = auVar30._12_4_;
  fVar237 = auVar29._0_4_;
  fVar249 = auVar29._4_4_;
  fVar252 = auVar29._8_4_;
  fVar254 = auVar29._12_4_;
  fVar214 = auVar28._0_4_;
  fVar227 = auVar28._4_4_;
  fVar229 = auVar28._8_4_;
  fVar231 = auVar28._12_4_;
  auVar335._0_4_ = fVar214 * auVar176._0_4_ + fVar237 * auVar202._0_4_ + fVar327 * auVar203._0_4_;
  auVar335._4_4_ = fVar227 * auVar176._4_4_ + fVar249 * auVar202._4_4_ + fVar228 * auVar203._4_4_;
  auVar335._8_4_ = fVar229 * auVar176._8_4_ + fVar252 * auVar202._8_4_ + fVar212 * auVar203._8_4_;
  auVar335._12_4_ =
       fVar231 * auVar176._12_4_ + fVar254 * auVar202._12_4_ + fVar233 * auVar203._12_4_;
  auVar344._0_4_ = fVar214 * auVar219._0_4_ + fVar237 * auVar220._0_4_ + auVar24._0_4_ * fVar327;
  auVar344._4_4_ = fVar227 * auVar219._4_4_ + fVar249 * auVar220._4_4_ + auVar24._4_4_ * fVar228;
  auVar344._8_4_ = fVar229 * auVar219._8_4_ + fVar252 * auVar220._8_4_ + auVar24._8_4_ * fVar212;
  auVar344._12_4_ = fVar231 * auVar219._12_4_ + fVar254 * auVar220._12_4_ + auVar24._12_4_ * fVar233
  ;
  auVar279._0_4_ = fVar214 * auVar25._0_4_ + fVar237 * auVar26._0_4_ + auVar27._0_4_ * fVar327;
  auVar279._4_4_ = fVar227 * auVar25._4_4_ + fVar249 * auVar26._4_4_ + auVar27._4_4_ * fVar228;
  auVar279._8_4_ = fVar229 * auVar25._8_4_ + fVar252 * auVar26._8_4_ + auVar27._8_4_ * fVar212;
  auVar279._12_4_ = fVar231 * auVar25._12_4_ + fVar254 * auVar26._12_4_ + auVar27._12_4_ * fVar233;
  auVar28 = vshufps_avx(auVar171,auVar171,0);
  auVar29 = vshufps_avx(auVar171,auVar171,0x55);
  auVar30 = vshufps_avx(auVar171,auVar171,0xaa);
  fVar327 = auVar30._0_4_;
  fVar228 = auVar30._4_4_;
  fVar212 = auVar30._8_4_;
  fVar233 = auVar30._12_4_;
  fVar237 = auVar29._0_4_;
  fVar249 = auVar29._4_4_;
  fVar252 = auVar29._8_4_;
  fVar254 = auVar29._12_4_;
  fVar214 = auVar28._0_4_;
  fVar227 = auVar28._4_4_;
  fVar229 = auVar28._8_4_;
  fVar231 = auVar28._12_4_;
  auVar172._0_4_ = fVar214 * auVar176._0_4_ + fVar237 * auVar202._0_4_ + fVar327 * auVar203._0_4_;
  auVar172._4_4_ = fVar227 * auVar176._4_4_ + fVar249 * auVar202._4_4_ + fVar228 * auVar203._4_4_;
  auVar172._8_4_ = fVar229 * auVar176._8_4_ + fVar252 * auVar202._8_4_ + fVar212 * auVar203._8_4_;
  auVar172._12_4_ =
       fVar231 * auVar176._12_4_ + fVar254 * auVar202._12_4_ + fVar233 * auVar203._12_4_;
  auVar134._0_4_ = fVar214 * auVar219._0_4_ + auVar24._0_4_ * fVar327 + fVar237 * auVar220._0_4_;
  auVar134._4_4_ = fVar227 * auVar219._4_4_ + auVar24._4_4_ * fVar228 + fVar249 * auVar220._4_4_;
  auVar134._8_4_ = fVar229 * auVar219._8_4_ + auVar24._8_4_ * fVar212 + fVar252 * auVar220._8_4_;
  auVar134._12_4_ = fVar231 * auVar219._12_4_ + auVar24._12_4_ * fVar233 + fVar254 * auVar220._12_4_
  ;
  auVar291._8_4_ = 0x7fffffff;
  auVar291._0_8_ = 0x7fffffff7fffffff;
  auVar291._12_4_ = 0x7fffffff;
  auVar176 = vandps_avx(auVar335,auVar291);
  auVar240._8_4_ = 0x219392ef;
  auVar240._0_8_ = 0x219392ef219392ef;
  auVar240._12_4_ = 0x219392ef;
  auVar176 = vcmpps_avx(auVar176,auVar240,1);
  auVar202 = vblendvps_avx(auVar335,auVar240,auVar176);
  auVar176 = vandps_avx(auVar344,auVar291);
  auVar176 = vcmpps_avx(auVar176,auVar240,1);
  auVar203 = vblendvps_avx(auVar344,auVar240,auVar176);
  auVar176 = vandps_avx(auVar291,auVar279);
  auVar176 = vcmpps_avx(auVar176,auVar240,1);
  auVar176 = vblendvps_avx(auVar279,auVar240,auVar176);
  auVar197._0_4_ = fVar214 * auVar25._0_4_ + fVar237 * auVar26._0_4_ + auVar27._0_4_ * fVar327;
  auVar197._4_4_ = fVar227 * auVar25._4_4_ + fVar249 * auVar26._4_4_ + auVar27._4_4_ * fVar228;
  auVar197._8_4_ = fVar229 * auVar25._8_4_ + fVar252 * auVar26._8_4_ + auVar27._8_4_ * fVar212;
  auVar197._12_4_ = fVar231 * auVar25._12_4_ + fVar254 * auVar26._12_4_ + auVar27._12_4_ * fVar233;
  auVar219 = vrcpps_avx(auVar202);
  fVar214 = auVar219._0_4_;
  auVar215._0_4_ = fVar214 * auVar202._0_4_;
  fVar227 = auVar219._4_4_;
  auVar215._4_4_ = fVar227 * auVar202._4_4_;
  fVar229 = auVar219._8_4_;
  auVar215._8_4_ = fVar229 * auVar202._8_4_;
  fVar231 = auVar219._12_4_;
  auVar215._12_4_ = fVar231 * auVar202._12_4_;
  auVar267._8_4_ = 0x3f800000;
  auVar267._0_8_ = 0x3f8000003f800000;
  auVar267._12_4_ = 0x3f800000;
  auVar202 = vsubps_avx(auVar267,auVar215);
  fVar214 = fVar214 + fVar214 * auVar202._0_4_;
  fVar227 = fVar227 + fVar227 * auVar202._4_4_;
  fVar229 = fVar229 + fVar229 * auVar202._8_4_;
  fVar231 = fVar231 + fVar231 * auVar202._12_4_;
  auVar202 = vrcpps_avx(auVar203);
  fVar237 = auVar202._0_4_;
  auVar257._0_4_ = fVar237 * auVar203._0_4_;
  fVar249 = auVar202._4_4_;
  auVar257._4_4_ = fVar249 * auVar203._4_4_;
  fVar252 = auVar202._8_4_;
  auVar257._8_4_ = fVar252 * auVar203._8_4_;
  fVar254 = auVar202._12_4_;
  auVar257._12_4_ = fVar254 * auVar203._12_4_;
  auVar202 = vsubps_avx(auVar267,auVar257);
  fVar237 = fVar237 + fVar237 * auVar202._0_4_;
  fVar249 = fVar249 + fVar249 * auVar202._4_4_;
  fVar252 = fVar252 + fVar252 * auVar202._8_4_;
  fVar254 = fVar254 + fVar254 * auVar202._12_4_;
  auVar202 = vrcpps_avx(auVar176);
  fVar256 = auVar202._0_4_;
  auVar280._0_4_ = fVar256 * auVar176._0_4_;
  fVar263 = auVar202._4_4_;
  auVar280._4_4_ = fVar263 * auVar176._4_4_;
  fVar264 = auVar202._8_4_;
  auVar280._8_4_ = fVar264 * auVar176._8_4_;
  fVar265 = auVar202._12_4_;
  auVar280._12_4_ = fVar265 * auVar176._12_4_;
  auVar176 = vsubps_avx(auVar267,auVar280);
  fVar256 = fVar256 + fVar256 * auVar176._0_4_;
  fVar263 = fVar263 + fVar263 * auVar176._4_4_;
  fVar264 = fVar264 + fVar264 * auVar176._8_4_;
  fVar265 = fVar265 + fVar265 * auVar176._12_4_;
  auVar176 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar23 + 0x16)) *
                           *(float *)(prim + lVar23 + 0x1a)));
  auVar203 = vshufps_avx(auVar176,auVar176,0);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar127 * 7 + 6);
  auVar176 = vpmovsxwd_avx(auVar176);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar127 * 0xb + 6);
  auVar202 = vpmovsxwd_avx(auVar202);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar219 = vsubps_avx(auVar202,auVar176);
  fVar327 = auVar203._0_4_;
  fVar228 = auVar203._4_4_;
  fVar212 = auVar203._8_4_;
  fVar233 = auVar203._12_4_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar127 * 9 + 6);
  auVar202 = vpmovsxwd_avx(auVar203);
  auVar281._0_4_ = auVar219._0_4_ * fVar327 + auVar176._0_4_;
  auVar281._4_4_ = auVar219._4_4_ * fVar228 + auVar176._4_4_;
  auVar281._8_4_ = auVar219._8_4_ * fVar212 + auVar176._8_4_;
  auVar281._12_4_ = auVar219._12_4_ * fVar233 + auVar176._12_4_;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar127 * 0xd + 6);
  auVar203 = vpmovsxwd_avx(auVar219);
  auVar176 = vcvtdq2ps_avx(auVar202);
  auVar202 = vcvtdq2ps_avx(auVar203);
  auVar202 = vsubps_avx(auVar202,auVar176);
  auVar292._0_4_ = auVar202._0_4_ * fVar327 + auVar176._0_4_;
  auVar292._4_4_ = auVar202._4_4_ * fVar228 + auVar176._4_4_;
  auVar292._8_4_ = auVar202._8_4_ * fVar212 + auVar176._8_4_;
  auVar292._12_4_ = auVar202._12_4_ * fVar233 + auVar176._12_4_;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar127 * 0x12 + 6);
  auVar176 = vpmovsxwd_avx(auVar220);
  uVar128 = (ulong)(uint)((int)(uVar127 * 5) << 2);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar127 * 2 + uVar128 + 6);
  auVar202 = vpmovsxwd_avx(auVar24);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar202 = vsubps_avx(auVar202,auVar176);
  auVar304._0_4_ = auVar202._0_4_ * fVar327 + auVar176._0_4_;
  auVar304._4_4_ = auVar202._4_4_ * fVar228 + auVar176._4_4_;
  auVar304._8_4_ = auVar202._8_4_ * fVar212 + auVar176._8_4_;
  auVar304._12_4_ = auVar202._12_4_ * fVar233 + auVar176._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar128 + 6);
  auVar176 = vpmovsxwd_avx(auVar25);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar127 * 0x18 + 6);
  auVar202 = vpmovsxwd_avx(auVar26);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar203 = vsubps_avx(auVar202,auVar176);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar127 * 0x1d + 6);
  auVar202 = vpmovsxwd_avx(auVar27);
  auVar317._0_4_ = auVar203._0_4_ * fVar327 + auVar176._0_4_;
  auVar317._4_4_ = auVar203._4_4_ * fVar228 + auVar176._4_4_;
  auVar317._8_4_ = auVar203._8_4_ * fVar212 + auVar176._8_4_;
  auVar317._12_4_ = auVar203._12_4_ * fVar233 + auVar176._12_4_;
  auVar176 = vcvtdq2ps_avx(auVar202);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar127 + (ulong)(byte)PVar14 * 0x20 + 6);
  auVar202 = vpmovsxwd_avx(auVar28);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar202 = vsubps_avx(auVar202,auVar176);
  auVar328._0_4_ = auVar202._0_4_ * fVar327 + auVar176._0_4_;
  auVar328._4_4_ = auVar202._4_4_ * fVar228 + auVar176._4_4_;
  auVar328._8_4_ = auVar202._8_4_ * fVar212 + auVar176._8_4_;
  auVar328._12_4_ = auVar202._12_4_ * fVar233 + auVar176._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar127) + 6);
  auVar176 = vpmovsxwd_avx(auVar29);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar127 * 0x23 + 6);
  auVar202 = vpmovsxwd_avx(auVar30);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar202 = vsubps_avx(auVar202,auVar176);
  auVar268._0_4_ = auVar176._0_4_ + auVar202._0_4_ * fVar327;
  auVar268._4_4_ = auVar176._4_4_ + auVar202._4_4_ * fVar228;
  auVar268._8_4_ = auVar176._8_4_ + auVar202._8_4_ * fVar212;
  auVar268._12_4_ = auVar176._12_4_ + auVar202._12_4_ * fVar233;
  auVar176 = vsubps_avx(auVar281,auVar172);
  auVar282._0_4_ = fVar214 * auVar176._0_4_;
  auVar282._4_4_ = fVar227 * auVar176._4_4_;
  auVar282._8_4_ = fVar229 * auVar176._8_4_;
  auVar282._12_4_ = fVar231 * auVar176._12_4_;
  auVar176 = vsubps_avx(auVar292,auVar172);
  auVar173._0_4_ = fVar214 * auVar176._0_4_;
  auVar173._4_4_ = fVar227 * auVar176._4_4_;
  auVar173._8_4_ = fVar229 * auVar176._8_4_;
  auVar173._12_4_ = fVar231 * auVar176._12_4_;
  auVar176 = vsubps_avx(auVar304,auVar134);
  auVar216._0_4_ = fVar237 * auVar176._0_4_;
  auVar216._4_4_ = fVar249 * auVar176._4_4_;
  auVar216._8_4_ = fVar252 * auVar176._8_4_;
  auVar216._12_4_ = fVar254 * auVar176._12_4_;
  auVar176 = vsubps_avx(auVar317,auVar134);
  auVar135._0_4_ = fVar237 * auVar176._0_4_;
  auVar135._4_4_ = fVar249 * auVar176._4_4_;
  auVar135._8_4_ = fVar252 * auVar176._8_4_;
  auVar135._12_4_ = fVar254 * auVar176._12_4_;
  auVar176 = vsubps_avx(auVar328,auVar197);
  auVar241._0_4_ = fVar256 * auVar176._0_4_;
  auVar241._4_4_ = fVar263 * auVar176._4_4_;
  auVar241._8_4_ = fVar264 * auVar176._8_4_;
  auVar241._12_4_ = fVar265 * auVar176._12_4_;
  auVar176 = vsubps_avx(auVar268,auVar197);
  auVar198._0_4_ = fVar256 * auVar176._0_4_;
  auVar198._4_4_ = fVar263 * auVar176._4_4_;
  auVar198._8_4_ = fVar264 * auVar176._8_4_;
  auVar198._12_4_ = fVar265 * auVar176._12_4_;
  auVar176 = vpminsd_avx(auVar282,auVar173);
  auVar202 = vpminsd_avx(auVar216,auVar135);
  auVar176 = vmaxps_avx(auVar176,auVar202);
  auVar202 = vpminsd_avx(auVar241,auVar198);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar293._4_4_ = uVar13;
  auVar293._0_4_ = uVar13;
  auVar293._8_4_ = uVar13;
  auVar293._12_4_ = uVar13;
  auVar202 = vmaxps_avx(auVar202,auVar293);
  auVar176 = vmaxps_avx(auVar176,auVar202);
  local_3f0._0_4_ = auVar176._0_4_ * 0.99999964;
  local_3f0._4_4_ = auVar176._4_4_ * 0.99999964;
  local_3f0._8_4_ = auVar176._8_4_ * 0.99999964;
  local_3f0._12_4_ = auVar176._12_4_ * 0.99999964;
  auVar176 = vpmaxsd_avx(auVar282,auVar173);
  auVar202 = vpmaxsd_avx(auVar216,auVar135);
  auVar176 = vminps_avx(auVar176,auVar202);
  auVar202 = vpmaxsd_avx(auVar241,auVar198);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar199._4_4_ = uVar13;
  auVar199._0_4_ = uVar13;
  auVar199._8_4_ = uVar13;
  auVar199._12_4_ = uVar13;
  auVar202 = vminps_avx(auVar202,auVar199);
  auVar176 = vminps_avx(auVar176,auVar202);
  auVar136._0_4_ = auVar176._0_4_ * 1.0000004;
  auVar136._4_4_ = auVar176._4_4_ * 1.0000004;
  auVar136._8_4_ = auVar176._8_4_ * 1.0000004;
  auVar136._12_4_ = auVar176._12_4_ * 1.0000004;
  auVar176 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar202 = vpcmpgtd_avx(auVar176,_DAT_01f7fcf0);
  auVar176 = vcmpps_avx(local_3f0,auVar136,2);
  auVar176 = vandps_avx(auVar176,auVar202);
  uVar124 = vmovmskps_avx(auVar176);
  if (uVar124 != 0) {
    uVar124 = uVar124 & 0xff;
    local_610 = pre->ray_space + k;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    local_748 = (undefined1 (*) [32])&local_180;
    uVar129 = 1 << ((byte)k & 0x1f);
    local_750 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar129 & 0xf) << 4));
    local_758 = mm_lookupmask_ps + (long)((int)uVar129 >> 4) * 0x10;
    local_608 = prim;
    do {
      lVar23 = 0;
      if (uVar124 != 0) {
        for (; (uVar124 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      uVar15 = *(uint *)(local_608 + 2);
      uVar16 = *(uint *)(local_608 + lVar23 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[uVar15].ptr;
      uVar127 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                                (ulong)uVar16 *
                                pGVar19[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar327 = (pGVar19->time_range).lower;
      fVar327 = pGVar19->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar327) /
                ((pGVar19->time_range).upper - fVar327));
      auVar176 = vroundss_avx(ZEXT416((uint)fVar327),ZEXT416((uint)fVar327),9);
      auVar176 = vminss_avx(auVar176,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
      auVar176 = vmaxss_avx(ZEXT816(0) << 0x20,auVar176);
      fVar327 = fVar327 - auVar176._0_4_;
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar130 = (long)(int)auVar176._0_4_ * 0x38;
      lVar23 = *(long *)(_Var20 + 0x10 + lVar130);
      lVar132 = *(long *)(_Var20 + 0x38 + lVar130);
      lVar21 = *(long *)(_Var20 + 0x48 + lVar130);
      auVar176 = vshufps_avx(ZEXT416((uint)fVar327),ZEXT416((uint)fVar327),0);
      pfVar1 = (float *)(lVar132 + uVar127 * lVar21);
      fVar228 = auVar176._0_4_;
      fVar212 = auVar176._4_4_;
      fVar233 = auVar176._8_4_;
      fVar214 = auVar176._12_4_;
      pfVar2 = (float *)(lVar132 + (uVar127 + 1) * lVar21);
      pfVar3 = (float *)(lVar132 + (uVar127 + 2) * lVar21);
      pfVar4 = (float *)(lVar132 + lVar21 * (uVar127 + 3));
      lVar132 = *(long *)(_Var20 + lVar130);
      auVar176 = vshufps_avx(ZEXT416((uint)(1.0 - fVar327)),ZEXT416((uint)(1.0 - fVar327)),0);
      pfVar5 = (float *)(lVar132 + lVar23 * uVar127);
      fVar327 = auVar176._0_4_;
      fVar227 = auVar176._4_4_;
      fVar229 = auVar176._8_4_;
      fVar231 = auVar176._12_4_;
      pfVar6 = (float *)(lVar132 + lVar23 * (uVar127 + 1));
      pfVar7 = (float *)(lVar132 + lVar23 * (uVar127 + 2));
      pfVar8 = (float *)(lVar132 + lVar23 * (uVar127 + 3));
      uVar17 = (uint)pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar23 = (long)(int)uVar17 * 0x44;
      fVar238 = fVar228 * *pfVar1 + fVar327 * *pfVar5;
      fVar250 = fVar212 * pfVar1[1] + fVar227 * pfVar5[1];
      auVar242._0_8_ = CONCAT44(fVar250,fVar238);
      auVar242._8_4_ = fVar233 * pfVar1[2] + fVar229 * pfVar5[2];
      auVar242._12_4_ = fVar214 * pfVar1[3] + fVar231 * pfVar5[3];
      fVar350 = fVar327 * *pfVar6 + fVar228 * *pfVar2;
      fVar354 = fVar227 * pfVar6[1] + fVar212 * pfVar2[1];
      auVar352._0_8_ = CONCAT44(fVar354,fVar350);
      auVar352._8_4_ = fVar229 * pfVar6[2] + fVar233 * pfVar2[2];
      auVar352._12_4_ = fVar231 * pfVar6[3] + fVar214 * pfVar2[3];
      fVar358 = fVar327 * *pfVar7 + fVar228 * *pfVar3;
      fVar366 = fVar227 * pfVar7[1] + fVar212 * pfVar3[1];
      auVar360._0_8_ = CONCAT44(fVar366,fVar358);
      auVar360._8_4_ = fVar229 * pfVar7[2] + fVar233 * pfVar3[2];
      auVar360._12_4_ = fVar231 * pfVar7[3] + fVar214 * pfVar3[3];
      fVar334 = fVar327 * *pfVar8 + fVar228 * *pfVar4;
      fVar342 = fVar227 * pfVar8[1] + fVar212 * pfVar4[1];
      auVar336._0_8_ = CONCAT44(fVar342,fVar334);
      auVar336._8_4_ = fVar229 * pfVar8[2] + fVar233 * pfVar4[2];
      auVar336._12_4_ = fVar231 * pfVar8[3] + fVar214 * pfVar4[3];
      auVar176 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar219 = vinsertps_avx(auVar176,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar203 = vsubps_avx(auVar242,auVar219);
      auVar176 = vshufps_avx(auVar203,auVar203,0);
      auVar202 = vshufps_avx(auVar203,auVar203,0x55);
      auVar203 = vshufps_avx(auVar203,auVar203,0xaa);
      fVar327 = (local_610->vx).field_0.m128[0];
      fVar228 = (local_610->vx).field_0.m128[1];
      fVar212 = (local_610->vx).field_0.m128[2];
      fVar233 = (local_610->vx).field_0.m128[3];
      fVar214 = (local_610->vy).field_0.m128[0];
      fVar227 = (local_610->vy).field_0.m128[1];
      fVar229 = (local_610->vy).field_0.m128[2];
      fVar231 = (local_610->vy).field_0.m128[3];
      fVar237 = (local_610->vz).field_0.m128[0];
      fVar249 = (local_610->vz).field_0.m128[1];
      fVar252 = (local_610->vz).field_0.m128[2];
      fVar254 = (local_610->vz).field_0.m128[3];
      auVar217._0_8_ =
           CONCAT44(auVar176._4_4_ * fVar228 + auVar202._4_4_ * fVar227 + fVar249 * auVar203._4_4_,
                    auVar176._0_4_ * fVar327 + auVar202._0_4_ * fVar214 + fVar237 * auVar203._0_4_);
      auVar217._8_4_ =
           auVar176._8_4_ * fVar212 + auVar202._8_4_ * fVar229 + fVar252 * auVar203._8_4_;
      auVar217._12_4_ =
           auVar176._12_4_ * fVar233 + auVar202._12_4_ * fVar231 + fVar254 * auVar203._12_4_;
      auVar176 = vblendps_avx(auVar217,auVar242,8);
      auVar220 = vsubps_avx(auVar352,auVar219);
      auVar202 = vshufps_avx(auVar220,auVar220,0);
      auVar203 = vshufps_avx(auVar220,auVar220,0x55);
      auVar220 = vshufps_avx(auVar220,auVar220,0xaa);
      auVar283._0_4_ =
           auVar202._0_4_ * fVar327 + auVar203._0_4_ * fVar214 + fVar237 * auVar220._0_4_;
      auVar283._4_4_ =
           auVar202._4_4_ * fVar228 + auVar203._4_4_ * fVar227 + fVar249 * auVar220._4_4_;
      auVar283._8_4_ =
           auVar202._8_4_ * fVar212 + auVar203._8_4_ * fVar229 + fVar252 * auVar220._8_4_;
      auVar283._12_4_ =
           auVar202._12_4_ * fVar233 + auVar203._12_4_ * fVar231 + fVar254 * auVar220._12_4_;
      auVar202 = vblendps_avx(auVar283,auVar352,8);
      auVar24 = vsubps_avx(auVar360,auVar219);
      auVar203 = vshufps_avx(auVar24,auVar24,0);
      auVar220 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar294._0_4_ = auVar203._0_4_ * fVar327 + auVar220._0_4_ * fVar214 + auVar24._0_4_ * fVar237
      ;
      auVar294._4_4_ = auVar203._4_4_ * fVar228 + auVar220._4_4_ * fVar227 + auVar24._4_4_ * fVar249
      ;
      auVar294._8_4_ = auVar203._8_4_ * fVar212 + auVar220._8_4_ * fVar229 + auVar24._8_4_ * fVar252
      ;
      auVar294._12_4_ =
           auVar203._12_4_ * fVar233 + auVar220._12_4_ * fVar231 + auVar24._12_4_ * fVar254;
      auVar203 = vblendps_avx(auVar294,auVar360,8);
      auVar24 = vsubps_avx(auVar336,auVar219);
      auVar219 = vshufps_avx(auVar24,auVar24,0);
      auVar220 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar174._0_4_ = auVar219._0_4_ * fVar327 + auVar220._0_4_ * fVar214 + fVar237 * auVar24._0_4_
      ;
      auVar174._4_4_ = auVar219._4_4_ * fVar228 + auVar220._4_4_ * fVar227 + fVar249 * auVar24._4_4_
      ;
      auVar174._8_4_ = auVar219._8_4_ * fVar212 + auVar220._8_4_ * fVar229 + fVar252 * auVar24._8_4_
      ;
      auVar174._12_4_ =
           auVar219._12_4_ * fVar233 + auVar220._12_4_ * fVar231 + fVar254 * auVar24._12_4_;
      auVar219 = vblendps_avx(auVar174,auVar336,8);
      auVar243._8_4_ = 0x7fffffff;
      auVar243._0_8_ = 0x7fffffff7fffffff;
      auVar243._12_4_ = 0x7fffffff;
      auVar176 = vandps_avx(auVar176,auVar243);
      auVar202 = vandps_avx(auVar202,auVar243);
      auVar220 = vmaxps_avx(auVar176,auVar202);
      auVar176 = vandps_avx(auVar203,auVar243);
      auVar202 = vandps_avx(auVar219,auVar243);
      auVar176 = vmaxps_avx(auVar176,auVar202);
      auVar176 = vmaxps_avx(auVar220,auVar176);
      auVar202 = vmovshdup_avx(auVar176);
      auVar202 = vmaxss_avx(auVar202,auVar176);
      auVar176 = vshufpd_avx(auVar176,auVar176,1);
      auVar176 = vmaxss_avx(auVar176,auVar202);
      fVar327 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0x908);
      fVar228 = *(float *)(catmullrom_basis0 + lVar23 + 0x90c);
      fVar212 = *(float *)(catmullrom_basis0 + lVar23 + 0x910);
      fVar233 = *(float *)(catmullrom_basis0 + lVar23 + 0x914);
      fVar214 = *(float *)(catmullrom_basis0 + lVar23 + 0x918);
      fVar227 = *(float *)(catmullrom_basis0 + lVar23 + 0x91c);
      fVar229 = *(float *)(catmullrom_basis0 + lVar23 + 0x920);
      auVar118 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0x908);
      auVar202 = vshufps_avx(auVar294,auVar294,0);
      register0x00001250 = auVar202;
      _local_520 = auVar202;
      auVar203 = vshufps_avx(auVar294,auVar294,0x55);
      fVar231 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      fVar237 = *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      fVar249 = *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      fVar252 = *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      fVar254 = *(float *)(catmullrom_basis0 + lVar23 + 0xd9c);
      fVar256 = *(float *)(catmullrom_basis0 + lVar23 + 0xda0);
      fVar263 = *(float *)(catmullrom_basis0 + lVar23 + 0xda4);
      auVar117 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      auVar219 = vshufps_avx(auVar174,auVar174,0);
      register0x00001210 = auVar219;
      _local_580 = auVar219;
      fVar168 = auVar219._0_4_;
      fVar236 = auVar219._4_4_;
      fVar157 = auVar219._8_4_;
      fVar160 = auVar219._12_4_;
      fVar170 = auVar202._0_4_;
      fVar190 = auVar202._4_4_;
      fVar191 = auVar202._8_4_;
      fVar192 = auVar202._12_4_;
      auVar202 = vshufps_avx(auVar174,auVar174,0x55);
      register0x00001550 = auVar202;
      _local_660 = auVar202;
      fVar343 = auVar202._0_4_;
      fVar347 = auVar202._4_4_;
      fVar348 = auVar202._8_4_;
      fVar349 = auVar202._12_4_;
      fVar196 = auVar203._0_4_;
      fVar209 = auVar203._4_4_;
      fVar210 = auVar203._8_4_;
      fVar211 = auVar203._12_4_;
      auVar202 = vshufps_avx(auVar360,auVar360,0xff);
      register0x00001450 = auVar202;
      _local_80 = auVar202;
      auVar203 = vshufps_avx(auVar336,auVar336,0xff);
      register0x00001390 = auVar203;
      _local_a0 = auVar203;
      fVar323 = auVar203._0_4_;
      fVar274 = auVar203._4_4_;
      fVar275 = auVar203._8_4_;
      fVar276 = auVar203._12_4_;
      fVar303 = auVar202._0_4_;
      fVar310 = auVar202._4_4_;
      fVar311 = auVar202._8_4_;
      auVar203 = vshufps_avx(auVar283,auVar283,0);
      register0x00001310 = auVar203;
      _local_6e0 = auVar203;
      fVar298 = *(float *)(catmullrom_basis0 + lVar23 + 0x484);
      fVar232 = *(float *)(catmullrom_basis0 + lVar23 + 0x488);
      fVar324 = *(float *)(catmullrom_basis0 + lVar23 + 0x48c);
      fVar299 = *(float *)(catmullrom_basis0 + lVar23 + 0x490);
      fVar300 = *(float *)(catmullrom_basis0 + lVar23 + 0x494);
      fVar234 = *(float *)(catmullrom_basis0 + lVar23 + 0x498);
      fVar325 = *(float *)(catmullrom_basis0 + lVar23 + 0x49c);
      fVar264 = *(float *)(catmullrom_basis0 + lVar23 + 0x4a0);
      fVar239 = auVar203._0_4_;
      fVar251 = auVar203._4_4_;
      fVar253 = auVar203._8_4_;
      fVar255 = auVar203._12_4_;
      auVar203 = vshufps_avx(auVar283,auVar283,0x55);
      local_7a0._16_16_ = auVar203;
      local_7a0._0_16_ = auVar203;
      fVar359 = auVar203._0_4_;
      fVar367 = auVar203._4_4_;
      fVar368 = auVar203._8_4_;
      fVar369 = auVar203._12_4_;
      auVar203 = vshufps_avx(auVar352,auVar352,0xff);
      register0x00001590 = auVar203;
      _local_280 = auVar203;
      fVar351 = auVar203._0_4_;
      fVar355 = auVar203._4_4_;
      fVar356 = auVar203._8_4_;
      fVar357 = auVar203._12_4_;
      auVar112._8_4_ = auVar217._8_4_;
      auVar112._0_8_ = auVar217._0_8_;
      auVar112._12_4_ = auVar217._12_4_;
      auVar203 = vshufps_avx(auVar112,auVar112,0);
      register0x000014d0 = auVar203;
      _local_540 = auVar203;
      pauVar9 = (undefined1 (*) [16])(catmullrom_basis0 + lVar23);
      fVar265 = *(float *)*pauVar9;
      fVar333 = *(float *)(catmullrom_basis0 + lVar23 + 4);
      fVar193 = *(float *)(catmullrom_basis0 + lVar23 + 8);
      auVar119 = *(undefined1 (*) [12])*pauVar9;
      fVar301 = *(float *)(catmullrom_basis0 + lVar23 + 0xc);
      fStack_430 = *(float *)(catmullrom_basis0 + lVar23 + 0x10);
      fStack_42c = *(float *)(catmullrom_basis0 + lVar23 + 0x14);
      fStack_428 = *(float *)(catmullrom_basis0 + lVar23 + 0x18);
      uStack_424 = *(undefined4 *)(catmullrom_basis0 + lVar23 + 0x1c);
      fVar315 = auVar203._0_4_;
      fVar330 = auVar203._4_4_;
      fVar331 = auVar203._8_4_;
      fVar332 = auVar203._12_4_;
      auVar284._0_4_ = fVar315 * fVar265 + fVar239 * fVar298 + fVar170 * fVar327 + fVar168 * fVar231
      ;
      auVar284._4_4_ = fVar330 * fVar333 + fVar251 * fVar232 + fVar190 * fVar228 + fVar236 * fVar237
      ;
      auVar284._8_4_ = fVar331 * fVar193 + fVar253 * fVar324 + fVar191 * fVar212 + fVar157 * fVar249
      ;
      auVar284._12_4_ =
           fVar332 * fVar301 + fVar255 * fVar299 + fVar192 * fVar233 + fVar160 * fVar252;
      auVar284._16_4_ =
           fVar315 * fStack_430 + fVar239 * fVar300 + fVar170 * fVar214 + fVar168 * fVar254;
      auVar284._20_4_ =
           fVar330 * fStack_42c + fVar251 * fVar234 + fVar190 * fVar227 + fVar236 * fVar256;
      auVar284._24_4_ =
           fVar331 * fStack_428 + fVar253 * fVar325 + fVar191 * fVar229 + fVar157 * fVar263;
      auVar284._28_4_ = fVar264 + fVar192 + fVar160 + 0.0;
      auVar219 = vshufps_avx(auVar112,auVar112,0x55);
      register0x00001410 = auVar219;
      _local_c0 = auVar219;
      fVar287 = auVar219._0_4_;
      fVar288 = auVar219._4_4_;
      fVar289 = auVar219._8_4_;
      fVar290 = auVar219._12_4_;
      auVar337._0_4_ = fVar287 * fVar265 + fVar359 * fVar298 + fVar196 * fVar327 + fVar343 * fVar231
      ;
      auVar337._4_4_ = fVar288 * fVar333 + fVar367 * fVar232 + fVar209 * fVar228 + fVar347 * fVar237
      ;
      auVar337._8_4_ = fVar289 * fVar193 + fVar368 * fVar324 + fVar210 * fVar212 + fVar348 * fVar249
      ;
      auVar337._12_4_ =
           fVar290 * fVar301 + fVar369 * fVar299 + fVar211 * fVar233 + fVar349 * fVar252;
      auVar337._16_4_ =
           fVar287 * fStack_430 + fVar359 * fVar300 + fVar196 * fVar214 + fVar343 * fVar254;
      auVar337._20_4_ =
           fVar288 * fStack_42c + fVar367 * fVar234 + fVar209 * fVar227 + fVar347 * fVar256;
      auVar337._24_4_ =
           fVar289 * fStack_428 + fVar368 * fVar325 + fVar210 * fVar229 + fVar348 * fVar263;
      auVar337._28_4_ = fVar211 + 0.0 + 0.0 + 0.0;
      auVar219 = vpermilps_avx(auVar242,0xff);
      register0x00001490 = auVar219;
      _local_2a0 = auVar219;
      fVar312 = auVar219._0_4_;
      fVar313 = auVar219._4_4_;
      fVar314 = auVar219._8_4_;
      auVar141._0_4_ = fVar312 * fVar265 + fVar351 * fVar298 + fVar303 * fVar327 + fVar323 * fVar231
      ;
      auVar141._4_4_ = fVar313 * fVar333 + fVar355 * fVar232 + fVar310 * fVar228 + fVar274 * fVar237
      ;
      auVar141._8_4_ = fVar314 * fVar193 + fVar356 * fVar324 + fVar311 * fVar212 + fVar275 * fVar249
      ;
      auVar141._12_4_ =
           auVar219._12_4_ * fVar301 +
           fVar357 * fVar299 + auVar202._12_4_ * fVar233 + fVar276 * fVar252;
      auVar141._16_4_ =
           fVar312 * fStack_430 + fVar351 * fVar300 + fVar303 * fVar214 + fVar323 * fVar254;
      auVar141._20_4_ =
           fVar313 * fStack_42c + fVar355 * fVar234 + fVar310 * fVar227 + fVar274 * fVar256;
      auVar141._24_4_ =
           fVar314 * fStack_428 + fVar356 * fVar325 + fVar311 * fVar229 + fVar275 * fVar263;
      auVar141._28_4_ = 0;
      fVar302 = *(float *)(catmullrom_basis1 + lVar23 + 0x908);
      fVar235 = *(float *)(catmullrom_basis1 + lVar23 + 0x90c);
      fVar326 = *(float *)(catmullrom_basis1 + lVar23 + 0x910);
      fVar169 = *(float *)(catmullrom_basis1 + lVar23 + 0x914);
      fVar195 = *(float *)(catmullrom_basis1 + lVar23 + 0x918);
      fVar277 = *(float *)(catmullrom_basis1 + lVar23 + 0x91c);
      fVar194 = *(float *)(catmullrom_basis1 + lVar23 + 0x920);
      fVar266 = *(float *)(catmullrom_basis1 + lVar23 + 0xd8c);
      fVar316 = *(float *)(catmullrom_basis1 + lVar23 + 0xd90);
      fVar158 = *(float *)(catmullrom_basis1 + lVar23 + 0xd94);
      fVar161 = *(float *)(catmullrom_basis1 + lVar23 + 0xd98);
      fVar163 = *(float *)(catmullrom_basis1 + lVar23 + 0xd9c);
      fVar165 = *(float *)(catmullrom_basis1 + lVar23 + 0xda0);
      fVar213 = *(float *)(catmullrom_basis1 + lVar23 + 0xda4);
      auVar319 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x484);
      auVar262 = ZEXT3264(auVar319);
      fVar327 = auVar319._0_4_;
      fVar233 = auVar319._4_4_;
      fVar229 = auVar319._8_4_;
      fVar249 = auVar319._12_4_;
      fVar256 = auVar319._16_4_;
      fVar265 = auVar319._20_4_;
      fVar230 = auVar319._24_4_;
      fVar212 = fVar349 + 0.0;
      fVar133 = *(float *)(catmullrom_basis1 + lVar23);
      fVar156 = *(float *)(catmullrom_basis1 + lVar23 + 4);
      fVar159 = *(float *)(catmullrom_basis1 + lVar23 + 8);
      fVar162 = *(float *)(catmullrom_basis1 + lVar23 + 0xc);
      fVar164 = *(float *)(catmullrom_basis1 + lVar23 + 0x10);
      fVar166 = *(float *)(catmullrom_basis1 + lVar23 + 0x14);
      fVar167 = *(float *)(catmullrom_basis1 + lVar23 + 0x18);
      auVar244._0_4_ = fVar315 * fVar133 + fVar239 * fVar327 + fVar302 * fVar170 + fVar266 * fVar168
      ;
      auVar244._4_4_ = fVar330 * fVar156 + fVar251 * fVar233 + fVar235 * fVar190 + fVar316 * fVar236
      ;
      auVar244._8_4_ = fVar331 * fVar159 + fVar253 * fVar229 + fVar326 * fVar191 + fVar158 * fVar157
      ;
      auVar244._12_4_ =
           fVar332 * fVar162 + fVar255 * fVar249 + fVar169 * fVar192 + fVar161 * fVar160;
      auVar244._16_4_ =
           fVar315 * fVar164 + fVar239 * fVar256 + fVar195 * fVar170 + fVar163 * fVar168;
      auVar244._20_4_ =
           fVar330 * fVar166 + fVar251 * fVar265 + fVar277 * fVar190 + fVar165 * fVar236;
      auVar244._24_4_ =
           fVar331 * fVar167 + fVar253 * fVar230 + fVar194 * fVar191 + fVar213 * fVar157;
      auVar244._28_4_ = fVar357 + fVar212;
      local_720._0_4_ =
           fVar287 * fVar133 + fVar359 * fVar327 + fVar302 * fVar196 + fVar343 * fVar266;
      local_720._4_4_ =
           fVar288 * fVar156 + fVar367 * fVar233 + fVar235 * fVar209 + fVar347 * fVar316;
      fStack_718 = fVar289 * fVar159 + fVar368 * fVar229 + fVar326 * fVar210 + fVar348 * fVar158;
      fStack_714 = fVar290 * fVar162 + fVar369 * fVar249 + fVar169 * fVar211 + fVar349 * fVar161;
      auVar221._16_4_ =
           fVar287 * fVar164 + fVar359 * fVar256 + fVar195 * fVar196 + fVar343 * fVar163;
      auVar221._0_16_ = _local_720;
      auVar221._20_4_ =
           fVar288 * fVar166 + fVar367 * fVar265 + fVar277 * fVar209 + fVar347 * fVar165;
      auVar221._24_4_ =
           fVar289 * fVar167 + fVar368 * fVar230 + fVar194 * fVar210 + fVar348 * fVar213;
      auVar221._28_4_ = fVar212 + fVar349 + fVar264 + 0.0;
      auVar305._0_4_ = fVar351 * fVar327 + fVar303 * fVar302 + fVar323 * fVar266 + fVar312 * fVar133
      ;
      auVar305._4_4_ = fVar355 * fVar233 + fVar310 * fVar235 + fVar274 * fVar316 + fVar313 * fVar156
      ;
      auVar305._8_4_ = fVar356 * fVar229 + fVar311 * fVar326 + fVar275 * fVar158 + fVar314 * fVar159
      ;
      auVar305._12_4_ =
           fVar357 * fVar249 + auVar202._12_4_ * fVar169 + fVar276 * fVar161 +
           auVar219._12_4_ * fVar162;
      auVar305._16_4_ =
           fVar351 * fVar256 + fVar303 * fVar195 + fVar323 * fVar163 + fVar312 * fVar164;
      auVar305._20_4_ =
           fVar355 * fVar265 + fVar310 * fVar277 + fVar274 * fVar165 + fVar313 * fVar166;
      auVar305._24_4_ =
           fVar356 * fVar230 + fVar311 * fVar194 + fVar275 * fVar213 + fVar314 * fVar167;
      auVar305._28_4_ = fVar349 + fVar276 + fVar264 + fVar212;
      auVar31 = vsubps_avx(auVar244,auVar284);
      auVar32 = vsubps_avx(auVar221,auVar337);
      fVar228 = auVar31._0_4_;
      fVar214 = auVar31._4_4_;
      auVar146._4_4_ = auVar337._4_4_ * fVar214;
      auVar146._0_4_ = auVar337._0_4_ * fVar228;
      fVar231 = auVar31._8_4_;
      auVar146._8_4_ = auVar337._8_4_ * fVar231;
      fVar252 = auVar31._12_4_;
      auVar146._12_4_ = auVar337._12_4_ * fVar252;
      fVar263 = auVar31._16_4_;
      auVar146._16_4_ = auVar337._16_4_ * fVar263;
      fVar333 = auVar31._20_4_;
      auVar146._20_4_ = auVar337._20_4_ * fVar333;
      fVar323 = auVar31._24_4_;
      auVar146._24_4_ = auVar337._24_4_ * fVar323;
      auVar146._28_4_ = fVar212;
      fVar212 = auVar32._0_4_;
      fVar227 = auVar32._4_4_;
      auVar33._4_4_ = auVar284._4_4_ * fVar227;
      auVar33._0_4_ = auVar284._0_4_ * fVar212;
      fVar237 = auVar32._8_4_;
      auVar33._8_4_ = auVar284._8_4_ * fVar237;
      fVar254 = auVar32._12_4_;
      auVar33._12_4_ = auVar284._12_4_ * fVar254;
      fVar264 = auVar32._16_4_;
      auVar33._16_4_ = auVar284._16_4_ * fVar264;
      fVar193 = auVar32._20_4_;
      auVar33._20_4_ = auVar284._20_4_ * fVar193;
      fVar274 = auVar32._24_4_;
      auVar33._24_4_ = auVar284._24_4_ * fVar274;
      auVar33._28_4_ = auVar221._28_4_;
      auVar33 = vsubps_avx(auVar146,auVar33);
      auVar146 = vmaxps_avx(auVar141,auVar305);
      auVar36._4_4_ = auVar146._4_4_ * auVar146._4_4_ * (fVar214 * fVar214 + fVar227 * fVar227);
      auVar36._0_4_ = auVar146._0_4_ * auVar146._0_4_ * (fVar228 * fVar228 + fVar212 * fVar212);
      auVar36._8_4_ = auVar146._8_4_ * auVar146._8_4_ * (fVar231 * fVar231 + fVar237 * fVar237);
      auVar36._12_4_ = auVar146._12_4_ * auVar146._12_4_ * (fVar252 * fVar252 + fVar254 * fVar254);
      auVar36._16_4_ = auVar146._16_4_ * auVar146._16_4_ * (fVar263 * fVar263 + fVar264 * fVar264);
      auVar36._20_4_ = auVar146._20_4_ * auVar146._20_4_ * (fVar333 * fVar333 + fVar193 * fVar193);
      auVar36._24_4_ = auVar146._24_4_ * auVar146._24_4_ * (fVar323 * fVar323 + fVar274 * fVar274);
      auVar36._28_4_ = auVar32._28_4_ + auVar221._28_4_;
      auVar364._4_4_ = auVar33._4_4_ * auVar33._4_4_;
      auVar364._0_4_ = auVar33._0_4_ * auVar33._0_4_;
      auVar364._8_4_ = auVar33._8_4_ * auVar33._8_4_;
      auVar364._12_4_ = auVar33._12_4_ * auVar33._12_4_;
      auVar364._16_4_ = auVar33._16_4_ * auVar33._16_4_;
      auVar364._20_4_ = auVar33._20_4_ * auVar33._20_4_;
      auVar364._24_4_ = auVar33._24_4_ * auVar33._24_4_;
      auVar364._28_4_ = auVar33._28_4_;
      auVar146 = vcmpps_avx(auVar364,auVar36,2);
      auVar218._0_4_ = (float)(int)uVar17;
      auVar218._4_12_ = auVar203._4_12_;
      local_560._0_16_ = auVar218;
      auVar202 = vshufps_avx(auVar218,auVar218,0);
      auVar222._16_16_ = auVar202;
      auVar222._0_16_ = auVar202;
      auVar33 = vcmpps_avx(_DAT_01faff40,auVar222,1);
      auVar226 = ZEXT3264(auVar33);
      auVar113._8_4_ = auVar217._8_4_;
      auVar113._0_8_ = auVar217._0_8_;
      auVar113._12_4_ = auVar217._12_4_;
      auVar202 = vpermilps_avx(auVar113,0xaa);
      register0x00001490 = auVar202;
      _local_460 = auVar202;
      auVar203 = vpermilps_avx(auVar283,0xaa);
      register0x00001550 = auVar203;
      _local_420 = auVar203;
      auVar219 = vpermilps_avx(auVar294,0xaa);
      register0x00001590 = auVar219;
      _local_e0 = auVar219;
      auVar220 = vpermilps_avx(auVar174,0xaa);
      auVar36 = auVar33 & auVar146;
      uVar129 = *(uint *)(ray + k * 4 + 0x60);
      auVar176 = ZEXT416((uint)(auVar176._0_4_ * 4.7683716e-07));
      local_7c0._0_16_ = auVar176;
      uStack_8d8 = auVar242._8_8_;
      uStack_838 = auVar352._8_8_;
      uStack_848 = auVar360._8_8_;
      uStack_858 = auVar336._8_8_;
      fVar227 = auVar220._0_4_;
      fVar231 = auVar220._4_4_;
      fVar237 = auVar220._8_4_;
      fVar252 = auVar220._12_4_;
      fVar228 = fVar239;
      fVar212 = fVar251;
      fVar214 = fVar253;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar36 >> 0x7f,0) == '\0') &&
            (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar36 >> 0xbf,0) == '\0') &&
          (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar36[0x1f])
      {
        auVar309 = ZEXT3264(local_7a0);
        auVar319 = local_5e0;
      }
      else {
        auVar146 = vandps_avx(auVar146,auVar33);
        fVar275 = auVar202._0_4_;
        fVar276 = auVar202._4_4_;
        fVar303 = auVar202._8_4_;
        fVar310 = auVar202._12_4_;
        fVar311 = auVar203._0_4_;
        fVar312 = auVar203._4_4_;
        fVar313 = auVar203._8_4_;
        fVar314 = auVar203._12_4_;
        fVar351 = auVar219._0_4_;
        fVar355 = auVar219._4_4_;
        fVar356 = auVar219._8_4_;
        fVar357 = auVar219._12_4_;
        fVar254 = auVar33._28_4_ + *(float *)(catmullrom_basis1 + lVar23 + 0x924) + auVar319._28_4_;
        local_480._0_4_ =
             fVar275 * fVar133 + fVar311 * fVar327 + fVar351 * fVar302 + fVar227 * fVar266;
        local_480._4_4_ =
             fVar276 * fVar156 + fVar312 * fVar233 + fVar355 * fVar235 + fVar231 * fVar316;
        fStack_478 = fVar303 * fVar159 + fVar313 * fVar229 + fVar356 * fVar326 + fVar237 * fVar158;
        fStack_474 = fVar310 * fVar162 + fVar314 * fVar249 + fVar357 * fVar169 + fVar252 * fVar161;
        fStack_470 = fVar275 * fVar164 + fVar311 * fVar256 + fVar351 * fVar195 + fVar227 * fVar163;
        fStack_46c = fVar276 * fVar166 + fVar312 * fVar265 + fVar355 * fVar277 + fVar231 * fVar165;
        fStack_468 = fVar303 * fVar167 + fVar313 * fVar230 + fVar356 * fVar194 + fVar237 * fVar213;
        fStack_464 = auVar146._28_4_ + fVar254;
        local_440._0_4_ = auVar119._0_4_;
        local_440._4_4_ = auVar119._4_4_;
        fStack_438 = auVar119._8_4_;
        local_740._0_4_ = auVar118._0_4_;
        local_740._4_4_ = auVar118._4_4_;
        uStack_738._0_4_ = auVar118._8_4_;
        uStack_738._4_4_ = auVar118._12_4_;
        uStack_730._0_4_ = auVar118._16_4_;
        uStack_730._4_4_ = auVar118._20_4_;
        uStack_728._0_4_ = auVar118._24_4_;
        local_680._0_4_ = auVar117._0_4_;
        local_680._4_4_ = auVar117._4_4_;
        fStack_678 = auVar117._8_4_;
        fStack_674 = auVar117._12_4_;
        fStack_670 = auVar117._16_4_;
        fStack_66c = auVar117._20_4_;
        fStack_668 = auVar117._24_4_;
        local_740._0_4_ =
             fVar275 * (float)local_440._0_4_ +
             fVar311 * fVar298 + fVar351 * (float)local_740._0_4_ + fVar227 * (float)local_680._0_4_
        ;
        local_740._4_4_ =
             fVar276 * (float)local_440._4_4_ +
             fVar312 * fVar232 + fVar355 * (float)local_740._4_4_ + fVar231 * (float)local_680._4_4_
        ;
        uStack_738._0_4_ =
             fVar303 * fStack_438 +
             fVar313 * fVar324 + fVar356 * (float)uStack_738 + fVar237 * fStack_678;
        uStack_738._4_4_ =
             fVar310 * fVar301 +
             fVar314 * fVar299 + fVar357 * uStack_738._4_4_ + fVar252 * fStack_674;
        uStack_730._0_4_ =
             fVar275 * fStack_430 +
             fVar311 * fVar300 + fVar351 * (float)uStack_730 + fVar227 * fStack_670;
        uStack_730._4_4_ =
             fVar276 * fStack_42c +
             fVar312 * fVar234 + fVar355 * uStack_730._4_4_ + fVar231 * fStack_66c;
        uStack_728._0_4_ =
             fVar303 * fStack_428 +
             fVar313 * fVar325 + fVar356 * (float)uStack_728 + fVar237 * fStack_668;
        uStack_728._4_4_ = fStack_464 + fVar254 + auVar146._28_4_ + auVar33._28_4_;
        fVar327 = *(float *)(catmullrom_basis0 + lVar23 + 0x1210);
        fVar233 = *(float *)(catmullrom_basis0 + lVar23 + 0x1214);
        fVar229 = *(float *)(catmullrom_basis0 + lVar23 + 0x1218);
        fVar249 = *(float *)(catmullrom_basis0 + lVar23 + 0x121c);
        fVar254 = *(float *)(catmullrom_basis0 + lVar23 + 0x1220);
        fVar256 = *(float *)(catmullrom_basis0 + lVar23 + 0x1224);
        fVar263 = *(float *)(catmullrom_basis0 + lVar23 + 0x1228);
        fVar264 = *(float *)(catmullrom_basis0 + lVar23 + 0x1694);
        fVar265 = *(float *)(catmullrom_basis0 + lVar23 + 0x1698);
        fVar333 = *(float *)(catmullrom_basis0 + lVar23 + 0x169c);
        fVar193 = *(float *)(catmullrom_basis0 + lVar23 + 0x16a0);
        fVar230 = *(float *)(catmullrom_basis0 + lVar23 + 0x16a4);
        fVar323 = *(float *)(catmullrom_basis0 + lVar23 + 0x16a8);
        fVar274 = *(float *)(catmullrom_basis0 + lVar23 + 0x16ac);
        fVar298 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b18);
        fVar232 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b1c);
        fVar324 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b20);
        fVar299 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b24);
        fVar300 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b28);
        fVar234 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b2c);
        fVar325 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b30);
        fVar301 = *(float *)(catmullrom_basis0 + lVar23 + 0x1f9c);
        fVar302 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa0);
        fVar235 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa4);
        fVar326 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa8);
        fVar169 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fac);
        fVar195 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb0);
        fVar277 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb4);
        fVar266 = auVar319._28_4_ + 0.0;
        fVar194 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar23 + 0x1fb8);
        fVar316 = *(float *)(catmullrom_basis0 + lVar23 + 0x16b0) + fVar194;
        local_6c0 = fVar327 * fVar315 + fVar239 * fVar264 + fVar170 * fVar298 + fVar168 * fVar301;
        fStack_6bc = fVar233 * fVar330 + fVar251 * fVar265 + fVar190 * fVar232 + fVar236 * fVar302;
        fStack_6b8 = fVar229 * fVar331 + fVar253 * fVar333 + fVar191 * fVar324 + fVar157 * fVar235;
        fStack_6b4 = fVar249 * fVar332 + fVar255 * fVar193 + fVar192 * fVar299 + fVar160 * fVar326;
        fStack_6b0 = fVar254 * fVar315 + fVar239 * fVar230 + fVar170 * fVar300 + fVar168 * fVar169;
        fStack_6ac = fVar256 * fVar330 + fVar251 * fVar323 + fVar190 * fVar234 + fVar236 * fVar195;
        fStack_6a8 = fVar263 * fVar331 + fVar253 * fVar274 + fVar191 * fVar325 + fVar157 * fVar277;
        fStack_6a4 = *(float *)(catmullrom_basis0 + lVar23 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar23 + 0x1fb8) + fVar266;
        auVar180._0_4_ =
             fVar287 * fVar327 + fVar196 * fVar298 + fVar343 * fVar301 + fVar359 * fVar264;
        auVar180._4_4_ =
             fVar288 * fVar233 + fVar209 * fVar232 + fVar347 * fVar302 + fVar367 * fVar265;
        auVar180._8_4_ =
             fVar289 * fVar229 + fVar210 * fVar324 + fVar348 * fVar235 + fVar368 * fVar333;
        auVar180._12_4_ =
             fVar290 * fVar249 + fVar211 * fVar299 + fVar349 * fVar326 + fVar369 * fVar193;
        auVar180._16_4_ =
             fVar287 * fVar254 + fVar196 * fVar300 + fVar343 * fVar169 + fVar359 * fVar230;
        auVar180._20_4_ =
             fVar288 * fVar256 + fVar209 * fVar234 + fVar347 * fVar195 + fVar367 * fVar323;
        auVar180._24_4_ =
             fVar289 * fVar263 + fVar210 * fVar325 + fVar348 * fVar277 + fVar368 * fVar274;
        auVar180._28_4_ = fVar194 + *(float *)(catmullrom_basis1 + lVar23 + 0x1c) + 0.0 + fVar266;
        auVar258._0_4_ =
             fVar311 * fVar264 + fVar351 * fVar298 + fVar227 * fVar301 + fVar275 * fVar327;
        auVar258._4_4_ =
             fVar312 * fVar265 + fVar355 * fVar232 + fVar231 * fVar302 + fVar276 * fVar233;
        auVar258._8_4_ =
             fVar313 * fVar333 + fVar356 * fVar324 + fVar237 * fVar235 + fVar303 * fVar229;
        auVar258._12_4_ =
             fVar314 * fVar193 + fVar357 * fVar299 + fVar252 * fVar326 + fVar310 * fVar249;
        auVar258._16_4_ =
             fVar311 * fVar230 + fVar351 * fVar300 + fVar227 * fVar169 + fVar275 * fVar254;
        auVar258._20_4_ =
             fVar312 * fVar323 + fVar355 * fVar234 + fVar231 * fVar195 + fVar276 * fVar256;
        auVar258._24_4_ =
             fVar313 * fVar274 + fVar356 * fVar325 + fVar237 * fVar277 + fVar303 * fVar263;
        auVar258._28_4_ = fVar316 + *(float *)(catmullrom_basis0 + lVar23 + 0x122c);
        fVar327 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b18);
        fVar233 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b1c);
        fVar229 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b20);
        fVar249 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b24);
        fVar254 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b28);
        fVar256 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b2c);
        fVar263 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b30);
        fVar264 = *(float *)(catmullrom_basis1 + lVar23 + 0x1f9c);
        fVar265 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa0);
        fVar333 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa4);
        fVar193 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa8);
        fVar230 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fac);
        fVar323 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb0);
        fVar274 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb4);
        fVar298 = *(float *)(catmullrom_basis1 + lVar23 + 0x1694);
        fVar232 = *(float *)(catmullrom_basis1 + lVar23 + 0x1698);
        fVar324 = *(float *)(catmullrom_basis1 + lVar23 + 0x169c);
        fVar299 = *(float *)(catmullrom_basis1 + lVar23 + 0x16a0);
        fVar300 = *(float *)(catmullrom_basis1 + lVar23 + 0x16a4);
        fVar234 = *(float *)(catmullrom_basis1 + lVar23 + 0x16a8);
        fVar325 = *(float *)(catmullrom_basis1 + lVar23 + 0x16ac);
        fVar301 = *(float *)(catmullrom_basis1 + lVar23 + 0x1210);
        fVar302 = *(float *)(catmullrom_basis1 + lVar23 + 0x1214);
        fVar235 = *(float *)(catmullrom_basis1 + lVar23 + 0x1218);
        fVar326 = *(float *)(catmullrom_basis1 + lVar23 + 0x121c);
        fVar169 = *(float *)(catmullrom_basis1 + lVar23 + 0x1220);
        fVar195 = *(float *)(catmullrom_basis1 + lVar23 + 0x1224);
        fVar277 = *(float *)(catmullrom_basis1 + lVar23 + 0x1228);
        auVar269._0_4_ =
             fVar315 * fVar301 + fVar239 * fVar298 + fVar170 * fVar327 + fVar168 * fVar264;
        auVar269._4_4_ =
             fVar330 * fVar302 + fVar251 * fVar232 + fVar190 * fVar233 + fVar236 * fVar265;
        auVar269._8_4_ =
             fVar331 * fVar235 + fVar253 * fVar324 + fVar191 * fVar229 + fVar157 * fVar333;
        auVar269._12_4_ =
             fVar332 * fVar326 + fVar255 * fVar299 + fVar192 * fVar249 + fVar160 * fVar193;
        auVar269._16_4_ =
             fVar315 * fVar169 + fVar239 * fVar300 + fVar170 * fVar254 + fVar168 * fVar230;
        auVar269._20_4_ =
             fVar330 * fVar195 + fVar251 * fVar234 + fVar190 * fVar256 + fVar236 * fVar323;
        auVar269._24_4_ =
             fVar331 * fVar277 + fVar253 * fVar325 + fVar191 * fVar263 + fVar157 * fVar274;
        auVar269._28_4_ = fVar310 + fVar310 + fVar316 + fVar160;
        auVar306._0_4_ =
             fVar287 * fVar301 + fVar359 * fVar298 + fVar196 * fVar327 + fVar343 * fVar264;
        auVar306._4_4_ =
             fVar288 * fVar302 + fVar367 * fVar232 + fVar209 * fVar233 + fVar347 * fVar265;
        auVar306._8_4_ =
             fVar289 * fVar235 + fVar368 * fVar324 + fVar210 * fVar229 + fVar348 * fVar333;
        auVar306._12_4_ =
             fVar290 * fVar326 + fVar369 * fVar299 + fVar211 * fVar249 + fVar349 * fVar193;
        auVar306._16_4_ =
             fVar287 * fVar169 + fVar359 * fVar300 + fVar196 * fVar254 + fVar343 * fVar230;
        auVar306._20_4_ =
             fVar288 * fVar195 + fVar367 * fVar234 + fVar209 * fVar256 + fVar347 * fVar323;
        auVar306._24_4_ =
             fVar289 * fVar277 + fVar368 * fVar325 + fVar210 * fVar263 + fVar348 * fVar274;
        auVar306._28_4_ = fVar310 + fVar310 + fVar310 + fVar316;
        auVar206._0_4_ =
             fVar275 * fVar301 + fVar311 * fVar298 + fVar351 * fVar327 + fVar264 * fVar227;
        auVar206._4_4_ =
             fVar276 * fVar302 + fVar312 * fVar232 + fVar355 * fVar233 + fVar265 * fVar231;
        auVar206._8_4_ =
             fVar303 * fVar235 + fVar313 * fVar324 + fVar356 * fVar229 + fVar333 * fVar237;
        auVar206._12_4_ =
             fVar310 * fVar326 + fVar314 * fVar299 + fVar357 * fVar249 + fVar193 * fVar252;
        auVar206._16_4_ =
             fVar275 * fVar169 + fVar311 * fVar300 + fVar351 * fVar254 + fVar230 * fVar227;
        auVar206._20_4_ =
             fVar276 * fVar195 + fVar312 * fVar234 + fVar355 * fVar256 + fVar323 * fVar231;
        auVar206._24_4_ =
             fVar303 * fVar277 + fVar313 * fVar325 + fVar356 * fVar263 + fVar274 * fVar237;
        auVar206._28_4_ =
             *(float *)(catmullrom_basis1 + lVar23 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar23 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar23 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar23 + 0x1fb8);
        auVar245._8_4_ = 0x7fffffff;
        auVar245._0_8_ = 0x7fffffff7fffffff;
        auVar245._12_4_ = 0x7fffffff;
        auVar245._16_4_ = 0x7fffffff;
        auVar245._20_4_ = 0x7fffffff;
        auVar245._24_4_ = 0x7fffffff;
        auVar245._28_4_ = 0x7fffffff;
        auVar115._4_4_ = fStack_6bc;
        auVar115._0_4_ = local_6c0;
        auVar115._8_4_ = fStack_6b8;
        auVar115._12_4_ = fStack_6b4;
        auVar115._16_4_ = fStack_6b0;
        auVar115._20_4_ = fStack_6ac;
        auVar115._24_4_ = fStack_6a8;
        auVar115._28_4_ = fStack_6a4;
        auVar319 = vandps_avx(auVar115,auVar245);
        auVar33 = vandps_avx(auVar180,auVar245);
        auVar33 = vmaxps_avx(auVar319,auVar33);
        auVar319 = vandps_avx(auVar258,auVar245);
        auVar319 = vmaxps_avx(auVar33,auVar319);
        auVar176 = vpermilps_avx(auVar176,0);
        auVar259._16_16_ = auVar176;
        auVar259._0_16_ = auVar176;
        auVar319 = vcmpps_avx(auVar319,auVar259,1);
        auVar36 = vblendvps_avx(auVar115,auVar31,auVar319);
        auVar364 = vblendvps_avx(auVar180,auVar32,auVar319);
        auVar319 = vandps_avx(auVar269,auVar245);
        auVar33 = vandps_avx(auVar306,auVar245);
        auVar222 = vmaxps_avx(auVar319,auVar33);
        auVar319 = vandps_avx(auVar206,auVar245);
        auVar319 = vmaxps_avx(auVar222,auVar319);
        auVar222 = vcmpps_avx(auVar319,auVar259,1);
        auVar319 = vblendvps_avx(auVar269,auVar31,auVar222);
        auVar31 = vblendvps_avx(auVar306,auVar32,auVar222);
        fVar266 = auVar36._0_4_;
        fVar316 = auVar36._4_4_;
        fVar158 = auVar36._8_4_;
        fVar161 = auVar36._12_4_;
        fVar163 = auVar36._16_4_;
        fVar165 = auVar36._20_4_;
        fVar213 = auVar36._24_4_;
        fVar168 = -auVar36._28_4_;
        fVar133 = auVar319._0_4_;
        fVar156 = auVar319._4_4_;
        fVar159 = auVar319._8_4_;
        fVar162 = auVar319._12_4_;
        fVar164 = auVar319._16_4_;
        fVar166 = auVar319._20_4_;
        fVar167 = auVar319._24_4_;
        fVar327 = auVar364._0_4_;
        fVar254 = auVar364._4_4_;
        fVar265 = auVar364._8_4_;
        fVar323 = auVar364._12_4_;
        fVar324 = auVar364._16_4_;
        fVar325 = auVar364._20_4_;
        fVar326 = auVar364._24_4_;
        auVar142._0_4_ = fVar327 * fVar327 + fVar266 * fVar266;
        auVar142._4_4_ = fVar254 * fVar254 + fVar316 * fVar316;
        auVar142._8_4_ = fVar265 * fVar265 + fVar158 * fVar158;
        auVar142._12_4_ = fVar323 * fVar323 + fVar161 * fVar161;
        auVar142._16_4_ = fVar324 * fVar324 + fVar163 * fVar163;
        auVar142._20_4_ = fVar325 * fVar325 + fVar165 * fVar165;
        auVar142._24_4_ = fVar326 * fVar326 + fVar213 * fVar213;
        auVar142._28_4_ = auVar306._28_4_ + auVar36._28_4_;
        auVar32 = vrsqrtps_avx(auVar142);
        fVar233 = auVar32._0_4_;
        fVar229 = auVar32._4_4_;
        auVar34._4_4_ = fVar229 * 1.5;
        auVar34._0_4_ = fVar233 * 1.5;
        fVar249 = auVar32._8_4_;
        auVar34._8_4_ = fVar249 * 1.5;
        fVar256 = auVar32._12_4_;
        auVar34._12_4_ = fVar256 * 1.5;
        fVar263 = auVar32._16_4_;
        auVar34._16_4_ = fVar263 * 1.5;
        fVar264 = auVar32._20_4_;
        auVar34._20_4_ = fVar264 * 1.5;
        fVar333 = auVar32._24_4_;
        fVar194 = auVar33._28_4_;
        auVar34._24_4_ = fVar333 * 1.5;
        auVar34._28_4_ = fVar194;
        auVar32._4_4_ = fVar229 * fVar229 * fVar229 * auVar142._4_4_ * 0.5;
        auVar32._0_4_ = fVar233 * fVar233 * fVar233 * auVar142._0_4_ * 0.5;
        auVar32._8_4_ = fVar249 * fVar249 * fVar249 * auVar142._8_4_ * 0.5;
        auVar32._12_4_ = fVar256 * fVar256 * fVar256 * auVar142._12_4_ * 0.5;
        auVar32._16_4_ = fVar263 * fVar263 * fVar263 * auVar142._16_4_ * 0.5;
        auVar32._20_4_ = fVar264 * fVar264 * fVar264 * auVar142._20_4_ * 0.5;
        auVar32._24_4_ = fVar333 * fVar333 * fVar333 * auVar142._24_4_ * 0.5;
        auVar32._28_4_ = auVar142._28_4_;
        auVar33 = vsubps_avx(auVar34,auVar32);
        fVar233 = auVar33._0_4_;
        fVar256 = auVar33._4_4_;
        fVar333 = auVar33._8_4_;
        fVar274 = auVar33._12_4_;
        fVar299 = auVar33._16_4_;
        fVar301 = auVar33._20_4_;
        fVar169 = auVar33._24_4_;
        fVar229 = auVar31._0_4_;
        fVar263 = auVar31._4_4_;
        fVar193 = auVar31._8_4_;
        fVar298 = auVar31._12_4_;
        fVar300 = auVar31._16_4_;
        fVar302 = auVar31._20_4_;
        fVar195 = auVar31._24_4_;
        auVar143._0_4_ = fVar229 * fVar229 + fVar133 * fVar133;
        auVar143._4_4_ = fVar263 * fVar263 + fVar156 * fVar156;
        auVar143._8_4_ = fVar193 * fVar193 + fVar159 * fVar159;
        auVar143._12_4_ = fVar298 * fVar298 + fVar162 * fVar162;
        auVar143._16_4_ = fVar300 * fVar300 + fVar164 * fVar164;
        auVar143._20_4_ = fVar302 * fVar302 + fVar166 * fVar166;
        auVar143._24_4_ = fVar195 * fVar195 + fVar167 * fVar167;
        auVar143._28_4_ = auVar319._28_4_ + auVar33._28_4_;
        auVar319 = vrsqrtps_avx(auVar143);
        fVar249 = auVar319._0_4_;
        fVar264 = auVar319._4_4_;
        auVar35._4_4_ = fVar264 * 1.5;
        auVar35._0_4_ = fVar249 * 1.5;
        fVar230 = auVar319._8_4_;
        auVar35._8_4_ = fVar230 * 1.5;
        fVar232 = auVar319._12_4_;
        auVar35._12_4_ = fVar232 * 1.5;
        fVar234 = auVar319._16_4_;
        auVar35._16_4_ = fVar234 * 1.5;
        fVar235 = auVar319._20_4_;
        auVar35._20_4_ = fVar235 * 1.5;
        fVar277 = auVar319._24_4_;
        auVar35._24_4_ = fVar277 * 1.5;
        auVar35._28_4_ = fVar194;
        auVar319._4_4_ = fVar264 * fVar264 * fVar264 * auVar143._4_4_ * 0.5;
        auVar319._0_4_ = fVar249 * fVar249 * fVar249 * auVar143._0_4_ * 0.5;
        auVar319._8_4_ = fVar230 * fVar230 * fVar230 * auVar143._8_4_ * 0.5;
        auVar319._12_4_ = fVar232 * fVar232 * fVar232 * auVar143._12_4_ * 0.5;
        auVar319._16_4_ = fVar234 * fVar234 * fVar234 * auVar143._16_4_ * 0.5;
        auVar319._20_4_ = fVar235 * fVar235 * fVar235 * auVar143._20_4_ * 0.5;
        auVar319._24_4_ = fVar277 * fVar277 * fVar277 * auVar143._24_4_ * 0.5;
        auVar319._28_4_ = auVar143._28_4_;
        auVar319 = vsubps_avx(auVar35,auVar319);
        fVar249 = auVar319._0_4_;
        fVar264 = auVar319._4_4_;
        fVar230 = auVar319._8_4_;
        fVar232 = auVar319._12_4_;
        fVar234 = auVar319._16_4_;
        fVar235 = auVar319._20_4_;
        fVar277 = auVar319._24_4_;
        fVar327 = auVar141._0_4_ * fVar327 * fVar233;
        fVar254 = auVar141._4_4_ * fVar254 * fVar256;
        auVar37._4_4_ = fVar254;
        auVar37._0_4_ = fVar327;
        fVar265 = auVar141._8_4_ * fVar265 * fVar333;
        auVar37._8_4_ = fVar265;
        fVar323 = auVar141._12_4_ * fVar323 * fVar274;
        auVar37._12_4_ = fVar323;
        fVar324 = auVar141._16_4_ * fVar324 * fVar299;
        auVar37._16_4_ = fVar324;
        fVar325 = auVar141._20_4_ * fVar325 * fVar301;
        auVar37._20_4_ = fVar325;
        fVar326 = auVar141._24_4_ * fVar326 * fVar169;
        auVar37._24_4_ = fVar326;
        auVar37._28_4_ = fVar194;
        local_680._4_4_ = fVar254 + auVar284._4_4_;
        local_680._0_4_ = fVar327 + auVar284._0_4_;
        fStack_678 = fVar265 + auVar284._8_4_;
        fStack_674 = fVar323 + auVar284._12_4_;
        fStack_670 = fVar324 + auVar284._16_4_;
        fStack_66c = fVar325 + auVar284._20_4_;
        fStack_668 = fVar326 + auVar284._24_4_;
        fStack_664 = fVar194 + auVar284._28_4_;
        fVar327 = auVar141._0_4_ * fVar233 * -fVar266;
        fVar254 = auVar141._4_4_ * fVar256 * -fVar316;
        auVar38._4_4_ = fVar254;
        auVar38._0_4_ = fVar327;
        fVar265 = auVar141._8_4_ * fVar333 * -fVar158;
        auVar38._8_4_ = fVar265;
        fVar323 = auVar141._12_4_ * fVar274 * -fVar161;
        auVar38._12_4_ = fVar323;
        fVar324 = auVar141._16_4_ * fVar299 * -fVar163;
        auVar38._16_4_ = fVar324;
        fVar325 = auVar141._20_4_ * fVar301 * -fVar165;
        auVar38._20_4_ = fVar325;
        fVar326 = auVar141._24_4_ * fVar169 * -fVar213;
        auVar38._24_4_ = fVar326;
        auVar38._28_4_ = fVar168;
        local_6a0._4_4_ = auVar337._4_4_ + fVar254;
        local_6a0._0_4_ = auVar337._0_4_ + fVar327;
        fStack_698 = auVar337._8_4_ + fVar265;
        fStack_694 = auVar337._12_4_ + fVar323;
        fStack_690 = auVar337._16_4_ + fVar324;
        fStack_68c = auVar337._20_4_ + fVar325;
        fStack_688 = auVar337._24_4_ + fVar326;
        fStack_684 = auVar337._28_4_ + fVar168;
        fVar327 = fVar233 * 0.0 * auVar141._0_4_;
        fVar233 = fVar256 * 0.0 * auVar141._4_4_;
        auVar39._4_4_ = fVar233;
        auVar39._0_4_ = fVar327;
        fVar254 = fVar333 * 0.0 * auVar141._8_4_;
        auVar39._8_4_ = fVar254;
        fVar256 = fVar274 * 0.0 * auVar141._12_4_;
        auVar39._12_4_ = fVar256;
        fVar265 = fVar299 * 0.0 * auVar141._16_4_;
        auVar39._16_4_ = fVar265;
        fVar333 = fVar301 * 0.0 * auVar141._20_4_;
        auVar39._20_4_ = fVar333;
        fVar323 = fVar169 * 0.0 * auVar141._24_4_;
        auVar39._24_4_ = fVar323;
        auVar39._28_4_ = fVar314;
        auVar270._0_4_ = (float)local_740._0_4_ + fVar327;
        auVar270._4_4_ = (float)local_740._4_4_ + fVar233;
        auVar270._8_4_ = (float)uStack_738 + fVar254;
        auVar270._12_4_ = uStack_738._4_4_ + fVar256;
        auVar270._16_4_ = (float)uStack_730 + fVar265;
        auVar270._20_4_ = uStack_730._4_4_ + fVar333;
        auVar270._24_4_ = (float)uStack_728 + fVar323;
        auVar270._28_4_ = uStack_728._4_4_ + fVar314;
        fVar327 = auVar305._0_4_ * fVar229 * fVar249;
        fVar233 = auVar305._4_4_ * fVar263 * fVar264;
        auVar40._4_4_ = fVar233;
        auVar40._0_4_ = fVar327;
        fVar229 = auVar305._8_4_ * fVar193 * fVar230;
        auVar40._8_4_ = fVar229;
        fVar254 = auVar305._12_4_ * fVar298 * fVar232;
        auVar40._12_4_ = fVar254;
        fVar256 = auVar305._16_4_ * fVar300 * fVar234;
        auVar40._16_4_ = fVar256;
        fVar263 = auVar305._20_4_ * fVar302 * fVar235;
        auVar40._20_4_ = fVar263;
        fVar265 = auVar305._24_4_ * fVar195 * fVar277;
        auVar40._24_4_ = fVar265;
        auVar40._28_4_ = auVar31._28_4_;
        auVar222 = vsubps_avx(auVar284,auVar37);
        auVar318._0_4_ = auVar244._0_4_ + fVar327;
        auVar318._4_4_ = auVar244._4_4_ + fVar233;
        auVar318._8_4_ = auVar244._8_4_ + fVar229;
        auVar318._12_4_ = auVar244._12_4_ + fVar254;
        auVar318._16_4_ = auVar244._16_4_ + fVar256;
        auVar318._20_4_ = auVar244._20_4_ + fVar263;
        auVar318._24_4_ = auVar244._24_4_ + fVar265;
        auVar318._28_4_ = auVar244._28_4_ + auVar31._28_4_;
        fVar327 = auVar305._0_4_ * fVar249 * -fVar133;
        fVar233 = auVar305._4_4_ * fVar264 * -fVar156;
        auVar31._4_4_ = fVar233;
        auVar31._0_4_ = fVar327;
        fVar229 = auVar305._8_4_ * fVar230 * -fVar159;
        auVar31._8_4_ = fVar229;
        fVar254 = auVar305._12_4_ * fVar232 * -fVar162;
        auVar31._12_4_ = fVar254;
        fVar256 = auVar305._16_4_ * fVar234 * -fVar164;
        auVar31._16_4_ = fVar256;
        fVar263 = auVar305._20_4_ * fVar235 * -fVar166;
        auVar31._20_4_ = fVar263;
        fVar265 = auVar305._24_4_ * fVar277 * -fVar167;
        auVar31._24_4_ = fVar265;
        auVar31._28_4_ = fVar357;
        auVar284 = vsubps_avx(auVar337,auVar38);
        auVar329._0_4_ = fVar327 + (float)local_720._0_4_;
        auVar329._4_4_ = fVar233 + (float)local_720._4_4_;
        auVar329._8_4_ = fVar229 + fStack_718;
        auVar329._12_4_ = fVar254 + fStack_714;
        auVar329._16_4_ = fVar256 + auVar221._16_4_;
        auVar329._20_4_ = fVar263 + auVar221._20_4_;
        auVar329._24_4_ = fVar265 + auVar221._24_4_;
        auVar329._28_4_ = fVar357 + auVar221._28_4_;
        fVar327 = fVar249 * 0.0 * auVar305._0_4_;
        fVar233 = fVar264 * 0.0 * auVar305._4_4_;
        auVar41._4_4_ = fVar233;
        auVar41._0_4_ = fVar327;
        fVar229 = fVar230 * 0.0 * auVar305._8_4_;
        auVar41._8_4_ = fVar229;
        fVar249 = fVar232 * 0.0 * auVar305._12_4_;
        auVar41._12_4_ = fVar249;
        fVar254 = fVar234 * 0.0 * auVar305._16_4_;
        auVar41._16_4_ = fVar254;
        fVar256 = fVar235 * 0.0 * auVar305._20_4_;
        auVar41._20_4_ = fVar256;
        fVar263 = fVar277 * 0.0 * auVar305._24_4_;
        auVar41._24_4_ = fVar263;
        auVar41._28_4_ = fVar168;
        auVar337 = vsubps_avx(_local_740,auVar39);
        auVar361._0_4_ = (float)local_480._0_4_ + fVar327;
        auVar361._4_4_ = (float)local_480._4_4_ + fVar233;
        auVar361._8_4_ = fStack_478 + fVar229;
        auVar361._12_4_ = fStack_474 + fVar249;
        auVar361._16_4_ = fStack_470 + fVar254;
        auVar361._20_4_ = fStack_46c + fVar256;
        auVar361._24_4_ = fStack_468 + fVar263;
        auVar361._28_4_ = fStack_464 + fVar168;
        auVar319 = vsubps_avx(auVar244,auVar40);
        auVar33 = vsubps_avx(auVar221,auVar31);
        auVar31 = vsubps_avx(_local_480,auVar41);
        auVar32 = vsubps_avx(auVar329,auVar284);
        auVar36 = vsubps_avx(auVar361,auVar337);
        auVar42._4_4_ = auVar337._4_4_ * auVar32._4_4_;
        auVar42._0_4_ = auVar337._0_4_ * auVar32._0_4_;
        auVar42._8_4_ = auVar337._8_4_ * auVar32._8_4_;
        auVar42._12_4_ = auVar337._12_4_ * auVar32._12_4_;
        auVar42._16_4_ = auVar337._16_4_ * auVar32._16_4_;
        auVar42._20_4_ = auVar337._20_4_ * auVar32._20_4_;
        auVar42._24_4_ = auVar337._24_4_ * auVar32._24_4_;
        auVar42._28_4_ = fVar357;
        auVar43._4_4_ = auVar284._4_4_ * auVar36._4_4_;
        auVar43._0_4_ = auVar284._0_4_ * auVar36._0_4_;
        auVar43._8_4_ = auVar284._8_4_ * auVar36._8_4_;
        auVar43._12_4_ = auVar284._12_4_ * auVar36._12_4_;
        auVar43._16_4_ = auVar284._16_4_ * auVar36._16_4_;
        auVar43._20_4_ = auVar284._20_4_ * auVar36._20_4_;
        auVar43._24_4_ = auVar284._24_4_ * auVar36._24_4_;
        auVar43._28_4_ = auVar221._28_4_;
        auVar364 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar222._4_4_ * auVar36._4_4_;
        auVar44._0_4_ = auVar222._0_4_ * auVar36._0_4_;
        auVar44._8_4_ = auVar222._8_4_ * auVar36._8_4_;
        auVar44._12_4_ = auVar222._12_4_ * auVar36._12_4_;
        auVar44._16_4_ = auVar222._16_4_ * auVar36._16_4_;
        auVar44._20_4_ = auVar222._20_4_ * auVar36._20_4_;
        auVar44._24_4_ = auVar222._24_4_ * auVar36._24_4_;
        auVar44._28_4_ = auVar36._28_4_;
        auVar221 = vsubps_avx(auVar318,auVar222);
        auVar45._4_4_ = auVar337._4_4_ * auVar221._4_4_;
        auVar45._0_4_ = auVar337._0_4_ * auVar221._0_4_;
        auVar45._8_4_ = auVar337._8_4_ * auVar221._8_4_;
        auVar45._12_4_ = auVar337._12_4_ * auVar221._12_4_;
        auVar45._16_4_ = auVar337._16_4_ * auVar221._16_4_;
        auVar45._20_4_ = auVar337._20_4_ * auVar221._20_4_;
        auVar45._24_4_ = auVar337._24_4_ * auVar221._24_4_;
        auVar45._28_4_ = auVar244._28_4_;
        auVar244 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar221._4_4_ * auVar284._4_4_;
        auVar46._0_4_ = auVar221._0_4_ * auVar284._0_4_;
        auVar46._8_4_ = auVar221._8_4_ * auVar284._8_4_;
        auVar46._12_4_ = auVar221._12_4_ * auVar284._12_4_;
        auVar46._16_4_ = auVar221._16_4_ * auVar284._16_4_;
        auVar46._20_4_ = auVar221._20_4_ * auVar284._20_4_;
        auVar46._24_4_ = auVar221._24_4_ * auVar284._24_4_;
        auVar46._28_4_ = auVar36._28_4_;
        auVar47._4_4_ = auVar222._4_4_ * auVar32._4_4_;
        auVar47._0_4_ = auVar222._0_4_ * auVar32._0_4_;
        auVar47._8_4_ = auVar222._8_4_ * auVar32._8_4_;
        auVar47._12_4_ = auVar222._12_4_ * auVar32._12_4_;
        auVar47._16_4_ = auVar222._16_4_ * auVar32._16_4_;
        auVar47._20_4_ = auVar222._20_4_ * auVar32._20_4_;
        auVar47._24_4_ = auVar222._24_4_ * auVar32._24_4_;
        auVar47._28_4_ = auVar32._28_4_;
        auVar32 = vsubps_avx(auVar47,auVar46);
        auVar144._0_4_ = auVar364._0_4_ * 0.0 + auVar32._0_4_ + auVar244._0_4_ * 0.0;
        auVar144._4_4_ = auVar364._4_4_ * 0.0 + auVar32._4_4_ + auVar244._4_4_ * 0.0;
        auVar144._8_4_ = auVar364._8_4_ * 0.0 + auVar32._8_4_ + auVar244._8_4_ * 0.0;
        auVar144._12_4_ = auVar364._12_4_ * 0.0 + auVar32._12_4_ + auVar244._12_4_ * 0.0;
        auVar144._16_4_ = auVar364._16_4_ * 0.0 + auVar32._16_4_ + auVar244._16_4_ * 0.0;
        auVar144._20_4_ = auVar364._20_4_ * 0.0 + auVar32._20_4_ + auVar244._20_4_ * 0.0;
        auVar144._24_4_ = auVar364._24_4_ * 0.0 + auVar32._24_4_ + auVar244._24_4_ * 0.0;
        auVar144._28_4_ = auVar32._28_4_ + auVar32._28_4_ + auVar244._28_4_;
        auVar244 = vcmpps_avx(auVar144,ZEXT432(0) << 0x20,2);
        auVar319 = vblendvps_avx(auVar319,_local_680,auVar244);
        auVar33 = vblendvps_avx(auVar33,_local_6a0,auVar244);
        auVar31 = vblendvps_avx(auVar31,auVar270,auVar244);
        auVar32 = vblendvps_avx(auVar222,auVar318,auVar244);
        auVar36 = vblendvps_avx(auVar284,auVar329,auVar244);
        auVar364 = vblendvps_avx(auVar337,auVar361,auVar244);
        auVar221 = vblendvps_avx(auVar318,auVar222,auVar244);
        auVar222 = vblendvps_avx(auVar329,auVar284,auVar244);
        auVar176 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
        auVar146 = vblendvps_avx(auVar361,auVar337,auVar244);
        auVar221 = vsubps_avx(auVar221,auVar319);
        auVar262 = ZEXT3264(auVar221);
        auVar284 = vsubps_avx(auVar222,auVar33);
        auVar146 = vsubps_avx(auVar146,auVar31);
        auVar337 = vsubps_avx(auVar33,auVar36);
        fVar327 = auVar284._0_4_;
        fVar213 = auVar31._0_4_;
        fVar256 = auVar284._4_4_;
        fVar133 = auVar31._4_4_;
        auVar48._4_4_ = fVar133 * fVar256;
        auVar48._0_4_ = fVar213 * fVar327;
        fVar193 = auVar284._8_4_;
        fVar156 = auVar31._8_4_;
        auVar48._8_4_ = fVar156 * fVar193;
        fVar232 = auVar284._12_4_;
        fVar159 = auVar31._12_4_;
        auVar48._12_4_ = fVar159 * fVar232;
        fVar325 = auVar284._16_4_;
        fVar162 = auVar31._16_4_;
        auVar48._16_4_ = fVar162 * fVar325;
        fVar169 = auVar284._20_4_;
        fVar164 = auVar31._20_4_;
        auVar48._20_4_ = fVar164 * fVar169;
        fVar316 = auVar284._24_4_;
        fVar166 = auVar31._24_4_;
        auVar48._24_4_ = fVar166 * fVar316;
        auVar48._28_4_ = auVar222._28_4_;
        fVar233 = auVar33._0_4_;
        fVar191 = auVar146._0_4_;
        fVar263 = auVar33._4_4_;
        fVar192 = auVar146._4_4_;
        auVar49._4_4_ = fVar192 * fVar263;
        auVar49._0_4_ = fVar191 * fVar233;
        fVar230 = auVar33._8_4_;
        fVar275 = auVar146._8_4_;
        auVar49._8_4_ = fVar275 * fVar230;
        fVar324 = auVar33._12_4_;
        fVar276 = auVar146._12_4_;
        auVar49._12_4_ = fVar276 * fVar324;
        fVar301 = auVar33._16_4_;
        fVar287 = auVar146._16_4_;
        auVar49._16_4_ = fVar287 * fVar301;
        fVar195 = auVar33._20_4_;
        fVar288 = auVar146._20_4_;
        auVar49._20_4_ = fVar288 * fVar195;
        fVar158 = auVar33._24_4_;
        fVar289 = auVar146._24_4_;
        auVar49._24_4_ = fVar289 * fVar158;
        auVar49._28_4_ = auVar329._28_4_;
        auVar33 = vsubps_avx(auVar49,auVar48);
        fVar229 = auVar319._0_4_;
        fVar264 = auVar319._4_4_;
        auVar50._4_4_ = fVar192 * fVar264;
        auVar50._0_4_ = fVar191 * fVar229;
        fVar323 = auVar319._8_4_;
        auVar50._8_4_ = fVar275 * fVar323;
        fVar299 = auVar319._12_4_;
        auVar50._12_4_ = fVar276 * fVar299;
        fVar302 = auVar319._16_4_;
        auVar50._16_4_ = fVar287 * fVar302;
        fVar277 = auVar319._20_4_;
        auVar50._20_4_ = fVar288 * fVar277;
        fVar161 = auVar319._24_4_;
        auVar50._24_4_ = fVar289 * fVar161;
        auVar50._28_4_ = auVar329._28_4_;
        fVar249 = auVar221._0_4_;
        auVar353._0_4_ = fVar213 * fVar249;
        fVar265 = auVar221._4_4_;
        auVar353._4_4_ = fVar133 * fVar265;
        fVar274 = auVar221._8_4_;
        auVar353._8_4_ = fVar156 * fVar274;
        fVar300 = auVar221._12_4_;
        auVar353._12_4_ = fVar159 * fVar300;
        fVar235 = auVar221._16_4_;
        auVar353._16_4_ = fVar162 * fVar235;
        fVar194 = auVar221._20_4_;
        auVar353._20_4_ = fVar164 * fVar194;
        fVar163 = auVar221._24_4_;
        auVar353._24_4_ = fVar166 * fVar163;
        auVar353._28_4_ = 0;
        auVar222 = vsubps_avx(auVar353,auVar50);
        auVar51._4_4_ = fVar263 * fVar265;
        auVar51._0_4_ = fVar233 * fVar249;
        auVar51._8_4_ = fVar230 * fVar274;
        auVar51._12_4_ = fVar324 * fVar300;
        auVar51._16_4_ = fVar301 * fVar235;
        auVar51._20_4_ = fVar195 * fVar194;
        auVar51._24_4_ = fVar158 * fVar163;
        auVar51._28_4_ = auVar329._28_4_;
        auVar52._4_4_ = fVar264 * fVar256;
        auVar52._0_4_ = fVar229 * fVar327;
        auVar52._8_4_ = fVar323 * fVar193;
        auVar52._12_4_ = fVar299 * fVar232;
        auVar52._16_4_ = fVar302 * fVar325;
        auVar52._20_4_ = fVar277 * fVar169;
        auVar52._24_4_ = fVar161 * fVar316;
        auVar52._28_4_ = auVar361._28_4_;
        auVar34 = vsubps_avx(auVar52,auVar51);
        auVar35 = vsubps_avx(auVar31,auVar364);
        fVar254 = auVar34._28_4_ + auVar222._28_4_;
        auVar181._0_4_ = auVar34._0_4_ + auVar222._0_4_ * 0.0 + auVar33._0_4_ * 0.0;
        auVar181._4_4_ = auVar34._4_4_ + auVar222._4_4_ * 0.0 + auVar33._4_4_ * 0.0;
        auVar181._8_4_ = auVar34._8_4_ + auVar222._8_4_ * 0.0 + auVar33._8_4_ * 0.0;
        auVar181._12_4_ = auVar34._12_4_ + auVar222._12_4_ * 0.0 + auVar33._12_4_ * 0.0;
        auVar181._16_4_ = auVar34._16_4_ + auVar222._16_4_ * 0.0 + auVar33._16_4_ * 0.0;
        auVar181._20_4_ = auVar34._20_4_ + auVar222._20_4_ * 0.0 + auVar33._20_4_ * 0.0;
        auVar181._24_4_ = auVar34._24_4_ + auVar222._24_4_ * 0.0 + auVar33._24_4_ * 0.0;
        auVar181._28_4_ = fVar254 + auVar33._28_4_;
        fVar167 = auVar337._0_4_;
        fVar168 = auVar337._4_4_;
        auVar53._4_4_ = fVar168 * auVar364._4_4_;
        auVar53._0_4_ = fVar167 * auVar364._0_4_;
        fVar236 = auVar337._8_4_;
        auVar53._8_4_ = fVar236 * auVar364._8_4_;
        fVar157 = auVar337._12_4_;
        auVar53._12_4_ = fVar157 * auVar364._12_4_;
        fVar160 = auVar337._16_4_;
        auVar53._16_4_ = fVar160 * auVar364._16_4_;
        fVar170 = auVar337._20_4_;
        auVar53._20_4_ = fVar170 * auVar364._20_4_;
        fVar190 = auVar337._24_4_;
        auVar53._24_4_ = fVar190 * auVar364._24_4_;
        auVar53._28_4_ = fVar254;
        fVar254 = auVar35._0_4_;
        fVar333 = auVar35._4_4_;
        auVar54._4_4_ = auVar36._4_4_ * fVar333;
        auVar54._0_4_ = auVar36._0_4_ * fVar254;
        fVar298 = auVar35._8_4_;
        auVar54._8_4_ = auVar36._8_4_ * fVar298;
        fVar234 = auVar35._12_4_;
        auVar54._12_4_ = auVar36._12_4_ * fVar234;
        fVar326 = auVar35._16_4_;
        auVar54._16_4_ = auVar36._16_4_ * fVar326;
        fVar266 = auVar35._20_4_;
        auVar54._20_4_ = auVar36._20_4_ * fVar266;
        fVar165 = auVar35._24_4_;
        auVar54._24_4_ = auVar36._24_4_ * fVar165;
        auVar54._28_4_ = auVar34._28_4_;
        auVar222 = vsubps_avx(auVar54,auVar53);
        auVar319 = vsubps_avx(auVar319,auVar32);
        fVar290 = auVar319._0_4_;
        fVar303 = auVar319._4_4_;
        auVar55._4_4_ = fVar303 * auVar364._4_4_;
        auVar55._0_4_ = fVar290 * auVar364._0_4_;
        fVar310 = auVar319._8_4_;
        auVar55._8_4_ = fVar310 * auVar364._8_4_;
        fVar311 = auVar319._12_4_;
        auVar55._12_4_ = fVar311 * auVar364._12_4_;
        fVar312 = auVar319._16_4_;
        auVar55._16_4_ = fVar312 * auVar364._16_4_;
        fVar313 = auVar319._20_4_;
        auVar55._20_4_ = fVar313 * auVar364._20_4_;
        fVar314 = auVar319._24_4_;
        auVar55._24_4_ = fVar314 * auVar364._24_4_;
        auVar55._28_4_ = auVar364._28_4_;
        auVar56._4_4_ = auVar32._4_4_ * fVar333;
        auVar56._0_4_ = auVar32._0_4_ * fVar254;
        auVar56._8_4_ = auVar32._8_4_ * fVar298;
        auVar56._12_4_ = auVar32._12_4_ * fVar234;
        auVar56._16_4_ = auVar32._16_4_ * fVar326;
        auVar56._20_4_ = auVar32._20_4_ * fVar266;
        auVar56._24_4_ = auVar32._24_4_ * fVar165;
        auVar56._28_4_ = auVar33._28_4_;
        auVar319 = vsubps_avx(auVar55,auVar56);
        auVar57._4_4_ = auVar36._4_4_ * fVar303;
        auVar57._0_4_ = auVar36._0_4_ * fVar290;
        auVar57._8_4_ = auVar36._8_4_ * fVar310;
        auVar57._12_4_ = auVar36._12_4_ * fVar311;
        auVar57._16_4_ = auVar36._16_4_ * fVar312;
        auVar57._20_4_ = auVar36._20_4_ * fVar313;
        auVar57._24_4_ = auVar36._24_4_ * fVar314;
        auVar57._28_4_ = auVar364._28_4_;
        auVar58._4_4_ = auVar32._4_4_ * fVar168;
        auVar58._0_4_ = auVar32._0_4_ * fVar167;
        auVar58._8_4_ = auVar32._8_4_ * fVar236;
        auVar58._12_4_ = auVar32._12_4_ * fVar157;
        auVar58._16_4_ = auVar32._16_4_ * fVar160;
        auVar58._20_4_ = auVar32._20_4_ * fVar170;
        auVar58._24_4_ = auVar32._24_4_ * fVar190;
        auVar58._28_4_ = auVar32._28_4_;
        auVar33 = vsubps_avx(auVar58,auVar57);
        auVar155 = ZEXT864(0) << 0x20;
        auVar246._0_4_ = auVar222._0_4_ * 0.0 + auVar33._0_4_ + auVar319._0_4_ * 0.0;
        auVar246._4_4_ = auVar222._4_4_ * 0.0 + auVar33._4_4_ + auVar319._4_4_ * 0.0;
        auVar246._8_4_ = auVar222._8_4_ * 0.0 + auVar33._8_4_ + auVar319._8_4_ * 0.0;
        auVar246._12_4_ = auVar222._12_4_ * 0.0 + auVar33._12_4_ + auVar319._12_4_ * 0.0;
        auVar246._16_4_ = auVar222._16_4_ * 0.0 + auVar33._16_4_ + auVar319._16_4_ * 0.0;
        auVar246._20_4_ = auVar222._20_4_ * 0.0 + auVar33._20_4_ + auVar319._20_4_ * 0.0;
        auVar246._24_4_ = auVar222._24_4_ * 0.0 + auVar33._24_4_ + auVar319._24_4_ * 0.0;
        auVar246._28_4_ = auVar33._28_4_ + auVar33._28_4_ + auVar319._28_4_;
        auVar319 = vmaxps_avx(auVar181,auVar246);
        auVar319 = vcmpps_avx(auVar319,ZEXT832(0) << 0x20,2);
        auVar202 = vpackssdw_avx(auVar319._0_16_,auVar319._16_16_);
        auVar176 = vpand_avx(auVar202,auVar176);
        auVar202 = vpmovsxwd_avx(auVar176);
        auVar203 = vpunpckhwd_avx(auVar176,auVar176);
        auVar223._16_16_ = auVar203;
        auVar223._0_16_ = auVar202;
        if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar223 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar223 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar223 >> 0x7f,0) == '\0') &&
              (auVar223 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar203 >> 0x3f,0) == '\0') &&
            (auVar223 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar203[0xf]) {
LAB_00fae5c8:
          auVar365 = ZEXT3264(local_5e0);
          auVar226 = ZEXT3264(auVar223);
          auVar297 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        }
        else {
          auVar59._4_4_ = fVar333 * fVar256;
          auVar59._0_4_ = fVar254 * fVar327;
          auVar59._8_4_ = fVar298 * fVar193;
          auVar59._12_4_ = fVar234 * fVar232;
          auVar59._16_4_ = fVar326 * fVar325;
          auVar59._20_4_ = fVar266 * fVar169;
          auVar59._24_4_ = fVar165 * fVar316;
          auVar59._28_4_ = auVar203._12_4_;
          auVar338._0_4_ = fVar167 * fVar191;
          auVar338._4_4_ = fVar168 * fVar192;
          auVar338._8_4_ = fVar236 * fVar275;
          auVar338._12_4_ = fVar157 * fVar276;
          auVar338._16_4_ = fVar160 * fVar287;
          auVar338._20_4_ = fVar170 * fVar288;
          auVar338._24_4_ = fVar190 * fVar289;
          auVar338._28_4_ = 0;
          auVar319 = vsubps_avx(auVar338,auVar59);
          auVar60._4_4_ = fVar303 * fVar192;
          auVar60._0_4_ = fVar290 * fVar191;
          auVar60._8_4_ = fVar310 * fVar275;
          auVar60._12_4_ = fVar311 * fVar276;
          auVar60._16_4_ = fVar312 * fVar287;
          auVar60._20_4_ = fVar313 * fVar288;
          auVar60._24_4_ = fVar314 * fVar289;
          auVar60._28_4_ = auVar146._28_4_;
          auVar61._4_4_ = fVar333 * fVar265;
          auVar61._0_4_ = fVar254 * fVar249;
          auVar61._8_4_ = fVar298 * fVar274;
          auVar61._12_4_ = fVar234 * fVar300;
          auVar61._16_4_ = fVar326 * fVar235;
          auVar61._20_4_ = fVar266 * fVar194;
          auVar61._24_4_ = fVar165 * fVar163;
          auVar61._28_4_ = auVar35._28_4_;
          auVar146 = vsubps_avx(auVar61,auVar60);
          auVar62._4_4_ = fVar168 * fVar265;
          auVar62._0_4_ = fVar167 * fVar249;
          auVar62._8_4_ = fVar236 * fVar274;
          auVar62._12_4_ = fVar157 * fVar300;
          auVar62._16_4_ = fVar160 * fVar235;
          auVar62._20_4_ = fVar170 * fVar194;
          auVar62._24_4_ = fVar190 * fVar163;
          auVar62._28_4_ = auVar181._28_4_;
          auVar63._4_4_ = fVar303 * fVar256;
          auVar63._0_4_ = fVar290 * fVar327;
          auVar63._8_4_ = fVar310 * fVar193;
          auVar63._12_4_ = fVar311 * fVar232;
          auVar63._16_4_ = fVar312 * fVar325;
          auVar63._20_4_ = fVar313 * fVar169;
          auVar63._24_4_ = fVar314 * fVar316;
          auVar63._28_4_ = auVar284._28_4_;
          auVar32 = vsubps_avx(auVar63,auVar62);
          auVar285._0_4_ = auVar319._0_4_ * 0.0 + auVar32._0_4_ + auVar146._0_4_ * 0.0;
          auVar285._4_4_ = auVar319._4_4_ * 0.0 + auVar32._4_4_ + auVar146._4_4_ * 0.0;
          auVar285._8_4_ = auVar319._8_4_ * 0.0 + auVar32._8_4_ + auVar146._8_4_ * 0.0;
          auVar285._12_4_ = auVar319._12_4_ * 0.0 + auVar32._12_4_ + auVar146._12_4_ * 0.0;
          auVar285._16_4_ = auVar319._16_4_ * 0.0 + auVar32._16_4_ + auVar146._16_4_ * 0.0;
          auVar285._20_4_ = auVar319._20_4_ * 0.0 + auVar32._20_4_ + auVar146._20_4_ * 0.0;
          auVar285._24_4_ = auVar319._24_4_ * 0.0 + auVar32._24_4_ + auVar146._24_4_ * 0.0;
          auVar285._28_4_ = auVar284._28_4_ + auVar32._28_4_ + auVar181._28_4_;
          auVar33 = vrcpps_avx(auVar285);
          fVar327 = auVar33._0_4_;
          fVar249 = auVar33._4_4_;
          auVar64._4_4_ = auVar285._4_4_ * fVar249;
          auVar64._0_4_ = auVar285._0_4_ * fVar327;
          fVar254 = auVar33._8_4_;
          auVar64._8_4_ = auVar285._8_4_ * fVar254;
          fVar256 = auVar33._12_4_;
          auVar64._12_4_ = auVar285._12_4_ * fVar256;
          fVar265 = auVar33._16_4_;
          auVar64._16_4_ = auVar285._16_4_ * fVar265;
          fVar333 = auVar33._20_4_;
          auVar64._20_4_ = auVar285._20_4_ * fVar333;
          fVar193 = auVar33._24_4_;
          auVar64._24_4_ = auVar285._24_4_ * fVar193;
          auVar64._28_4_ = auVar35._28_4_;
          auVar339._8_4_ = 0x3f800000;
          auVar339._0_8_ = 0x3f8000003f800000;
          auVar339._12_4_ = 0x3f800000;
          auVar339._16_4_ = 0x3f800000;
          auVar339._20_4_ = 0x3f800000;
          auVar339._24_4_ = 0x3f800000;
          auVar339._28_4_ = 0x3f800000;
          auVar36 = vsubps_avx(auVar339,auVar64);
          fVar327 = auVar36._0_4_ * fVar327 + fVar327;
          fVar249 = auVar36._4_4_ * fVar249 + fVar249;
          fVar254 = auVar36._8_4_ * fVar254 + fVar254;
          fVar256 = auVar36._12_4_ * fVar256 + fVar256;
          fVar265 = auVar36._16_4_ * fVar265 + fVar265;
          fVar333 = auVar36._20_4_ * fVar333 + fVar333;
          fVar193 = auVar36._24_4_ * fVar193 + fVar193;
          auVar65._4_4_ =
               (auVar319._4_4_ * fVar264 + auVar146._4_4_ * fVar263 + auVar32._4_4_ * fVar133) *
               fVar249;
          auVar65._0_4_ =
               (auVar319._0_4_ * fVar229 + auVar146._0_4_ * fVar233 + auVar32._0_4_ * fVar213) *
               fVar327;
          auVar65._8_4_ =
               (auVar319._8_4_ * fVar323 + auVar146._8_4_ * fVar230 + auVar32._8_4_ * fVar156) *
               fVar254;
          auVar65._12_4_ =
               (auVar319._12_4_ * fVar299 + auVar146._12_4_ * fVar324 + auVar32._12_4_ * fVar159) *
               fVar256;
          auVar65._16_4_ =
               (auVar319._16_4_ * fVar302 + auVar146._16_4_ * fVar301 + auVar32._16_4_ * fVar162) *
               fVar265;
          auVar65._20_4_ =
               (auVar319._20_4_ * fVar277 + auVar146._20_4_ * fVar195 + auVar32._20_4_ * fVar164) *
               fVar333;
          auVar65._24_4_ =
               (auVar319._24_4_ * fVar161 + auVar146._24_4_ * fVar158 + auVar32._24_4_ * fVar166) *
               fVar193;
          auVar65._28_4_ = auVar221._28_4_ + auVar31._28_4_;
          auVar262 = ZEXT3264(auVar65);
          auVar202 = vpermilps_avx(ZEXT416(uVar129),0);
          auVar145._16_16_ = auVar202;
          auVar145._0_16_ = auVar202;
          auVar319 = vcmpps_avx(auVar145,auVar65,2);
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar224._4_4_ = uVar13;
          auVar224._0_4_ = uVar13;
          auVar224._8_4_ = uVar13;
          auVar224._12_4_ = uVar13;
          auVar224._16_4_ = uVar13;
          auVar224._20_4_ = uVar13;
          auVar224._24_4_ = uVar13;
          auVar224._28_4_ = uVar13;
          auVar146 = vcmpps_avx(auVar65,auVar224,2);
          auVar319 = vandps_avx(auVar146,auVar319);
          auVar202 = vpackssdw_avx(auVar319._0_16_,auVar319._16_16_);
          auVar176 = vpand_avx(auVar176,auVar202);
          auVar202 = vpmovsxwd_avx(auVar176);
          auVar203 = vpshufd_avx(auVar176,0xee);
          auVar203 = vpmovsxwd_avx(auVar203);
          auVar223._16_16_ = auVar203;
          auVar223._0_16_ = auVar202;
          auVar365 = ZEXT3264(local_5e0);
          if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar223 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar223 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar223 >> 0x7f,0) == '\0') &&
                (auVar223 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar203 >> 0x3f,0) == '\0') &&
              (auVar223 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar203[0xf]) goto LAB_00fae5c8;
          auVar319 = vcmpps_avx(ZEXT832(0) << 0x20,auVar285,4);
          auVar202 = vpackssdw_avx(auVar319._0_16_,auVar319._16_16_);
          auVar176 = vpand_avx(auVar176,auVar202);
          auVar202 = vpmovsxwd_avx(auVar176);
          auVar226 = ZEXT1664(auVar202);
          auVar176 = vpunpckhwd_avx(auVar176,auVar176);
          auVar271._16_16_ = auVar176;
          auVar271._0_16_ = auVar202;
          auVar297 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          if ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar271 >> 0x7f,0) != '\0') ||
                (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar176 >> 0x3f,0) != '\0') ||
              (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar176[0xf] < '\0') {
            auVar66._4_4_ = auVar181._4_4_ * fVar249;
            auVar66._0_4_ = auVar181._0_4_ * fVar327;
            auVar66._8_4_ = auVar181._8_4_ * fVar254;
            auVar66._12_4_ = auVar181._12_4_ * fVar256;
            auVar66._16_4_ = auVar181._16_4_ * fVar265;
            auVar66._20_4_ = auVar181._20_4_ * fVar333;
            auVar66._24_4_ = auVar181._24_4_ * fVar193;
            auVar66._28_4_ = SUB84(uStack_5e8,4);
            auVar67._4_4_ = auVar246._4_4_ * fVar249;
            auVar67._0_4_ = auVar246._0_4_ * fVar327;
            auVar67._8_4_ = auVar246._8_4_ * fVar254;
            auVar67._12_4_ = auVar246._12_4_ * fVar256;
            auVar67._16_4_ = auVar246._16_4_ * fVar265;
            auVar67._20_4_ = auVar246._20_4_ * fVar333;
            auVar67._24_4_ = auVar246._24_4_ * fVar193;
            auVar67._28_4_ = auVar36._28_4_ + auVar33._28_4_;
            auVar247._8_4_ = 0x3f800000;
            auVar247._0_8_ = 0x3f8000003f800000;
            auVar247._12_4_ = 0x3f800000;
            auVar247._16_4_ = 0x3f800000;
            auVar247._20_4_ = 0x3f800000;
            auVar247._24_4_ = 0x3f800000;
            auVar247._28_4_ = 0x3f800000;
            auVar319 = vsubps_avx(auVar247,auVar66);
            auVar226 = ZEXT3264(auVar319);
            auVar319 = vblendvps_avx(auVar319,auVar66,auVar244);
            auVar365 = ZEXT3264(auVar319);
            auVar319 = vsubps_avx(auVar247,auVar67);
            _local_4c0 = vblendvps_avx(auVar319,auVar67,auVar244);
            auVar297 = ZEXT3264(auVar271);
            local_4a0 = auVar65;
          }
        }
        auVar309 = ZEXT3264(local_7a0);
        auVar319 = auVar365._0_32_;
        auVar146 = auVar297._0_32_;
        if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0x7f,0) != '\0') ||
              (auVar297 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar146 >> 0xbf,0) != '\0') ||
            (auVar297 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar297[0x1f] < '\0') {
          auVar33 = vsubps_avx(auVar305,auVar141);
          fVar233 = auVar141._0_4_ + auVar365._0_4_ * auVar33._0_4_;
          fVar229 = auVar141._4_4_ + auVar365._4_4_ * auVar33._4_4_;
          fVar249 = auVar141._8_4_ + auVar365._8_4_ * auVar33._8_4_;
          fVar254 = auVar141._12_4_ + auVar365._12_4_ * auVar33._12_4_;
          fVar256 = auVar141._16_4_ + auVar365._16_4_ * auVar33._16_4_;
          fVar263 = auVar141._20_4_ + auVar365._20_4_ * auVar33._20_4_;
          fVar264 = auVar141._24_4_ + auVar365._24_4_ * auVar33._24_4_;
          fVar265 = auVar33._28_4_ + 0.0;
          fVar327 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar68._4_4_ = (fVar229 + fVar229) * fVar327;
          auVar68._0_4_ = (fVar233 + fVar233) * fVar327;
          auVar68._8_4_ = (fVar249 + fVar249) * fVar327;
          auVar68._12_4_ = (fVar254 + fVar254) * fVar327;
          auVar68._16_4_ = (fVar256 + fVar256) * fVar327;
          auVar68._20_4_ = (fVar263 + fVar263) * fVar327;
          auVar68._24_4_ = (fVar264 + fVar264) * fVar327;
          auVar68._28_4_ = fVar265 + fVar265;
          auVar33 = vcmpps_avx(local_4a0,auVar68,6);
          auVar31 = auVar146 & auVar33;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            auVar226 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_3c0 = (float)local_4c0._0_4_ + (float)local_4c0._0_4_ + -1.0;
            fStack_3bc = (float)local_4c0._4_4_ + (float)local_4c0._4_4_ + -1.0;
            fStack_3b8 = (float)uStack_4b8 + (float)uStack_4b8 + -1.0;
            fStack_3b4 = uStack_4b8._4_4_ + uStack_4b8._4_4_ + -1.0;
            fStack_3b0 = (float)uStack_4b0 + (float)uStack_4b0 + -1.0;
            fStack_3ac = uStack_4b0._4_4_ + uStack_4b0._4_4_ + -1.0;
            fStack_3a8 = (float)uStack_4a8 + (float)uStack_4a8 + -1.0;
            fStack_3a4 = uStack_4a8._4_4_ + uStack_4a8._4_4_ + -1.0;
            local_4c0._4_4_ = fStack_3bc;
            local_4c0._0_4_ = local_3c0;
            uStack_4b8._0_4_ = fStack_3b8;
            uStack_4b8._4_4_ = fStack_3b4;
            uStack_4b0._0_4_ = fStack_3b0;
            uStack_4b0._4_4_ = fStack_3ac;
            auVar122 = _local_4c0;
            uStack_4a8._0_4_ = fStack_3a8;
            uStack_4a8._4_4_ = fStack_3a4;
            auVar31 = _local_4c0;
            local_3a0 = local_4a0;
            local_380 = 0;
            uStack_368 = uStack_8d8;
            uStack_358 = uStack_838;
            uStack_348 = uStack_848;
            uStack_338 = uStack_858;
            _local_4c0 = auVar31;
            if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_640 = vandps_avx(auVar33,auVar146);
              auVar200._0_4_ = 1.0 / auVar218._0_4_;
              auVar200._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar176 = vshufps_avx(auVar200,auVar200,0);
              local_300[0] = auVar176._0_4_ * (auVar365._0_4_ + 0.0);
              local_300[1] = auVar176._4_4_ * (auVar365._4_4_ + 1.0);
              local_300[2] = auVar176._8_4_ * (auVar365._8_4_ + 2.0);
              local_300[3] = auVar176._12_4_ * (auVar365._12_4_ + 3.0);
              fStack_2f0 = auVar176._0_4_ * (auVar365._16_4_ + 4.0);
              fStack_2ec = auVar176._4_4_ * (auVar365._20_4_ + 5.0);
              fStack_2e8 = auVar176._8_4_ * (auVar365._24_4_ + 6.0);
              fStack_2e4 = auVar365._28_4_ + 7.0;
              uStack_4b0 = auVar122._16_8_;
              uStack_4a8 = auVar31._24_8_;
              local_2e0 = local_4c0;
              uStack_2d8 = uStack_4b8;
              uStack_2d0 = uStack_4b0;
              uStack_2c8 = uStack_4a8;
              local_2c0 = local_4a0;
              auVar182._8_4_ = 0x7f800000;
              auVar182._0_8_ = 0x7f8000007f800000;
              auVar182._12_4_ = 0x7f800000;
              auVar182._16_4_ = 0x7f800000;
              auVar182._20_4_ = 0x7f800000;
              auVar182._24_4_ = 0x7f800000;
              auVar182._28_4_ = 0x7f800000;
              auVar146 = vblendvps_avx(auVar182,local_4a0,local_640);
              auVar33 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar33 = vminps_avx(auVar146,auVar33);
              auVar31 = vshufpd_avx(auVar33,auVar33,5);
              auVar33 = vminps_avx(auVar33,auVar31);
              auVar31 = vperm2f128_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar33,auVar31);
              auVar33 = vcmpps_avx(auVar146,auVar33,0);
              auVar31 = local_640 & auVar33;
              auVar146 = local_640;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar146 = vandps_avx(auVar33,local_640);
              }
              uVar125 = vmovmskps_avx(auVar146);
              uVar126 = 0;
              if (uVar125 != 0) {
                for (; (uVar125 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                }
              }
              uVar127 = (ulong)uVar126;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar327 = local_300[uVar127];
                fVar229 = 1.0 - fVar327;
                fVar233 = fVar327 * 3.0;
                auVar262 = ZEXT464(0x3f000000);
                auVar176 = ZEXT416((uint)((fVar229 * -2.0 * fVar327 + fVar327 * fVar327) * 0.5));
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                auVar202 = ZEXT416((uint)(((fVar229 + fVar229) * (fVar233 + 2.0) +
                                          fVar229 * fVar229 * -3.0) * 0.5));
                auVar202 = vshufps_avx(auVar202,auVar202,0);
                auVar203 = ZEXT416((uint)(((fVar327 + fVar327) * (fVar233 + -5.0) +
                                          fVar327 * fVar233) * 0.5));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                uVar13 = *(undefined4 *)((long)&local_2e0 + uVar127 * 4);
                auVar219 = ZEXT416((uint)((fVar327 * (fVar229 + fVar229) - fVar229 * fVar229) * 0.5)
                                  );
                auVar219 = vshufps_avx(auVar219,auVar219,0);
                auVar175._0_4_ =
                     auVar219._0_4_ * fVar238 +
                     auVar203._0_4_ * fVar350 + auVar176._0_4_ * fVar334 + auVar202._0_4_ * fVar358;
                auVar175._4_4_ =
                     auVar219._4_4_ * fVar250 +
                     auVar203._4_4_ * fVar354 + auVar176._4_4_ * fVar342 + auVar202._4_4_ * fVar366;
                auVar175._8_4_ =
                     auVar219._8_4_ * auVar242._8_4_ +
                     auVar203._8_4_ * auVar352._8_4_ +
                     auVar176._8_4_ * auVar336._8_4_ + auVar202._8_4_ * auVar360._8_4_;
                auVar175._12_4_ =
                     auVar219._12_4_ * auVar242._12_4_ +
                     auVar203._12_4_ * auVar352._12_4_ +
                     auVar176._12_4_ * auVar336._12_4_ + auVar202._12_4_ * auVar360._12_4_;
                auVar226 = ZEXT464(*(uint *)(local_2c0 + uVar127 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_2c0 + uVar127 * 4);
                *(float *)(ray + k * 4 + 0x180) = auVar175._0_4_;
                uVar18 = vextractps_avx(auVar175,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar18;
                uVar18 = vextractps_avx(auVar175,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar18;
                *(float *)(ray + k * 4 + 0x1e0) = fVar327;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar13;
                *(uint *)(ray + k * 4 + 0x220) = uVar16;
                *(uint *)(ray + k * 4 + 0x240) = uVar15;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                auVar176 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
                local_700._16_16_ = auVar176;
                local_700._0_16_ = auVar176;
                auVar176 = vshufps_avx(ZEXT416(uVar16),ZEXT416(uVar16),0);
                register0x00001210 = auVar176;
                _local_800 = auVar176;
                local_5a0 = ZEXT1632(*local_750);
                uStack_710 = *(undefined8 *)(local_758 + 0x10);
                uStack_708 = *(undefined8 *)(local_758 + 0x18);
                uStack_730 = *(undefined8 *)(local_758 + 0x10);
                _local_740 = *local_750;
                uStack_728 = *(undefined8 *)(local_758 + 0x18);
                auVar297 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                local_5e0 = auVar319;
                _local_440 = *pauVar9;
                local_3e0 = auVar319;
                local_37c = uVar17;
                local_370 = auVar242._0_8_;
                local_360 = auVar352._0_8_;
                local_350 = auVar360._0_8_;
                local_340 = auVar336._0_8_;
                while( true ) {
                  local_200 = local_300[uVar127];
                  local_1e0 = *(undefined4 *)((long)&local_2e0 + uVar127 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar127 * 4);
                  fVar233 = 1.0 - local_200;
                  fVar327 = local_200 * 3.0;
                  auVar176 = ZEXT416((uint)((fVar233 * -2.0 * local_200 + local_200 * local_200) *
                                           0.5));
                  auVar176 = vshufps_avx(auVar176,auVar176,0);
                  auVar202 = ZEXT416((uint)(((fVar233 + fVar233) * (fVar327 + 2.0) +
                                            fVar233 * fVar233 * -3.0) * 0.5));
                  auVar202 = vshufps_avx(auVar202,auVar202,0);
                  auVar203 = ZEXT416((uint)(((local_200 + local_200) * (fVar327 + -5.0) +
                                            local_200 * fVar327) * 0.5));
                  auVar203 = vshufps_avx(auVar203,auVar203,0);
                  local_830.context = context->user;
                  auVar219 = ZEXT416((uint)((local_200 * (fVar233 + fVar233) - fVar233 * fVar233) *
                                           0.5));
                  auVar219 = vshufps_avx(auVar219,auVar219,0);
                  auVar205._0_4_ =
                       auVar219._0_4_ * fVar238 +
                       auVar203._0_4_ * fVar350 +
                       auVar176._0_4_ * fVar334 + auVar202._0_4_ * fVar358;
                  auVar205._4_4_ =
                       auVar219._4_4_ * fVar250 +
                       auVar203._4_4_ * fVar354 +
                       auVar176._4_4_ * fVar342 + auVar202._4_4_ * fVar366;
                  auVar205._8_4_ =
                       auVar219._8_4_ * auVar242._8_4_ +
                       auVar203._8_4_ * auVar352._8_4_ +
                       auVar176._8_4_ * auVar336._8_4_ + auVar202._8_4_ * auVar360._8_4_;
                  auVar205._12_4_ =
                       auVar219._12_4_ * auVar242._12_4_ +
                       auVar203._12_4_ * auVar352._12_4_ +
                       auVar176._12_4_ * auVar336._12_4_ + auVar202._12_4_ * auVar360._12_4_;
                  auStack_250 = vshufps_avx(auVar205,auVar205,0);
                  local_260[0] = (RTCHitN)auStack_250[0];
                  local_260[1] = (RTCHitN)auStack_250[1];
                  local_260[2] = (RTCHitN)auStack_250[2];
                  local_260[3] = (RTCHitN)auStack_250[3];
                  local_260[4] = (RTCHitN)auStack_250[4];
                  local_260[5] = (RTCHitN)auStack_250[5];
                  local_260[6] = (RTCHitN)auStack_250[6];
                  local_260[7] = (RTCHitN)auStack_250[7];
                  local_260[8] = (RTCHitN)auStack_250[8];
                  local_260[9] = (RTCHitN)auStack_250[9];
                  local_260[10] = (RTCHitN)auStack_250[10];
                  local_260[0xb] = (RTCHitN)auStack_250[0xb];
                  local_260[0xc] = (RTCHitN)auStack_250[0xc];
                  local_260[0xd] = (RTCHitN)auStack_250[0xd];
                  local_260[0xe] = (RTCHitN)auStack_250[0xe];
                  local_260[0xf] = (RTCHitN)auStack_250[0xf];
                  auStack_230 = vshufps_avx(auVar205,auVar205,0x55);
                  local_240 = auStack_230;
                  auStack_210 = vshufps_avx(auVar205,auVar205,0xaa);
                  local_220 = auStack_210;
                  fStack_1fc = local_200;
                  fStack_1f8 = local_200;
                  fStack_1f4 = local_200;
                  fStack_1f0 = local_200;
                  fStack_1ec = local_200;
                  fStack_1e8 = local_200;
                  fStack_1e4 = local_200;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_800;
                  uStack_1b8 = uStack_7f8;
                  uStack_1b0 = uStack_7f0;
                  uStack_1a8 = uStack_7e8;
                  local_1a0 = local_700._0_8_;
                  uStack_198 = local_700._8_8_;
                  uStack_190 = local_700._16_8_;
                  uStack_188 = local_700._24_8_;
                  local_7e0 = vcmpps_avx(auVar155._0_32_,auVar155._0_32_,0xf);
                  local_748[1] = local_7e0;
                  *local_748 = local_7e0;
                  local_180 = (local_830.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_830.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_780 = local_740;
                  uStack_778 = uStack_738;
                  uStack_770 = uStack_730;
                  uStack_768 = uStack_728;
                  local_830.valid = (int *)&local_780;
                  local_830.geometryUserPtr = pGVar19->userPtr;
                  local_830.hit = local_260;
                  local_830.N = 8;
                  auVar179 = local_5a0._0_16_;
                  auVar140 = _local_720;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar19->intersectionFilterN)(&local_830);
                    auVar297 = ZEXT1664(auVar297._0_16_);
                    auVar309 = ZEXT3264(local_7a0);
                    auVar365 = ZEXT3264(local_5e0);
                    auVar155 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar179._8_8_ = uStack_778;
                    auVar179._0_8_ = local_780;
                    auVar140._8_8_ = uStack_768;
                    auVar140._0_8_ = uStack_770;
                    fVar239 = (float)local_6e0._0_4_;
                    fVar251 = (float)local_6e0._4_4_;
                    fVar253 = fStack_6d8;
                    fVar255 = fStack_6d4;
                    fVar228 = fStack_6d0;
                    fVar212 = fStack_6cc;
                    fVar214 = fStack_6c8;
                  }
                  auVar262 = ZEXT3264(local_7e0);
                  auVar176 = vpcmpeqd_avx(auVar179,ZEXT816(0) << 0x40);
                  auVar202 = vpcmpeqd_avx(auVar140,ZEXT816(0) << 0x40);
                  auVar208._16_16_ = auVar202;
                  auVar208._0_16_ = auVar176;
                  auVar319 = local_7e0 & ~auVar208;
                  if ((((((((auVar319 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar319 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar319 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar319 >> 0x7f,0) == '\0') &&
                        (auVar319 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar319 >> 0xbf,0) == '\0') &&
                      (auVar319 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar319[0x1f]) {
                    auVar153._0_4_ = auVar176._0_4_ ^ local_7e0._0_4_;
                    auVar153._4_4_ = auVar176._4_4_ ^ local_7e0._4_4_;
                    auVar153._8_4_ = auVar176._8_4_ ^ local_7e0._8_4_;
                    auVar153._12_4_ = auVar176._12_4_ ^ local_7e0._12_4_;
                    auVar153._16_4_ = auVar202._0_4_ ^ local_7e0._16_4_;
                    auVar153._20_4_ = auVar202._4_4_ ^ local_7e0._20_4_;
                    auVar153._24_4_ = auVar202._8_4_ ^ local_7e0._24_4_;
                    auVar153._28_4_ = auVar202._12_4_ ^ local_7e0._28_4_;
                  }
                  else {
                    p_Var22 = context->args->filter;
                    if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var22)(&local_830);
                      auVar262 = ZEXT3264(local_7e0);
                      auVar297 = ZEXT1664(auVar297._0_16_);
                      auVar309 = ZEXT3264(local_7a0);
                      auVar365 = ZEXT3264(local_5e0);
                      auVar155 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar179._8_8_ = uStack_778;
                      auVar179._0_8_ = local_780;
                      auVar140._8_8_ = uStack_768;
                      auVar140._0_8_ = uStack_770;
                      fVar239 = (float)local_6e0._0_4_;
                      fVar251 = (float)local_6e0._4_4_;
                      fVar253 = fStack_6d8;
                      fVar255 = fStack_6d4;
                      fVar228 = fStack_6d0;
                      fVar212 = fStack_6cc;
                      fVar214 = fStack_6c8;
                    }
                    auVar176 = vpcmpeqd_avx(auVar179,ZEXT816(0) << 0x40);
                    auVar202 = vpcmpeqd_avx(auVar140,ZEXT816(0) << 0x40);
                    auVar188._16_16_ = auVar202;
                    auVar188._0_16_ = auVar176;
                    auVar153._0_4_ = auVar176._0_4_ ^ auVar262._0_4_;
                    auVar153._4_4_ = auVar176._4_4_ ^ auVar262._4_4_;
                    auVar153._8_4_ = auVar176._8_4_ ^ auVar262._8_4_;
                    auVar153._12_4_ = auVar176._12_4_ ^ auVar262._12_4_;
                    auVar153._16_4_ = auVar202._0_4_ ^ auVar262._16_4_;
                    auVar153._20_4_ = auVar202._4_4_ ^ auVar262._20_4_;
                    auVar153._24_4_ = auVar202._8_4_ ^ auVar262._24_4_;
                    auVar153._28_4_ = auVar202._12_4_ ^ auVar262._28_4_;
                    auVar319 = auVar262._0_32_ & ~auVar188;
                    if ((((((((auVar319 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar319 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar319 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar319 >> 0x7f,0) != '\0') ||
                          (auVar319 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar319 >> 0xbf,0) != '\0') ||
                        (auVar319 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar319[0x1f] < '\0') {
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])local_830.hit);
                      *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar319;
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x20));
                      *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar319;
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x40));
                      *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar319;
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x60));
                      *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar319;
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x80));
                      *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar319;
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_830.hit + 0xa0));
                      *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar319;
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_830.hit + 0xc0));
                      *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar319;
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_830.hit + 0xe0));
                      *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar319;
                      auVar319 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x100));
                      *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar319;
                    }
                  }
                  auVar146 = local_4a0;
                  auVar319 = auVar365._0_32_;
                  if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar153 >> 0x7f,0) == '\0') &&
                        (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar153 >> 0xbf,0) == '\0') &&
                      (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar153[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar297._0_4_;
                  }
                  else {
                    auVar297 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_640 + uVar127 * 4) = 0;
                  auVar176 = vshufps_avx(auVar297._0_16_,auVar297._0_16_,0);
                  auVar154._16_16_ = auVar176;
                  auVar154._0_16_ = auVar176;
                  auVar226 = ZEXT3264(auVar146);
                  auVar31 = vcmpps_avx(auVar146,auVar154,2);
                  auVar33 = vandps_avx(auVar31,local_640);
                  local_640 = local_640 & auVar31;
                  if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_640 >> 0x7f,0) == '\0') &&
                        (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_640 >> 0xbf,0) == '\0') &&
                      (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_640[0x1f]) break;
                  auVar189._8_4_ = 0x7f800000;
                  auVar189._0_8_ = 0x7f8000007f800000;
                  auVar189._12_4_ = 0x7f800000;
                  auVar189._16_4_ = 0x7f800000;
                  auVar189._20_4_ = 0x7f800000;
                  auVar189._24_4_ = 0x7f800000;
                  auVar189._28_4_ = 0x7f800000;
                  auVar319 = vblendvps_avx(auVar189,auVar146,auVar33);
                  auVar146 = vshufps_avx(auVar319,auVar319,0xb1);
                  auVar146 = vminps_avx(auVar319,auVar146);
                  auVar31 = vshufpd_avx(auVar146,auVar146,5);
                  auVar146 = vminps_avx(auVar146,auVar31);
                  auVar31 = vperm2f128_avx(auVar146,auVar146,1);
                  auVar146 = vminps_avx(auVar146,auVar31);
                  auVar146 = vcmpps_avx(auVar319,auVar146,0);
                  auVar31 = auVar33 & auVar146;
                  auVar319 = auVar33;
                  if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar31 >> 0x7f,0) != '\0') ||
                        (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar31 >> 0xbf,0) != '\0') ||
                      (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar31[0x1f] < '\0') {
                    auVar319 = vandps_avx(auVar146,auVar33);
                  }
                  uVar125 = vmovmskps_avx(auVar319);
                  uVar126 = 0;
                  if (uVar125 != 0) {
                    for (; (uVar125 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                    }
                  }
                  uVar127 = (ulong)uVar126;
                  local_640 = auVar33;
                }
              }
            }
          }
        }
      }
      local_5e0 = auVar319;
      if (8 < (int)uVar17) {
        _local_440 = vpshufd_avx(ZEXT416(uVar17),0);
        auVar176 = vshufps_avx(local_7c0._0_16_,local_7c0._0_16_,0);
        register0x00001210 = auVar176;
        _local_480 = auVar176;
        auVar176 = vpermilps_avx(ZEXT416(uVar129),0);
        local_100._16_16_ = auVar176;
        local_100._0_16_ = auVar176;
        auVar138._0_4_ = 1.0 / (float)local_560._0_4_;
        auVar138._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar176 = vshufps_avx(auVar138,auVar138,0);
        register0x00001210 = auVar176;
        _local_140 = auVar176;
        auVar176 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
        local_560._16_16_ = auVar176;
        local_560._0_16_ = auVar176;
        auVar176 = vshufps_avx(ZEXT416(uVar16),ZEXT416(uVar16),0);
        local_120._16_16_ = auVar176;
        local_120._0_16_ = auVar176;
        auVar155 = ZEXT3264(local_120);
        lVar132 = 8;
        fVar327 = (float)local_660._0_4_;
        fVar233 = (float)local_660._4_4_;
        fVar229 = fStack_658;
        fVar249 = fStack_654;
        fVar254 = fStack_650;
        fVar256 = fStack_64c;
        fVar263 = fStack_648;
        do {
          pauVar10 = (undefined1 (*) [28])(catmullrom_basis0 + lVar132 * 4 + lVar23);
          fVar264 = *(float *)*pauVar10;
          fVar265 = *(float *)(*pauVar10 + 4);
          fVar333 = *(float *)(*pauVar10 + 8);
          fVar193 = *(float *)(*pauVar10 + 0xc);
          fVar230 = *(float *)(*pauVar10 + 0x10);
          fVar323 = *(float *)(*pauVar10 + 0x14);
          fVar274 = *(float *)(*pauVar10 + 0x18);
          auVar121 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar23 + 0x21b37f0 + lVar132 * 4);
          fVar298 = *(float *)*pauVar10;
          fVar232 = *(float *)(*pauVar10 + 4);
          fVar324 = *(float *)(*pauVar10 + 8);
          fVar299 = *(float *)(*pauVar10 + 0xc);
          fVar300 = *(float *)(*pauVar10 + 0x10);
          fVar234 = *(float *)(*pauVar10 + 0x14);
          fVar325 = *(float *)(*pauVar10 + 0x18);
          auVar120 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar23 + 0x21b3c74 + lVar132 * 4);
          fVar301 = *(float *)*pauVar10;
          fVar302 = *(float *)(*pauVar10 + 4);
          fVar235 = *(float *)(*pauVar10 + 8);
          fVar326 = *(float *)(*pauVar10 + 0xc);
          fVar169 = *(float *)(*pauVar10 + 0x10);
          fVar195 = *(float *)(*pauVar10 + 0x14);
          fVar277 = *(float *)(*pauVar10 + 0x18);
          auVar118 = *pauVar10;
          pauVar12 = (undefined1 (*) [32])(lVar23 + 0x21b40f8 + lVar132 * 4);
          fVar194 = *(float *)*pauVar12;
          fVar266 = *(float *)(*pauVar12 + 4);
          fVar316 = *(float *)(*pauVar12 + 8);
          fVar158 = *(float *)(*pauVar12 + 0xc);
          fVar161 = *(float *)(*pauVar12 + 0x10);
          fVar163 = *(float *)(*pauVar12 + 0x14);
          fVar165 = *(float *)(*pauVar12 + 0x18);
          auVar117 = *(undefined1 (*) [28])*pauVar12;
          fVar133 = auVar226._28_4_;
          fVar213 = fVar133 + *(float *)(*pauVar12 + 0x1c);
          fVar168 = fVar133 + fVar133 + auVar155._28_4_;
          fVar157 = auVar309._0_4_;
          fVar160 = auVar309._4_4_;
          fVar170 = auVar309._8_4_;
          fVar190 = auVar309._12_4_;
          fVar191 = auVar309._16_4_;
          fVar192 = auVar309._20_4_;
          fVar275 = auVar309._24_4_;
          fVar236 = fVar133 + fVar213;
          auVar362._0_4_ =
               (float)local_540._0_4_ * fVar264 +
               fVar239 * fVar298 +
               fVar301 * (float)local_520._0_4_ + (float)local_580._0_4_ * fVar194;
          auVar362._4_4_ =
               (float)local_540._4_4_ * fVar265 +
               fVar251 * fVar232 +
               fVar302 * (float)local_520._4_4_ + (float)local_580._4_4_ * fVar266;
          auVar362._8_4_ =
               fStack_538 * fVar333 +
               fVar253 * fVar324 + fVar235 * fStack_518 + fStack_578 * fVar316;
          auVar362._12_4_ =
               fStack_534 * fVar193 +
               fVar255 * fVar299 + fVar326 * fStack_514 + fStack_574 * fVar158;
          auVar362._16_4_ =
               fStack_530 * fVar230 +
               fVar228 * fVar300 + fVar169 * fStack_510 + fStack_570 * fVar161;
          auVar362._20_4_ =
               fStack_52c * fVar323 +
               fVar212 * fVar234 + fVar195 * fStack_50c + fStack_56c * fVar163;
          auVar362._24_4_ =
               fStack_528 * fVar274 +
               fVar214 * fVar325 + fVar277 * fStack_508 + fStack_568 * fVar165;
          auVar362._28_4_ = fVar213 + fVar168;
          local_7c0._0_4_ =
               (float)local_c0._0_4_ * fVar264 +
               fVar157 * fVar298 + fVar196 * fVar301 + fVar327 * fVar194;
          local_7c0._4_4_ =
               (float)local_c0._4_4_ * fVar265 +
               fVar160 * fVar232 + fVar209 * fVar302 + fVar233 * fVar266;
          local_7c0._8_4_ =
               fStack_b8 * fVar333 + fVar170 * fVar324 + fVar210 * fVar235 + fVar229 * fVar316;
          local_7c0._12_4_ =
               fStack_b4 * fVar193 + fVar190 * fVar299 + fVar211 * fVar326 + fVar249 * fVar158;
          local_7c0._16_4_ =
               fStack_b0 * fVar230 + fVar191 * fVar300 + fVar196 * fVar169 + fVar254 * fVar161;
          local_7c0._20_4_ =
               fStack_ac * fVar323 + fVar192 * fVar234 + fVar209 * fVar195 + fVar256 * fVar163;
          local_7c0._24_4_ =
               fStack_a8 * fVar274 + fVar275 * fVar325 + fVar210 * fVar277 + fVar263 * fVar165;
          local_7c0._28_4_ = fVar168 + fVar133 + fVar133 + auVar262._28_4_;
          fVar133 = fVar264 * (float)local_2a0._0_4_ +
                    fVar298 * (float)local_280._0_4_ +
                    (float)local_80._0_4_ * fVar301 + (float)local_a0._0_4_ * fVar194;
          fVar156 = fVar265 * (float)local_2a0._4_4_ +
                    fVar232 * (float)local_280._4_4_ +
                    (float)local_80._4_4_ * fVar302 + (float)local_a0._4_4_ * fVar266;
          fVar159 = fVar333 * fStack_298 +
                    fVar324 * fStack_278 + fStack_78 * fVar235 + fStack_98 * fVar316;
          fVar162 = fVar193 * fStack_294 +
                    fVar299 * fStack_274 + fStack_74 * fVar326 + fStack_94 * fVar158;
          fVar164 = fVar230 * fStack_290 +
                    fVar300 * fStack_270 + fStack_70 * fVar169 + fStack_90 * fVar161;
          fVar166 = fVar323 * fStack_28c +
                    fVar234 * fStack_26c + fStack_6c * fVar195 + fStack_8c * fVar163;
          fVar167 = fVar274 * fStack_288 +
                    fVar325 * fStack_268 + fStack_68 * fVar277 + fStack_88 * fVar165;
          fVar168 = fVar168 + fVar236;
          pauVar11 = (undefined1 (*) [32])(catmullrom_basis1 + lVar132 * 4 + lVar23);
          auVar122 = *(undefined1 (*) [24])*pauVar11;
          pfVar1 = (float *)(lVar23 + 0x21b5c10 + lVar132 * 4);
          fVar298 = *pfVar1;
          fVar232 = pfVar1[1];
          fVar324 = pfVar1[2];
          fVar299 = pfVar1[3];
          fVar300 = pfVar1[4];
          fVar234 = pfVar1[5];
          fVar325 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar23 + 0x21b6094 + lVar132 * 4);
          fVar301 = *(float *)*pauVar10;
          fVar302 = *(float *)(*pauVar10 + 4);
          fVar235 = *(float *)(*pauVar10 + 8);
          fVar326 = *(float *)(*pauVar10 + 0xc);
          fVar169 = *(float *)(*pauVar10 + 0x10);
          fVar195 = *(float *)(*pauVar10 + 0x14);
          fVar277 = *(float *)(*pauVar10 + 0x18);
          auVar123 = *pauVar10;
          pfVar2 = (float *)(lVar23 + 0x21b6518 + lVar132 * 4);
          fVar194 = *pfVar2;
          fVar266 = pfVar2[1];
          fVar316 = pfVar2[2];
          fVar158 = pfVar2[3];
          fVar161 = pfVar2[4];
          fVar163 = pfVar2[5];
          fVar165 = pfVar2[6];
          fVar213 = pfVar2[7];
          auVar155 = ZEXT3264(*pauVar11);
          fVar236 = fVar213 + fVar213 + fVar236;
          fVar264 = auVar122._0_4_;
          fVar265 = auVar122._4_4_;
          fVar333 = auVar122._8_4_;
          fVar193 = auVar122._12_4_;
          fVar230 = auVar122._16_4_;
          fVar323 = auVar122._20_4_;
          fVar274 = (float)*(undefined8 *)(*pauVar11 + 0x18);
          local_7e0._0_4_ =
               (float)local_540._0_4_ * fVar264 +
               fVar239 * fVar298 +
               fVar301 * (float)local_520._0_4_ + (float)local_580._0_4_ * fVar194;
          local_7e0._4_4_ =
               (float)local_540._4_4_ * fVar265 +
               fVar251 * fVar232 +
               fVar302 * (float)local_520._4_4_ + (float)local_580._4_4_ * fVar266;
          local_7e0._8_4_ =
               fStack_538 * fVar333 +
               fVar253 * fVar324 + fVar235 * fStack_518 + fStack_578 * fVar316;
          local_7e0._12_4_ =
               fStack_534 * fVar193 +
               fVar255 * fVar299 + fVar326 * fStack_514 + fStack_574 * fVar158;
          auVar272._16_4_ =
               fStack_530 * fVar230 +
               fVar228 * fVar300 + fVar169 * fStack_510 + fStack_570 * fVar161;
          auVar272._0_16_ = local_7e0._0_16_;
          auVar272._20_4_ =
               fStack_52c * fVar323 +
               fVar212 * fVar234 + fVar195 * fStack_50c + fStack_56c * fVar163;
          auVar272._24_4_ =
               fStack_528 * fVar274 +
               fVar214 * fVar325 + fVar277 * fStack_508 + fStack_568 * fVar165;
          auVar272._28_4_ = fVar213 + fStack_84 + fVar236;
          auVar260._0_4_ =
               (float)local_c0._0_4_ * fVar264 +
               fVar157 * fVar298 + fVar196 * fVar301 + fVar327 * fVar194;
          auVar260._4_4_ =
               (float)local_c0._4_4_ * fVar265 +
               fVar160 * fVar232 + fVar209 * fVar302 + fVar233 * fVar266;
          auVar260._8_4_ =
               fStack_b8 * fVar333 + fVar170 * fVar324 + fVar210 * fVar235 + fVar229 * fVar316;
          auVar260._12_4_ =
               fStack_b4 * fVar193 + fVar190 * fVar299 + fVar211 * fVar326 + fVar249 * fVar158;
          auVar260._16_4_ =
               fStack_b0 * fVar230 + fVar191 * fVar300 + fVar196 * fVar169 + fVar254 * fVar161;
          auVar260._20_4_ =
               fStack_ac * fVar323 + fVar192 * fVar234 + fVar209 * fVar195 + fVar256 * fVar163;
          auVar260._24_4_ =
               fStack_a8 * fVar274 + fVar275 * fVar325 + fVar210 * fVar277 + fVar263 * fVar165;
          auVar260._28_4_ = fVar236 + fVar213 + fVar213 + auVar309._28_4_;
          auVar286._0_4_ =
               fVar298 * (float)local_280._0_4_ +
               (float)local_80._0_4_ * fVar301 + (float)local_a0._0_4_ * fVar194 +
               fVar264 * (float)local_2a0._0_4_;
          auVar286._4_4_ =
               fVar232 * (float)local_280._4_4_ +
               (float)local_80._4_4_ * fVar302 + (float)local_a0._4_4_ * fVar266 +
               fVar265 * (float)local_2a0._4_4_;
          auVar286._8_4_ =
               fVar324 * fStack_278 + fStack_78 * fVar235 + fStack_98 * fVar316 +
               fVar333 * fStack_298;
          auVar286._12_4_ =
               fVar299 * fStack_274 + fStack_74 * fVar326 + fStack_94 * fVar158 +
               fVar193 * fStack_294;
          auVar286._16_4_ =
               fVar300 * fStack_270 + fStack_70 * fVar169 + fStack_90 * fVar161 +
               fVar230 * fStack_290;
          auVar286._20_4_ =
               fVar234 * fStack_26c + fStack_6c * fVar195 + fStack_8c * fVar163 +
               fVar323 * fStack_28c;
          auVar286._24_4_ =
               fVar325 * fStack_268 + fStack_68 * fVar277 + fStack_88 * fVar165 +
               fVar274 * fStack_288;
          auVar286._28_4_ = fVar213 + fVar213 + fStack_84 + fVar236;
          auVar146 = vsubps_avx(auVar272,auVar362);
          auVar33 = vsubps_avx(auVar260,local_7c0);
          fVar254 = auVar146._0_4_;
          fVar256 = auVar146._4_4_;
          auVar69._4_4_ = fVar256 * local_7c0._4_4_;
          auVar69._0_4_ = fVar254 * local_7c0._0_4_;
          fVar263 = auVar146._8_4_;
          auVar69._8_4_ = fVar263 * local_7c0._8_4_;
          fVar301 = auVar146._12_4_;
          auVar69._12_4_ = fVar301 * local_7c0._12_4_;
          fVar302 = auVar146._16_4_;
          auVar69._16_4_ = fVar302 * local_7c0._16_4_;
          fVar235 = auVar146._20_4_;
          auVar69._20_4_ = fVar235 * local_7c0._20_4_;
          fVar326 = auVar146._24_4_;
          auVar69._24_4_ = fVar326 * local_7c0._24_4_;
          auVar69._28_4_ = fVar236;
          fVar327 = auVar33._0_4_;
          fVar228 = auVar33._4_4_;
          auVar70._4_4_ = auVar362._4_4_ * fVar228;
          auVar70._0_4_ = auVar362._0_4_ * fVar327;
          fVar212 = auVar33._8_4_;
          auVar70._8_4_ = auVar362._8_4_ * fVar212;
          fVar233 = auVar33._12_4_;
          auVar70._12_4_ = auVar362._12_4_ * fVar233;
          fVar214 = auVar33._16_4_;
          auVar70._16_4_ = auVar362._16_4_ * fVar214;
          fVar229 = auVar33._20_4_;
          auVar70._20_4_ = auVar362._20_4_ * fVar229;
          fVar249 = auVar33._24_4_;
          auVar70._24_4_ = auVar362._24_4_ * fVar249;
          auVar70._28_4_ = auVar260._28_4_;
          auVar31 = vsubps_avx(auVar69,auVar70);
          auVar114._4_4_ = fVar156;
          auVar114._0_4_ = fVar133;
          auVar114._8_4_ = fVar159;
          auVar114._12_4_ = fVar162;
          auVar114._16_4_ = fVar164;
          auVar114._20_4_ = fVar166;
          auVar114._24_4_ = fVar167;
          auVar114._28_4_ = fVar168;
          auVar319 = vmaxps_avx(auVar114,auVar286);
          auVar71._4_4_ = auVar319._4_4_ * auVar319._4_4_ * (fVar256 * fVar256 + fVar228 * fVar228);
          auVar71._0_4_ = auVar319._0_4_ * auVar319._0_4_ * (fVar254 * fVar254 + fVar327 * fVar327);
          auVar71._8_4_ = auVar319._8_4_ * auVar319._8_4_ * (fVar263 * fVar263 + fVar212 * fVar212);
          auVar71._12_4_ =
               auVar319._12_4_ * auVar319._12_4_ * (fVar301 * fVar301 + fVar233 * fVar233);
          auVar71._16_4_ =
               auVar319._16_4_ * auVar319._16_4_ * (fVar302 * fVar302 + fVar214 * fVar214);
          auVar71._20_4_ =
               auVar319._20_4_ * auVar319._20_4_ * (fVar235 * fVar235 + fVar229 * fVar229);
          auVar71._24_4_ =
               auVar319._24_4_ * auVar319._24_4_ * (fVar326 * fVar326 + fVar249 * fVar249);
          auVar71._28_4_ = auVar272._28_4_ + auVar260._28_4_;
          auVar72._4_4_ = auVar31._4_4_ * auVar31._4_4_;
          auVar72._0_4_ = auVar31._0_4_ * auVar31._0_4_;
          auVar72._8_4_ = auVar31._8_4_ * auVar31._8_4_;
          auVar72._12_4_ = auVar31._12_4_ * auVar31._12_4_;
          auVar72._16_4_ = auVar31._16_4_ * auVar31._16_4_;
          auVar72._20_4_ = auVar31._20_4_ * auVar31._20_4_;
          auVar72._24_4_ = auVar31._24_4_ * auVar31._24_4_;
          auVar72._28_4_ = auVar31._28_4_;
          auVar319 = vcmpps_avx(auVar72,auVar71,2);
          local_380 = (uint)lVar132;
          auVar202 = vpshufd_avx(ZEXT416(local_380),0);
          auVar176 = vpor_avx(auVar202,_DAT_01f7fcf0);
          auVar202 = vpor_avx(auVar202,_DAT_01fafea0);
          auVar226 = ZEXT1664(_local_440);
          auVar176 = vpcmpgtd_avx(_local_440,auVar176);
          auVar202 = vpcmpgtd_avx(_local_440,auVar202);
          auVar262 = ZEXT1664(auVar202);
          local_5a0._16_16_ = auVar202;
          local_5a0._0_16_ = auVar176;
          auVar31 = local_5a0 & auVar319;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar31 >> 0x7f,0) == '\0') &&
                (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar31 >> 0xbf,0) == '\0') &&
              (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar31[0x1f]) {
            auVar309 = ZEXT3264(auVar309._0_32_);
            fVar327 = (float)local_660._0_4_;
            fVar233 = (float)local_660._4_4_;
            fVar229 = fStack_658;
            fVar249 = fStack_654;
            fVar254 = fStack_650;
            fVar256 = fStack_64c;
            fVar263 = fStack_648;
          }
          else {
            local_6a0._0_4_ = auVar123._0_4_;
            local_6a0._4_4_ = auVar123._4_4_;
            fStack_698 = auVar123._8_4_;
            fStack_694 = auVar123._12_4_;
            fStack_690 = auVar123._16_4_;
            fStack_68c = auVar123._20_4_;
            fStack_688 = auVar123._24_4_;
            local_6c0 = fVar264 * (float)local_460._0_4_ +
                        fVar298 * (float)local_420._0_4_ +
                        (float)local_e0._0_4_ * (float)local_6a0._0_4_ + fVar227 * fVar194;
            fStack_6bc = fVar265 * (float)local_460._4_4_ +
                         fVar232 * (float)local_420._4_4_ +
                         (float)local_e0._4_4_ * (float)local_6a0._4_4_ + fVar231 * fVar266;
            fStack_6b8 = fVar333 * fStack_458 +
                         fVar324 * fStack_418 + fStack_d8 * fStack_698 + fVar237 * fVar316;
            fStack_6b4 = fVar193 * fStack_454 +
                         fVar299 * fStack_414 + fStack_d4 * fStack_694 + fVar252 * fVar158;
            fStack_6b0 = fVar230 * fStack_450 +
                         fVar300 * fStack_410 + fStack_d0 * fStack_690 + fVar227 * fVar161;
            fStack_6ac = fVar323 * fStack_44c +
                         fVar234 * fStack_40c + fStack_cc * fStack_68c + fVar231 * fVar163;
            fStack_6a8 = fVar274 * fStack_448 +
                         fVar325 * fStack_408 + fStack_c8 * fStack_688 + fVar237 * fVar165;
            fStack_6a4 = fVar211 + (float)((ulong)*(undefined8 *)(*pauVar11 + 0x18) >> 0x20) +
                                   auVar319._28_4_ + 0.0;
            local_720._0_4_ = auVar120._0_4_;
            local_720._4_4_ = auVar120._4_4_;
            fStack_718 = auVar120._8_4_;
            fStack_714 = auVar120._12_4_;
            uStack_710._0_4_ = auVar120._16_4_;
            uStack_710._4_4_ = auVar120._20_4_;
            uStack_708._0_4_ = auVar120._24_4_;
            local_740._0_4_ = auVar118._0_4_;
            local_740._4_4_ = auVar118._4_4_;
            uStack_738._0_4_ = auVar118._8_4_;
            uStack_738._4_4_ = auVar118._12_4_;
            uStack_730._0_4_ = auVar118._16_4_;
            uStack_730._4_4_ = auVar118._20_4_;
            uStack_728._0_4_ = auVar118._24_4_;
            local_680._0_4_ = auVar117._0_4_;
            local_680._4_4_ = auVar117._4_4_;
            fStack_678 = auVar117._8_4_;
            fStack_674 = auVar117._12_4_;
            fStack_670 = auVar117._16_4_;
            fStack_66c = auVar117._20_4_;
            fStack_668 = auVar117._24_4_;
            pfVar2 = (float *)(lVar23 + 0x21b4e84 + lVar132 * 4);
            fVar327 = *pfVar2;
            fVar228 = pfVar2[1];
            fVar212 = pfVar2[2];
            fVar233 = pfVar2[3];
            fVar214 = pfVar2[4];
            fVar229 = pfVar2[5];
            fVar249 = pfVar2[6];
            pfVar3 = (float *)(lVar23 + 0x21b5308 + lVar132 * 4);
            fVar254 = *pfVar3;
            fVar256 = pfVar3[1];
            fVar263 = pfVar3[2];
            fVar264 = pfVar3[3];
            fVar265 = pfVar3[4];
            fVar333 = pfVar3[5];
            fVar193 = pfVar3[6];
            fVar277 = pfVar1[7] + 0.0;
            pfVar4 = (float *)(lVar23 + 0x21b4a00 + lVar132 * 4);
            fVar230 = *pfVar4;
            fVar323 = pfVar4[1];
            fVar274 = pfVar4[2];
            fVar298 = pfVar4[3];
            fVar232 = pfVar4[4];
            fVar324 = pfVar4[5];
            fVar299 = pfVar4[6];
            fVar169 = pfVar2[7] + pfVar3[7];
            fVar195 = pfVar3[7] + fVar277;
            fVar277 = pfVar1[7] + fStack_a4 + fVar277;
            pfVar1 = (float *)(lVar23 + 0x21b457c + lVar132 * 4);
            fVar300 = *pfVar1;
            fVar234 = pfVar1[1];
            fVar325 = pfVar1[2];
            fVar301 = pfVar1[3];
            fVar302 = pfVar1[4];
            fVar235 = pfVar1[5];
            fVar326 = pfVar1[6];
            auVar147._0_4_ =
                 (float)local_540._0_4_ * fVar300 +
                 fVar230 * (float)local_6e0._0_4_ +
                 (float)local_520._0_4_ * fVar327 + (float)local_580._0_4_ * fVar254;
            auVar147._4_4_ =
                 (float)local_540._4_4_ * fVar234 +
                 fVar323 * (float)local_6e0._4_4_ +
                 (float)local_520._4_4_ * fVar228 + (float)local_580._4_4_ * fVar256;
            auVar147._8_4_ =
                 fStack_538 * fVar325 +
                 fVar274 * fStack_6d8 + fStack_518 * fVar212 + fStack_578 * fVar263;
            auVar147._12_4_ =
                 fStack_534 * fVar301 +
                 fVar298 * fStack_6d4 + fStack_514 * fVar233 + fStack_574 * fVar264;
            auVar147._16_4_ =
                 fStack_530 * fVar302 +
                 fVar232 * fStack_6d0 + fStack_510 * fVar214 + fStack_570 * fVar265;
            auVar147._20_4_ =
                 fStack_52c * fVar235 +
                 fVar324 * fStack_6cc + fStack_50c * fVar229 + fStack_56c * fVar333;
            auVar147._24_4_ =
                 fStack_528 * fVar326 +
                 fVar299 * fStack_6c8 + fStack_508 * fVar249 + fStack_568 * fVar193;
            auVar147._28_4_ = fVar169 + fVar195;
            auVar183._0_4_ =
                 fVar300 * (float)local_c0._0_4_ +
                 fVar196 * fVar327 + (float)local_660._0_4_ * fVar254 + fVar157 * fVar230;
            auVar183._4_4_ =
                 fVar234 * (float)local_c0._4_4_ +
                 fVar209 * fVar228 + (float)local_660._4_4_ * fVar256 + fVar160 * fVar323;
            auVar183._8_4_ =
                 fVar325 * fStack_b8 + fVar210 * fVar212 + fStack_658 * fVar263 + fVar170 * fVar274;
            auVar183._12_4_ =
                 fVar301 * fStack_b4 + fVar211 * fVar233 + fStack_654 * fVar264 + fVar190 * fVar298;
            auVar183._16_4_ =
                 fVar302 * fStack_b0 + fVar196 * fVar214 + fStack_650 * fVar265 + fVar191 * fVar232;
            auVar183._20_4_ =
                 fVar235 * fStack_ac + fVar209 * fVar229 + fStack_64c * fVar333 + fVar192 * fVar324;
            auVar183._24_4_ =
                 fVar326 * fStack_a8 + fVar210 * fVar249 + fStack_648 * fVar193 + fVar275 * fVar299;
            auVar183._28_4_ = fVar195 + fVar277;
            auVar345._0_4_ =
                 fVar230 * (float)local_420._0_4_ +
                 (float)local_e0._0_4_ * fVar327 + fVar227 * fVar254 +
                 fVar300 * (float)local_460._0_4_;
            auVar345._4_4_ =
                 fVar323 * (float)local_420._4_4_ +
                 (float)local_e0._4_4_ * fVar228 + fVar231 * fVar256 +
                 fVar234 * (float)local_460._4_4_;
            auVar345._8_4_ =
                 fVar274 * fStack_418 + fStack_d8 * fVar212 + fVar237 * fVar263 +
                 fVar325 * fStack_458;
            auVar345._12_4_ =
                 fVar298 * fStack_414 + fStack_d4 * fVar233 + fVar252 * fVar264 +
                 fVar301 * fStack_454;
            auVar345._16_4_ =
                 fVar232 * fStack_410 + fStack_d0 * fVar214 + fVar227 * fVar265 +
                 fVar302 * fStack_450;
            auVar345._20_4_ =
                 fVar324 * fStack_40c + fStack_cc * fVar229 + fVar231 * fVar333 +
                 fVar235 * fStack_44c;
            auVar345._24_4_ =
                 fVar299 * fStack_408 + fStack_c8 * fVar249 + fVar237 * fVar193 +
                 fVar326 * fStack_448;
            auVar345._28_4_ = pfVar4[7] + fVar169 + fVar277;
            pfVar1 = (float *)(lVar23 + 0x21b72a4 + lVar132 * 4);
            fVar327 = *pfVar1;
            fVar228 = pfVar1[1];
            fVar212 = pfVar1[2];
            fVar233 = pfVar1[3];
            fVar214 = pfVar1[4];
            fVar229 = pfVar1[5];
            fVar249 = pfVar1[6];
            pfVar2 = (float *)(lVar23 + 0x21b7728 + lVar132 * 4);
            fVar254 = *pfVar2;
            fVar256 = pfVar2[1];
            fVar263 = pfVar2[2];
            fVar264 = pfVar2[3];
            fVar265 = pfVar2[4];
            fVar333 = pfVar2[5];
            fVar193 = pfVar2[6];
            pfVar3 = (float *)(lVar23 + 0x21b6e20 + lVar132 * 4);
            fVar230 = *pfVar3;
            fVar323 = pfVar3[1];
            fVar274 = pfVar3[2];
            fVar298 = pfVar3[3];
            fVar232 = pfVar3[4];
            fVar324 = pfVar3[5];
            fVar299 = pfVar3[6];
            pfVar4 = (float *)(lVar23 + 0x21b699c + lVar132 * 4);
            fVar300 = *pfVar4;
            fVar234 = pfVar4[1];
            fVar325 = pfVar4[2];
            fVar301 = pfVar4[3];
            fVar302 = pfVar4[4];
            fVar235 = pfVar4[5];
            fVar326 = pfVar4[6];
            auVar307._0_4_ =
                 fVar300 * (float)local_540._0_4_ +
                 fVar230 * (float)local_6e0._0_4_ +
                 (float)local_520._0_4_ * fVar327 + (float)local_580._0_4_ * fVar254;
            auVar307._4_4_ =
                 fVar234 * (float)local_540._4_4_ +
                 fVar323 * (float)local_6e0._4_4_ +
                 (float)local_520._4_4_ * fVar228 + (float)local_580._4_4_ * fVar256;
            auVar307._8_4_ =
                 fVar325 * fStack_538 +
                 fVar274 * fStack_6d8 + fStack_518 * fVar212 + fStack_578 * fVar263;
            auVar307._12_4_ =
                 fVar301 * fStack_534 +
                 fVar298 * fStack_6d4 + fStack_514 * fVar233 + fStack_574 * fVar264;
            auVar307._16_4_ =
                 fVar302 * fStack_530 +
                 fVar232 * fStack_6d0 + fStack_510 * fVar214 + fStack_570 * fVar265;
            auVar307._20_4_ =
                 fVar235 * fStack_52c +
                 fVar324 * fStack_6cc + fStack_50c * fVar229 + fStack_56c * fVar333;
            auVar307._24_4_ =
                 fVar326 * fStack_528 +
                 fVar299 * fStack_6c8 + fStack_508 * fVar249 + fStack_568 * fVar193;
            auVar307._28_4_ = fStack_524 + fStack_524 + fStack_564 + fStack_524;
            auVar340._0_4_ =
                 fVar300 * (float)local_c0._0_4_ +
                 fVar157 * fVar230 + fVar327 * fVar196 + (float)local_660._0_4_ * fVar254;
            auVar340._4_4_ =
                 fVar234 * (float)local_c0._4_4_ +
                 fVar160 * fVar323 + fVar228 * fVar209 + (float)local_660._4_4_ * fVar256;
            auVar340._8_4_ =
                 fVar325 * fStack_b8 + fVar170 * fVar274 + fVar212 * fVar210 + fStack_658 * fVar263;
            auVar340._12_4_ =
                 fVar301 * fStack_b4 + fVar190 * fVar298 + fVar233 * fVar211 + fStack_654 * fVar264;
            auVar340._16_4_ =
                 fVar302 * fStack_b0 + fVar191 * fVar232 + fVar214 * fVar196 + fStack_650 * fVar265;
            auVar340._20_4_ =
                 fVar235 * fStack_ac + fVar192 * fVar324 + fVar229 * fVar209 + fStack_64c * fVar333;
            auVar340._24_4_ =
                 fVar326 * fStack_a8 + fVar275 * fVar299 + fVar249 * fVar210 + fStack_648 * fVar193;
            auVar340._28_4_ = fStack_524 + fStack_524 + fStack_644 + fStack_524;
            auVar261._8_4_ = 0x7fffffff;
            auVar261._0_8_ = 0x7fffffff7fffffff;
            auVar261._12_4_ = 0x7fffffff;
            auVar261._16_4_ = 0x7fffffff;
            auVar261._20_4_ = 0x7fffffff;
            auVar261._24_4_ = 0x7fffffff;
            auVar261._28_4_ = 0x7fffffff;
            auVar31 = vandps_avx(auVar147,auVar261);
            auVar32 = vandps_avx(auVar183,auVar261);
            auVar32 = vmaxps_avx(auVar31,auVar32);
            auVar31 = vandps_avx(auVar345,auVar261);
            auVar32 = vmaxps_avx(auVar32,auVar31);
            auVar32 = vcmpps_avx(auVar32,_local_480,1);
            auVar36 = vblendvps_avx(auVar147,auVar146,auVar32);
            auVar148._0_4_ =
                 fVar300 * (float)local_460._0_4_ +
                 fVar230 * (float)local_420._0_4_ +
                 fVar254 * fVar227 + (float)local_e0._0_4_ * fVar327;
            auVar148._4_4_ =
                 fVar234 * (float)local_460._4_4_ +
                 fVar323 * (float)local_420._4_4_ +
                 fVar256 * fVar231 + (float)local_e0._4_4_ * fVar228;
            auVar148._8_4_ =
                 fVar325 * fStack_458 +
                 fVar274 * fStack_418 + fVar263 * fVar237 + fStack_d8 * fVar212;
            auVar148._12_4_ =
                 fVar301 * fStack_454 +
                 fVar298 * fStack_414 + fVar264 * fVar252 + fStack_d4 * fVar233;
            auVar148._16_4_ =
                 fVar302 * fStack_450 +
                 fVar232 * fStack_410 + fVar265 * fVar227 + fStack_d0 * fVar214;
            auVar148._20_4_ =
                 fVar235 * fStack_44c +
                 fVar324 * fStack_40c + fVar333 * fVar231 + fStack_cc * fVar229;
            auVar148._24_4_ =
                 fVar326 * fStack_448 +
                 fVar299 * fStack_408 + fVar193 * fVar237 + fStack_c8 * fVar249;
            auVar148._28_4_ = auVar31._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar364 = vblendvps_avx(auVar183,auVar33,auVar32);
            auVar31 = vandps_avx(auVar307,auVar261);
            auVar32 = vandps_avx(auVar340,auVar261);
            auVar141 = vmaxps_avx(auVar31,auVar32);
            auVar31 = vandps_avx(auVar148,auVar261);
            auVar31 = vmaxps_avx(auVar141,auVar31);
            local_800._0_4_ = auVar121._0_4_;
            local_800._4_4_ = auVar121._4_4_;
            uStack_7f8._0_4_ = auVar121._8_4_;
            uStack_7f8._4_4_ = auVar121._12_4_;
            uStack_7f0._0_4_ = auVar121._16_4_;
            uStack_7f0._4_4_ = auVar121._20_4_;
            uStack_7e8._0_4_ = auVar121._24_4_;
            auVar32 = vcmpps_avx(auVar31,_local_480,1);
            auVar31 = vblendvps_avx(auVar307,auVar146,auVar32);
            auVar149._0_4_ =
                 (float)local_460._0_4_ * (float)local_800._0_4_ +
                 (float)local_420._0_4_ * (float)local_720._0_4_ +
                 (float)local_e0._0_4_ * (float)local_740._0_4_ + fVar227 * (float)local_680._0_4_;
            auVar149._4_4_ =
                 (float)local_460._4_4_ * (float)local_800._4_4_ +
                 (float)local_420._4_4_ * (float)local_720._4_4_ +
                 (float)local_e0._4_4_ * (float)local_740._4_4_ + fVar231 * (float)local_680._4_4_;
            auVar149._8_4_ =
                 fStack_458 * (float)uStack_7f8 +
                 fStack_418 * fStack_718 + fStack_d8 * (float)uStack_738 + fVar237 * fStack_678;
            auVar149._12_4_ =
                 fStack_454 * uStack_7f8._4_4_ +
                 fStack_414 * fStack_714 + fStack_d4 * uStack_738._4_4_ + fVar252 * fStack_674;
            auVar149._16_4_ =
                 fStack_450 * (float)uStack_7f0 +
                 fStack_410 * (float)uStack_710 +
                 fStack_d0 * (float)uStack_730 + fVar227 * fStack_670;
            auVar149._20_4_ =
                 fStack_44c * uStack_7f0._4_4_ +
                 fStack_40c * uStack_710._4_4_ + fStack_cc * uStack_730._4_4_ + fVar231 * fStack_66c
            ;
            auVar149._24_4_ =
                 fStack_448 * (float)uStack_7e8 +
                 fStack_408 * (float)uStack_708 +
                 fStack_c8 * (float)uStack_728 + fVar237 * fStack_668;
            auVar149._28_4_ = auVar141._28_4_ + fStack_6a4 + auVar319._28_4_ + 0.0;
            auVar32 = vblendvps_avx(auVar340,auVar33,auVar32);
            fVar161 = auVar36._0_4_;
            fVar163 = auVar36._4_4_;
            fVar165 = auVar36._8_4_;
            fVar213 = auVar36._12_4_;
            fVar239 = auVar36._16_4_;
            fVar251 = auVar36._20_4_;
            fVar253 = auVar36._24_4_;
            fVar255 = auVar36._28_4_;
            fVar230 = auVar31._0_4_;
            fVar274 = auVar31._4_4_;
            fVar232 = auVar31._8_4_;
            fVar299 = auVar31._12_4_;
            fVar234 = auVar31._16_4_;
            fVar301 = auVar31._20_4_;
            fVar235 = auVar31._24_4_;
            fVar327 = auVar364._0_4_;
            fVar212 = auVar364._4_4_;
            fVar214 = auVar364._8_4_;
            fVar249 = auVar364._12_4_;
            fVar256 = auVar364._16_4_;
            fVar264 = auVar364._20_4_;
            fVar333 = auVar364._24_4_;
            auVar320._0_4_ = fVar327 * fVar327 + fVar161 * fVar161;
            auVar320._4_4_ = fVar212 * fVar212 + fVar163 * fVar163;
            auVar320._8_4_ = fVar214 * fVar214 + fVar165 * fVar165;
            auVar320._12_4_ = fVar249 * fVar249 + fVar213 * fVar213;
            auVar320._16_4_ = fVar256 * fVar256 + fVar239 * fVar239;
            auVar320._20_4_ = fVar264 * fVar264 + fVar251 * fVar251;
            auVar320._24_4_ = fVar333 * fVar333 + fVar253 * fVar253;
            auVar320._28_4_ = auVar146._28_4_ + fStack_504;
            auVar146 = vrsqrtps_avx(auVar320);
            fVar228 = auVar146._0_4_;
            fVar233 = auVar146._4_4_;
            auVar73._4_4_ = fVar233 * 1.5;
            auVar73._0_4_ = fVar228 * 1.5;
            fVar229 = auVar146._8_4_;
            auVar73._8_4_ = fVar229 * 1.5;
            fVar254 = auVar146._12_4_;
            auVar73._12_4_ = fVar254 * 1.5;
            fVar263 = auVar146._16_4_;
            auVar73._16_4_ = fVar263 * 1.5;
            fVar265 = auVar146._20_4_;
            auVar73._20_4_ = fVar265 * 1.5;
            fVar193 = auVar146._24_4_;
            auVar73._24_4_ = fVar193 * 1.5;
            auVar73._28_4_ = auVar340._28_4_;
            auVar74._4_4_ = fVar233 * fVar233 * fVar233 * auVar320._4_4_ * 0.5;
            auVar74._0_4_ = fVar228 * fVar228 * fVar228 * auVar320._0_4_ * 0.5;
            auVar74._8_4_ = fVar229 * fVar229 * fVar229 * auVar320._8_4_ * 0.5;
            auVar74._12_4_ = fVar254 * fVar254 * fVar254 * auVar320._12_4_ * 0.5;
            auVar74._16_4_ = fVar263 * fVar263 * fVar263 * auVar320._16_4_ * 0.5;
            auVar74._20_4_ = fVar265 * fVar265 * fVar265 * auVar320._20_4_ * 0.5;
            auVar74._24_4_ = fVar193 * fVar193 * fVar193 * auVar320._24_4_ * 0.5;
            auVar74._28_4_ = auVar320._28_4_;
            auVar36 = vsubps_avx(auVar73,auVar74);
            fVar169 = auVar36._0_4_;
            fVar195 = auVar36._4_4_;
            fVar277 = auVar36._8_4_;
            fVar194 = auVar36._12_4_;
            fVar266 = auVar36._16_4_;
            fVar316 = auVar36._20_4_;
            fVar158 = auVar36._24_4_;
            fVar228 = auVar32._0_4_;
            fVar233 = auVar32._4_4_;
            fVar229 = auVar32._8_4_;
            fVar254 = auVar32._12_4_;
            fVar263 = auVar32._16_4_;
            fVar265 = auVar32._20_4_;
            fVar193 = auVar32._24_4_;
            auVar295._0_4_ = fVar228 * fVar228 + fVar230 * fVar230;
            auVar295._4_4_ = fVar233 * fVar233 + fVar274 * fVar274;
            auVar295._8_4_ = fVar229 * fVar229 + fVar232 * fVar232;
            auVar295._12_4_ = fVar254 * fVar254 + fVar299 * fVar299;
            auVar295._16_4_ = fVar263 * fVar263 + fVar234 * fVar234;
            auVar295._20_4_ = fVar265 * fVar265 + fVar301 * fVar301;
            auVar295._24_4_ = fVar193 * fVar193 + fVar235 * fVar235;
            auVar295._28_4_ = auVar146._28_4_ + auVar31._28_4_;
            auVar146 = vrsqrtps_avx(auVar295);
            fVar323 = auVar146._0_4_;
            fVar298 = auVar146._4_4_;
            auVar75._4_4_ = fVar298 * 1.5;
            auVar75._0_4_ = fVar323 * 1.5;
            fVar324 = auVar146._8_4_;
            auVar75._8_4_ = fVar324 * 1.5;
            fVar300 = auVar146._12_4_;
            auVar75._12_4_ = fVar300 * 1.5;
            fVar325 = auVar146._16_4_;
            auVar75._16_4_ = fVar325 * 1.5;
            fVar302 = auVar146._20_4_;
            auVar75._20_4_ = fVar302 * 1.5;
            fVar326 = auVar146._24_4_;
            auVar75._24_4_ = fVar326 * 1.5;
            auVar75._28_4_ = auVar340._28_4_;
            auVar76._4_4_ = fVar298 * fVar298 * fVar298 * auVar295._4_4_ * 0.5;
            auVar76._0_4_ = fVar323 * fVar323 * fVar323 * auVar295._0_4_ * 0.5;
            auVar76._8_4_ = fVar324 * fVar324 * fVar324 * auVar295._8_4_ * 0.5;
            auVar76._12_4_ = fVar300 * fVar300 * fVar300 * auVar295._12_4_ * 0.5;
            auVar76._16_4_ = fVar325 * fVar325 * fVar325 * auVar295._16_4_ * 0.5;
            auVar76._20_4_ = fVar302 * fVar302 * fVar302 * auVar295._20_4_ * 0.5;
            auVar76._24_4_ = fVar326 * fVar326 * fVar326 * auVar295._24_4_ * 0.5;
            auVar76._28_4_ = auVar295._28_4_;
            auVar31 = vsubps_avx(auVar75,auVar76);
            fVar323 = auVar31._0_4_;
            fVar298 = auVar31._4_4_;
            fVar324 = auVar31._8_4_;
            fVar300 = auVar31._12_4_;
            fVar325 = auVar31._16_4_;
            fVar302 = auVar31._20_4_;
            fVar326 = auVar31._24_4_;
            fVar327 = fVar133 * fVar169 * fVar327;
            fVar212 = fVar156 * fVar195 * fVar212;
            auVar77._4_4_ = fVar212;
            auVar77._0_4_ = fVar327;
            fVar214 = fVar159 * fVar277 * fVar214;
            auVar77._8_4_ = fVar214;
            fVar249 = fVar162 * fVar194 * fVar249;
            auVar77._12_4_ = fVar249;
            fVar256 = fVar164 * fVar266 * fVar256;
            auVar77._16_4_ = fVar256;
            fVar264 = fVar166 * fVar316 * fVar264;
            auVar77._20_4_ = fVar264;
            fVar333 = fVar167 * fVar158 * fVar333;
            auVar77._24_4_ = fVar333;
            auVar77._28_4_ = auVar146._28_4_;
            local_800._4_4_ = fVar212 + auVar362._4_4_;
            local_800._0_4_ = fVar327 + auVar362._0_4_;
            uStack_7f8._0_4_ = fVar214 + auVar362._8_4_;
            uStack_7f8._4_4_ = fVar249 + auVar362._12_4_;
            uStack_7f0._0_4_ = fVar256 + auVar362._16_4_;
            uStack_7f0._4_4_ = fVar264 + auVar362._20_4_;
            uStack_7e8._0_4_ = fVar333 + auVar362._24_4_;
            uStack_7e8._4_4_ = auVar146._28_4_ + auVar362._28_4_;
            fVar327 = fVar133 * fVar169 * -fVar161;
            fVar212 = fVar156 * fVar195 * -fVar163;
            auVar78._4_4_ = fVar212;
            auVar78._0_4_ = fVar327;
            fVar214 = fVar159 * fVar277 * -fVar165;
            auVar78._8_4_ = fVar214;
            fVar249 = fVar162 * fVar194 * -fVar213;
            auVar78._12_4_ = fVar249;
            fVar256 = fVar164 * fVar266 * -fVar239;
            auVar78._16_4_ = fVar256;
            fVar264 = fVar166 * fVar316 * -fVar251;
            auVar78._20_4_ = fVar264;
            fVar333 = fVar167 * fVar158 * -fVar253;
            auVar78._24_4_ = fVar333;
            auVar78._28_4_ = -fVar255;
            local_720._4_4_ = local_7c0._4_4_ + fVar212;
            local_720._0_4_ = local_7c0._0_4_ + fVar327;
            fStack_718 = local_7c0._8_4_ + fVar214;
            fStack_714 = local_7c0._12_4_ + fVar249;
            uStack_710._0_4_ = local_7c0._16_4_ + fVar256;
            uStack_710._4_4_ = local_7c0._20_4_ + fVar264;
            uStack_708._0_4_ = local_7c0._24_4_ + fVar333;
            uStack_708._4_4_ = local_7c0._28_4_ + -fVar255;
            fVar327 = fVar169 * 0.0 * fVar133;
            fVar212 = fVar195 * 0.0 * fVar156;
            auVar79._4_4_ = fVar212;
            auVar79._0_4_ = fVar327;
            fVar214 = fVar277 * 0.0 * fVar159;
            auVar79._8_4_ = fVar214;
            fVar249 = fVar194 * 0.0 * fVar162;
            auVar79._12_4_ = fVar249;
            fVar256 = fVar266 * 0.0 * fVar164;
            auVar79._16_4_ = fVar256;
            fVar264 = fVar316 * 0.0 * fVar166;
            auVar79._20_4_ = fVar264;
            fVar333 = fVar158 * 0.0 * fVar167;
            auVar79._24_4_ = fVar333;
            auVar79._28_4_ = fVar255;
            auVar221 = vsubps_avx(auVar362,auVar77);
            auVar363._0_4_ = fVar327 + auVar149._0_4_;
            auVar363._4_4_ = fVar212 + auVar149._4_4_;
            auVar363._8_4_ = fVar214 + auVar149._8_4_;
            auVar363._12_4_ = fVar249 + auVar149._12_4_;
            auVar363._16_4_ = fVar256 + auVar149._16_4_;
            auVar363._20_4_ = fVar264 + auVar149._20_4_;
            auVar363._24_4_ = fVar333 + auVar149._24_4_;
            auVar363._28_4_ = fVar255 + auVar149._28_4_;
            fVar327 = auVar286._0_4_ * fVar323 * fVar228;
            fVar228 = auVar286._4_4_ * fVar298 * fVar233;
            auVar80._4_4_ = fVar228;
            auVar80._0_4_ = fVar327;
            fVar212 = auVar286._8_4_ * fVar324 * fVar229;
            auVar80._8_4_ = fVar212;
            fVar233 = auVar286._12_4_ * fVar300 * fVar254;
            auVar80._12_4_ = fVar233;
            fVar214 = auVar286._16_4_ * fVar325 * fVar263;
            auVar80._16_4_ = fVar214;
            fVar229 = auVar286._20_4_ * fVar302 * fVar265;
            auVar80._20_4_ = fVar229;
            fVar249 = auVar286._24_4_ * fVar326 * fVar193;
            auVar80._24_4_ = fVar249;
            auVar80._28_4_ = fVar168;
            auVar305 = vsubps_avx(local_7c0,auVar78);
            auVar346._0_4_ = local_7e0._0_4_ + fVar327;
            auVar346._4_4_ = local_7e0._4_4_ + fVar228;
            auVar346._8_4_ = local_7e0._8_4_ + fVar212;
            auVar346._12_4_ = local_7e0._12_4_ + fVar233;
            auVar346._16_4_ = auVar272._16_4_ + fVar214;
            auVar346._20_4_ = auVar272._20_4_ + fVar229;
            auVar346._24_4_ = auVar272._24_4_ + fVar249;
            auVar346._28_4_ = auVar272._28_4_ + fVar168;
            fVar327 = fVar323 * -fVar230 * auVar286._0_4_;
            fVar228 = fVar298 * -fVar274 * auVar286._4_4_;
            auVar81._4_4_ = fVar228;
            auVar81._0_4_ = fVar327;
            fVar212 = fVar324 * -fVar232 * auVar286._8_4_;
            auVar81._8_4_ = fVar212;
            fVar233 = fVar300 * -fVar299 * auVar286._12_4_;
            auVar81._12_4_ = fVar233;
            fVar214 = fVar325 * -fVar234 * auVar286._16_4_;
            auVar81._16_4_ = fVar214;
            fVar229 = fVar302 * -fVar301 * auVar286._20_4_;
            auVar81._20_4_ = fVar229;
            fVar249 = fVar326 * -fVar235 * auVar286._24_4_;
            auVar81._24_4_ = fVar249;
            auVar81._28_4_ = auVar362._28_4_;
            auVar337 = vsubps_avx(auVar149,auVar79);
            auVar248._0_4_ = auVar260._0_4_ + fVar327;
            auVar248._4_4_ = auVar260._4_4_ + fVar228;
            auVar248._8_4_ = auVar260._8_4_ + fVar212;
            auVar248._12_4_ = auVar260._12_4_ + fVar233;
            auVar248._16_4_ = auVar260._16_4_ + fVar214;
            auVar248._20_4_ = auVar260._20_4_ + fVar229;
            auVar248._24_4_ = auVar260._24_4_ + fVar249;
            auVar248._28_4_ = auVar260._28_4_ + auVar362._28_4_;
            fVar327 = fVar323 * 0.0 * auVar286._0_4_;
            fVar228 = fVar298 * 0.0 * auVar286._4_4_;
            auVar82._4_4_ = fVar228;
            auVar82._0_4_ = fVar327;
            fVar212 = fVar324 * 0.0 * auVar286._8_4_;
            auVar82._8_4_ = fVar212;
            fVar233 = fVar300 * 0.0 * auVar286._12_4_;
            auVar82._12_4_ = fVar233;
            fVar214 = fVar325 * 0.0 * auVar286._16_4_;
            auVar82._16_4_ = fVar214;
            fVar229 = fVar302 * 0.0 * auVar286._20_4_;
            auVar82._20_4_ = fVar229;
            fVar249 = fVar326 * 0.0 * auVar286._24_4_;
            auVar82._24_4_ = fVar249;
            auVar82._28_4_ = auVar149._28_4_;
            auVar146 = vsubps_avx(auVar272,auVar80);
            auVar116._4_4_ = fStack_6bc;
            auVar116._0_4_ = local_6c0;
            auVar116._8_4_ = fStack_6b8;
            auVar116._12_4_ = fStack_6b4;
            auVar116._16_4_ = fStack_6b0;
            auVar116._20_4_ = fStack_6ac;
            auVar116._24_4_ = fStack_6a8;
            auVar116._28_4_ = fStack_6a4;
            auVar308._0_4_ = local_6c0 + fVar327;
            auVar308._4_4_ = fStack_6bc + fVar228;
            auVar308._8_4_ = fStack_6b8 + fVar212;
            auVar308._12_4_ = fStack_6b4 + fVar233;
            auVar308._16_4_ = fStack_6b0 + fVar214;
            auVar308._20_4_ = fStack_6ac + fVar229;
            auVar308._24_4_ = fStack_6a8 + fVar249;
            auVar308._28_4_ = fStack_6a4 + auVar149._28_4_;
            auVar32 = vsubps_avx(auVar260,auVar81);
            auVar36 = vsubps_avx(auVar116,auVar82);
            auVar364 = vsubps_avx(auVar248,auVar305);
            auVar141 = vsubps_avx(auVar308,auVar337);
            auVar83._4_4_ = auVar337._4_4_ * auVar364._4_4_;
            auVar83._0_4_ = auVar337._0_4_ * auVar364._0_4_;
            auVar83._8_4_ = auVar337._8_4_ * auVar364._8_4_;
            auVar83._12_4_ = auVar337._12_4_ * auVar364._12_4_;
            auVar83._16_4_ = auVar337._16_4_ * auVar364._16_4_;
            auVar83._20_4_ = auVar337._20_4_ * auVar364._20_4_;
            auVar83._24_4_ = auVar337._24_4_ * auVar364._24_4_;
            auVar83._28_4_ = auVar340._28_4_;
            auVar84._4_4_ = auVar305._4_4_ * auVar141._4_4_;
            auVar84._0_4_ = auVar305._0_4_ * auVar141._0_4_;
            auVar84._8_4_ = auVar305._8_4_ * auVar141._8_4_;
            auVar84._12_4_ = auVar305._12_4_ * auVar141._12_4_;
            auVar84._16_4_ = auVar305._16_4_ * auVar141._16_4_;
            auVar84._20_4_ = auVar305._20_4_ * auVar141._20_4_;
            auVar84._24_4_ = auVar305._24_4_ * auVar141._24_4_;
            auVar84._28_4_ = fStack_6a4;
            auVar222 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar221._4_4_ * auVar141._4_4_;
            auVar85._0_4_ = auVar221._0_4_ * auVar141._0_4_;
            auVar85._8_4_ = auVar221._8_4_ * auVar141._8_4_;
            auVar85._12_4_ = auVar221._12_4_ * auVar141._12_4_;
            auVar85._16_4_ = auVar221._16_4_ * auVar141._16_4_;
            auVar85._20_4_ = auVar221._20_4_ * auVar141._20_4_;
            auVar85._24_4_ = auVar221._24_4_ * auVar141._24_4_;
            auVar85._28_4_ = auVar141._28_4_;
            auVar141 = vsubps_avx(auVar346,auVar221);
            auVar86._4_4_ = auVar337._4_4_ * auVar141._4_4_;
            auVar86._0_4_ = auVar337._0_4_ * auVar141._0_4_;
            auVar86._8_4_ = auVar337._8_4_ * auVar141._8_4_;
            auVar86._12_4_ = auVar337._12_4_ * auVar141._12_4_;
            auVar86._16_4_ = auVar337._16_4_ * auVar141._16_4_;
            auVar86._20_4_ = auVar337._20_4_ * auVar141._20_4_;
            auVar86._24_4_ = auVar337._24_4_ * auVar141._24_4_;
            auVar86._28_4_ = auVar31._28_4_;
            auVar244 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = auVar305._4_4_ * auVar141._4_4_;
            auVar87._0_4_ = auVar305._0_4_ * auVar141._0_4_;
            auVar87._8_4_ = auVar305._8_4_ * auVar141._8_4_;
            auVar87._12_4_ = auVar305._12_4_ * auVar141._12_4_;
            auVar87._16_4_ = auVar305._16_4_ * auVar141._16_4_;
            auVar87._20_4_ = auVar305._20_4_ * auVar141._20_4_;
            auVar87._24_4_ = auVar305._24_4_ * auVar141._24_4_;
            auVar87._28_4_ = auVar31._28_4_;
            auVar88._4_4_ = auVar221._4_4_ * auVar364._4_4_;
            auVar88._0_4_ = auVar221._0_4_ * auVar364._0_4_;
            auVar88._8_4_ = auVar221._8_4_ * auVar364._8_4_;
            auVar88._12_4_ = auVar221._12_4_ * auVar364._12_4_;
            auVar88._16_4_ = auVar221._16_4_ * auVar364._16_4_;
            auVar88._20_4_ = auVar221._20_4_ * auVar364._20_4_;
            auVar88._24_4_ = auVar221._24_4_ * auVar364._24_4_;
            auVar88._28_4_ = auVar364._28_4_;
            auVar31 = vsubps_avx(auVar88,auVar87);
            auVar184._0_4_ = auVar222._0_4_ * 0.0 + auVar31._0_4_ + auVar244._0_4_ * 0.0;
            auVar184._4_4_ = auVar222._4_4_ * 0.0 + auVar31._4_4_ + auVar244._4_4_ * 0.0;
            auVar184._8_4_ = auVar222._8_4_ * 0.0 + auVar31._8_4_ + auVar244._8_4_ * 0.0;
            auVar184._12_4_ = auVar222._12_4_ * 0.0 + auVar31._12_4_ + auVar244._12_4_ * 0.0;
            auVar184._16_4_ = auVar222._16_4_ * 0.0 + auVar31._16_4_ + auVar244._16_4_ * 0.0;
            auVar184._20_4_ = auVar222._20_4_ * 0.0 + auVar31._20_4_ + auVar244._20_4_ * 0.0;
            auVar184._24_4_ = auVar222._24_4_ * 0.0 + auVar31._24_4_ + auVar244._24_4_ * 0.0;
            auVar184._28_4_ = auVar222._28_4_ + auVar31._28_4_ + auVar244._28_4_;
            auVar284 = vcmpps_avx(auVar184,ZEXT832(0) << 0x20,2);
            auVar146 = vblendvps_avx(auVar146,_local_800,auVar284);
            auVar31 = vblendvps_avx(auVar32,_local_720,auVar284);
            auVar32 = vblendvps_avx(auVar36,auVar363,auVar284);
            auVar36 = vblendvps_avx(auVar221,auVar346,auVar284);
            auVar364 = vblendvps_avx(auVar305,auVar248,auVar284);
            auVar141 = vblendvps_avx(auVar337,auVar308,auVar284);
            auVar221 = vblendvps_avx(auVar346,auVar221,auVar284);
            auVar222 = vblendvps_avx(auVar248,auVar305,auVar284);
            auVar244 = vblendvps_avx(auVar308,auVar337,auVar284);
            local_7c0 = vandps_avx(local_5a0,auVar319);
            auVar221 = vsubps_avx(auVar221,auVar146);
            auVar34 = vsubps_avx(auVar222,auVar31);
            auVar262 = ZEXT3264(auVar34);
            auVar244 = vsubps_avx(auVar244,auVar32);
            auVar35 = vsubps_avx(auVar31,auVar364);
            fVar327 = auVar34._0_4_;
            fVar192 = auVar32._0_4_;
            fVar254 = auVar34._4_4_;
            fVar275 = auVar32._4_4_;
            auVar89._4_4_ = fVar275 * fVar254;
            auVar89._0_4_ = fVar192 * fVar327;
            fVar230 = auVar34._8_4_;
            fVar276 = auVar32._8_4_;
            auVar89._8_4_ = fVar276 * fVar230;
            fVar300 = auVar34._12_4_;
            fVar287 = auVar32._12_4_;
            auVar89._12_4_ = fVar287 * fVar300;
            fVar169 = auVar34._16_4_;
            fVar288 = auVar32._16_4_;
            auVar89._16_4_ = fVar288 * fVar169;
            fVar161 = auVar34._20_4_;
            fVar289 = auVar32._20_4_;
            auVar89._20_4_ = fVar289 * fVar161;
            fVar255 = auVar34._24_4_;
            fVar290 = auVar32._24_4_;
            auVar89._24_4_ = fVar290 * fVar255;
            auVar89._28_4_ = auVar222._28_4_;
            fVar228 = auVar31._0_4_;
            fVar303 = auVar244._0_4_;
            fVar256 = auVar31._4_4_;
            fVar310 = auVar244._4_4_;
            auVar90._4_4_ = fVar310 * fVar256;
            auVar90._0_4_ = fVar303 * fVar228;
            fVar323 = auVar31._8_4_;
            fVar311 = auVar244._8_4_;
            auVar90._8_4_ = fVar311 * fVar323;
            fVar234 = auVar31._12_4_;
            fVar312 = auVar244._12_4_;
            auVar90._12_4_ = fVar312 * fVar234;
            fVar195 = auVar31._16_4_;
            fVar313 = auVar244._16_4_;
            auVar90._16_4_ = fVar313 * fVar195;
            fVar163 = auVar31._20_4_;
            fVar314 = auVar244._20_4_;
            auVar90._20_4_ = fVar314 * fVar163;
            fVar236 = auVar31._24_4_;
            fVar315 = auVar244._24_4_;
            uVar13 = auVar305._28_4_;
            auVar90._24_4_ = fVar315 * fVar236;
            auVar90._28_4_ = uVar13;
            auVar222 = vsubps_avx(auVar90,auVar89);
            fVar212 = auVar146._0_4_;
            fVar263 = auVar146._4_4_;
            auVar91._4_4_ = fVar310 * fVar263;
            auVar91._0_4_ = fVar303 * fVar212;
            fVar274 = auVar146._8_4_;
            auVar91._8_4_ = fVar311 * fVar274;
            fVar325 = auVar146._12_4_;
            auVar91._12_4_ = fVar312 * fVar325;
            fVar277 = auVar146._16_4_;
            auVar91._16_4_ = fVar313 * fVar277;
            fVar165 = auVar146._20_4_;
            auVar91._20_4_ = fVar314 * fVar165;
            fVar157 = auVar146._24_4_;
            auVar91._24_4_ = fVar315 * fVar157;
            auVar91._28_4_ = uVar13;
            fVar233 = auVar221._0_4_;
            fVar264 = auVar221._4_4_;
            auVar92._4_4_ = fVar275 * fVar264;
            auVar92._0_4_ = fVar192 * fVar233;
            fVar298 = auVar221._8_4_;
            auVar92._8_4_ = fVar276 * fVar298;
            fVar301 = auVar221._12_4_;
            auVar92._12_4_ = fVar287 * fVar301;
            fVar194 = auVar221._16_4_;
            auVar92._16_4_ = fVar288 * fVar194;
            fVar213 = auVar221._20_4_;
            auVar92._20_4_ = fVar289 * fVar213;
            fVar160 = auVar221._24_4_;
            auVar92._24_4_ = fVar290 * fVar160;
            auVar92._28_4_ = auVar346._28_4_;
            auVar305 = vsubps_avx(auVar92,auVar91);
            auVar93._4_4_ = fVar256 * fVar264;
            auVar93._0_4_ = fVar228 * fVar233;
            auVar93._8_4_ = fVar323 * fVar298;
            auVar93._12_4_ = fVar234 * fVar301;
            auVar93._16_4_ = fVar195 * fVar194;
            auVar93._20_4_ = fVar163 * fVar213;
            auVar93._24_4_ = fVar236 * fVar160;
            auVar93._28_4_ = uVar13;
            auVar94._4_4_ = fVar263 * fVar254;
            auVar94._0_4_ = fVar212 * fVar327;
            auVar94._8_4_ = fVar274 * fVar230;
            auVar94._12_4_ = fVar325 * fVar300;
            auVar94._16_4_ = fVar277 * fVar169;
            auVar94._20_4_ = fVar165 * fVar161;
            auVar94._24_4_ = fVar157 * fVar255;
            auVar94._28_4_ = auVar337._28_4_;
            auVar337 = vsubps_avx(auVar94,auVar93);
            auVar32 = vsubps_avx(auVar32,auVar141);
            fVar229 = auVar337._28_4_ + auVar305._28_4_;
            auVar321._0_4_ = auVar337._0_4_ + auVar305._0_4_ * 0.0 + auVar222._0_4_ * 0.0;
            auVar321._4_4_ = auVar337._4_4_ + auVar305._4_4_ * 0.0 + auVar222._4_4_ * 0.0;
            auVar321._8_4_ = auVar337._8_4_ + auVar305._8_4_ * 0.0 + auVar222._8_4_ * 0.0;
            auVar321._12_4_ = auVar337._12_4_ + auVar305._12_4_ * 0.0 + auVar222._12_4_ * 0.0;
            auVar321._16_4_ = auVar337._16_4_ + auVar305._16_4_ * 0.0 + auVar222._16_4_ * 0.0;
            auVar321._20_4_ = auVar337._20_4_ + auVar305._20_4_ * 0.0 + auVar222._20_4_ * 0.0;
            auVar321._24_4_ = auVar337._24_4_ + auVar305._24_4_ * 0.0 + auVar222._24_4_ * 0.0;
            auVar321._28_4_ = fVar229 + auVar222._28_4_;
            fVar214 = auVar35._0_4_;
            fVar265 = auVar35._4_4_;
            auVar95._4_4_ = auVar141._4_4_ * fVar265;
            auVar95._0_4_ = auVar141._0_4_ * fVar214;
            fVar232 = auVar35._8_4_;
            auVar95._8_4_ = auVar141._8_4_ * fVar232;
            fVar302 = auVar35._12_4_;
            auVar95._12_4_ = auVar141._12_4_ * fVar302;
            fVar266 = auVar35._16_4_;
            auVar95._16_4_ = auVar141._16_4_ * fVar266;
            fVar239 = auVar35._20_4_;
            auVar95._20_4_ = auVar141._20_4_ * fVar239;
            fVar170 = auVar35._24_4_;
            auVar95._24_4_ = auVar141._24_4_ * fVar170;
            auVar95._28_4_ = fVar229;
            fVar229 = auVar32._0_4_;
            fVar333 = auVar32._4_4_;
            auVar96._4_4_ = auVar364._4_4_ * fVar333;
            auVar96._0_4_ = auVar364._0_4_ * fVar229;
            fVar324 = auVar32._8_4_;
            auVar96._8_4_ = auVar364._8_4_ * fVar324;
            fVar235 = auVar32._12_4_;
            auVar96._12_4_ = auVar364._12_4_ * fVar235;
            fVar316 = auVar32._16_4_;
            auVar96._16_4_ = auVar364._16_4_ * fVar316;
            fVar251 = auVar32._20_4_;
            auVar96._20_4_ = auVar364._20_4_ * fVar251;
            fVar190 = auVar32._24_4_;
            auVar96._24_4_ = auVar364._24_4_ * fVar190;
            auVar96._28_4_ = auVar337._28_4_;
            auVar305 = vsubps_avx(auVar96,auVar95);
            auVar146 = vsubps_avx(auVar146,auVar36);
            fVar249 = auVar146._0_4_;
            fVar193 = auVar146._4_4_;
            auVar97._4_4_ = auVar141._4_4_ * fVar193;
            auVar97._0_4_ = auVar141._0_4_ * fVar249;
            fVar299 = auVar146._8_4_;
            auVar97._8_4_ = auVar141._8_4_ * fVar299;
            fVar326 = auVar146._12_4_;
            auVar97._12_4_ = auVar141._12_4_ * fVar326;
            fVar158 = auVar146._16_4_;
            auVar97._16_4_ = auVar141._16_4_ * fVar158;
            fVar253 = auVar146._20_4_;
            auVar97._20_4_ = auVar141._20_4_ * fVar253;
            fVar191 = auVar146._24_4_;
            auVar97._24_4_ = auVar141._24_4_ * fVar191;
            auVar97._28_4_ = auVar141._28_4_;
            auVar98._4_4_ = fVar333 * auVar36._4_4_;
            auVar98._0_4_ = fVar229 * auVar36._0_4_;
            auVar98._8_4_ = fVar324 * auVar36._8_4_;
            auVar98._12_4_ = fVar235 * auVar36._12_4_;
            auVar98._16_4_ = fVar316 * auVar36._16_4_;
            auVar98._20_4_ = fVar251 * auVar36._20_4_;
            auVar98._24_4_ = fVar190 * auVar36._24_4_;
            auVar98._28_4_ = auVar222._28_4_;
            auVar146 = vsubps_avx(auVar97,auVar98);
            auVar365 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar99._4_4_ = auVar364._4_4_ * fVar193;
            auVar99._0_4_ = auVar364._0_4_ * fVar249;
            auVar99._8_4_ = auVar364._8_4_ * fVar299;
            auVar99._12_4_ = auVar364._12_4_ * fVar326;
            auVar99._16_4_ = auVar364._16_4_ * fVar158;
            auVar99._20_4_ = auVar364._20_4_ * fVar253;
            auVar99._24_4_ = auVar364._24_4_ * fVar191;
            auVar99._28_4_ = auVar364._28_4_;
            auVar100._4_4_ = fVar265 * auVar36._4_4_;
            auVar100._0_4_ = fVar214 * auVar36._0_4_;
            auVar100._8_4_ = fVar232 * auVar36._8_4_;
            auVar100._12_4_ = fVar302 * auVar36._12_4_;
            auVar100._16_4_ = fVar266 * auVar36._16_4_;
            auVar100._20_4_ = fVar239 * auVar36._20_4_;
            auVar100._24_4_ = fVar170 * auVar36._24_4_;
            auVar100._28_4_ = auVar36._28_4_;
            auVar36 = vsubps_avx(auVar100,auVar99);
            auVar364 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar150._0_4_ = auVar305._0_4_ * 0.0 + auVar36._0_4_ + auVar146._0_4_ * 0.0;
            auVar150._4_4_ = auVar305._4_4_ * 0.0 + auVar36._4_4_ + auVar146._4_4_ * 0.0;
            auVar150._8_4_ = auVar305._8_4_ * 0.0 + auVar36._8_4_ + auVar146._8_4_ * 0.0;
            auVar150._12_4_ = auVar305._12_4_ * 0.0 + auVar36._12_4_ + auVar146._12_4_ * 0.0;
            auVar150._16_4_ = auVar305._16_4_ * 0.0 + auVar36._16_4_ + auVar146._16_4_ * 0.0;
            auVar150._20_4_ = auVar305._20_4_ * 0.0 + auVar36._20_4_ + auVar146._20_4_ * 0.0;
            auVar150._24_4_ = auVar305._24_4_ * 0.0 + auVar36._24_4_ + auVar146._24_4_ * 0.0;
            auVar150._28_4_ = auVar146._28_4_ + auVar36._28_4_ + auVar146._28_4_;
            auVar155 = ZEXT3264(auVar150);
            auVar146 = vmaxps_avx(auVar321,auVar150);
            auVar146 = vcmpps_avx(auVar146,auVar364,2);
            auVar36 = local_7c0 & auVar146;
            if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar36 >> 0x7f,0) == '\0') &&
                  (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar36 >> 0xbf,0) == '\0') &&
                (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar36[0x1f]) {
LAB_00fae08c:
              auVar226 = ZEXT3264(CONCAT824(uStack_5e8,
                                            CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
              auVar322._4_4_ = fVar156;
              auVar322._0_4_ = fVar133;
              auVar322._8_4_ = fVar159;
              auVar322._12_4_ = fVar162;
              auVar322._16_4_ = fVar164;
              auVar322._20_4_ = fVar166;
              auVar322._24_4_ = fVar167;
              auVar322._28_4_ = fVar168;
            }
            else {
              auVar36 = vandps_avx(auVar146,local_7c0);
              auVar101._4_4_ = fVar333 * fVar254;
              auVar101._0_4_ = fVar229 * fVar327;
              auVar101._8_4_ = fVar324 * fVar230;
              auVar101._12_4_ = fVar235 * fVar300;
              auVar101._16_4_ = fVar316 * fVar169;
              auVar101._20_4_ = fVar251 * fVar161;
              auVar101._24_4_ = fVar190 * fVar255;
              auVar101._28_4_ = local_7c0._28_4_;
              auVar102._4_4_ = fVar265 * fVar310;
              auVar102._0_4_ = fVar214 * fVar303;
              auVar102._8_4_ = fVar232 * fVar311;
              auVar102._12_4_ = fVar302 * fVar312;
              auVar102._16_4_ = fVar266 * fVar313;
              auVar102._20_4_ = fVar239 * fVar314;
              auVar102._24_4_ = fVar170 * fVar315;
              auVar102._28_4_ = auVar146._28_4_;
              auVar141 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar193 * fVar310;
              auVar103._0_4_ = fVar249 * fVar303;
              auVar103._8_4_ = fVar299 * fVar311;
              auVar103._12_4_ = fVar326 * fVar312;
              auVar103._16_4_ = fVar158 * fVar313;
              auVar103._20_4_ = fVar253 * fVar314;
              auVar103._24_4_ = fVar191 * fVar315;
              auVar103._28_4_ = auVar244._28_4_;
              auVar104._4_4_ = fVar333 * fVar264;
              auVar104._0_4_ = fVar229 * fVar233;
              auVar104._8_4_ = fVar324 * fVar298;
              auVar104._12_4_ = fVar235 * fVar301;
              auVar104._16_4_ = fVar316 * fVar194;
              auVar104._20_4_ = fVar251 * fVar213;
              auVar104._24_4_ = fVar190 * fVar160;
              auVar104._28_4_ = auVar32._28_4_;
              auVar222 = vsubps_avx(auVar104,auVar103);
              auVar105._4_4_ = fVar265 * fVar264;
              auVar105._0_4_ = fVar214 * fVar233;
              auVar105._8_4_ = fVar232 * fVar298;
              auVar105._12_4_ = fVar302 * fVar301;
              auVar105._16_4_ = fVar266 * fVar194;
              auVar105._20_4_ = fVar239 * fVar213;
              auVar105._24_4_ = fVar170 * fVar160;
              auVar105._28_4_ = auVar221._28_4_;
              auVar106._4_4_ = fVar193 * fVar254;
              auVar106._0_4_ = fVar249 * fVar327;
              auVar106._8_4_ = fVar299 * fVar230;
              auVar106._12_4_ = fVar326 * fVar300;
              auVar106._16_4_ = fVar158 * fVar169;
              auVar106._20_4_ = fVar253 * fVar161;
              auVar106._24_4_ = fVar191 * fVar255;
              auVar106._28_4_ = auVar34._28_4_;
              auVar244 = vsubps_avx(auVar106,auVar105);
              auVar296._0_4_ = auVar141._0_4_ * 0.0 + auVar244._0_4_ + auVar222._0_4_ * 0.0;
              auVar296._4_4_ = auVar141._4_4_ * 0.0 + auVar244._4_4_ + auVar222._4_4_ * 0.0;
              auVar296._8_4_ = auVar141._8_4_ * 0.0 + auVar244._8_4_ + auVar222._8_4_ * 0.0;
              auVar296._12_4_ = auVar141._12_4_ * 0.0 + auVar244._12_4_ + auVar222._12_4_ * 0.0;
              auVar296._16_4_ = auVar141._16_4_ * 0.0 + auVar244._16_4_ + auVar222._16_4_ * 0.0;
              auVar296._20_4_ = auVar141._20_4_ * 0.0 + auVar244._20_4_ + auVar222._20_4_ * 0.0;
              auVar296._24_4_ = auVar141._24_4_ * 0.0 + auVar244._24_4_ + auVar222._24_4_ * 0.0;
              auVar296._28_4_ = auVar35._28_4_ + auVar244._28_4_ + auVar221._28_4_;
              auVar146 = vrcpps_avx(auVar296);
              fVar327 = auVar146._0_4_;
              fVar233 = auVar146._4_4_;
              auVar107._4_4_ = auVar296._4_4_ * fVar233;
              auVar107._0_4_ = auVar296._0_4_ * fVar327;
              fVar214 = auVar146._8_4_;
              auVar107._8_4_ = auVar296._8_4_ * fVar214;
              fVar229 = auVar146._12_4_;
              auVar107._12_4_ = auVar296._12_4_ * fVar229;
              fVar249 = auVar146._16_4_;
              auVar107._16_4_ = auVar296._16_4_ * fVar249;
              fVar254 = auVar146._20_4_;
              auVar107._20_4_ = auVar296._20_4_ * fVar254;
              fVar264 = auVar146._24_4_;
              auVar107._24_4_ = auVar296._24_4_ * fVar264;
              auVar107._28_4_ = auVar32._28_4_;
              auVar341._8_4_ = 0x3f800000;
              auVar341._0_8_ = 0x3f8000003f800000;
              auVar341._12_4_ = 0x3f800000;
              auVar341._16_4_ = 0x3f800000;
              auVar341._20_4_ = 0x3f800000;
              auVar341._24_4_ = 0x3f800000;
              auVar341._28_4_ = 0x3f800000;
              auVar146 = vsubps_avx(auVar341,auVar107);
              fVar327 = auVar146._0_4_ * fVar327 + fVar327;
              fVar233 = auVar146._4_4_ * fVar233 + fVar233;
              fVar214 = auVar146._8_4_ * fVar214 + fVar214;
              fVar229 = auVar146._12_4_ * fVar229 + fVar229;
              fVar249 = auVar146._16_4_ * fVar249 + fVar249;
              fVar254 = auVar146._20_4_ * fVar254 + fVar254;
              fVar264 = auVar146._24_4_ * fVar264 + fVar264;
              auVar108._4_4_ =
                   (fVar263 * auVar141._4_4_ + auVar222._4_4_ * fVar256 + fVar275 * auVar244._4_4_)
                   * fVar233;
              auVar108._0_4_ =
                   (fVar212 * auVar141._0_4_ + auVar222._0_4_ * fVar228 + fVar192 * auVar244._0_4_)
                   * fVar327;
              auVar108._8_4_ =
                   (fVar274 * auVar141._8_4_ + auVar222._8_4_ * fVar323 + fVar276 * auVar244._8_4_)
                   * fVar214;
              auVar108._12_4_ =
                   (fVar325 * auVar141._12_4_ +
                   auVar222._12_4_ * fVar234 + fVar287 * auVar244._12_4_) * fVar229;
              auVar108._16_4_ =
                   (fVar277 * auVar141._16_4_ +
                   auVar222._16_4_ * fVar195 + fVar288 * auVar244._16_4_) * fVar249;
              auVar108._20_4_ =
                   (fVar165 * auVar141._20_4_ +
                   auVar222._20_4_ * fVar163 + fVar289 * auVar244._20_4_) * fVar254;
              auVar108._24_4_ =
                   (fVar157 * auVar141._24_4_ +
                   auVar222._24_4_ * fVar236 + fVar290 * auVar244._24_4_) * fVar264;
              auVar108._28_4_ = auVar31._28_4_ + auVar244._28_4_;
              auVar262 = ZEXT3264(auVar108);
              uVar13 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar225._4_4_ = uVar13;
              auVar225._0_4_ = uVar13;
              auVar225._8_4_ = uVar13;
              auVar225._12_4_ = uVar13;
              auVar225._16_4_ = uVar13;
              auVar225._20_4_ = uVar13;
              auVar225._24_4_ = uVar13;
              auVar225._28_4_ = uVar13;
              auVar31 = vcmpps_avx(local_100,auVar108,2);
              auVar146 = vcmpps_avx(auVar108,auVar225,2);
              auVar146 = vandps_avx(auVar31,auVar146);
              auVar32 = auVar36 & auVar146;
              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar32 >> 0x7f,0) == '\0') &&
                    (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar32 >> 0xbf,0) == '\0') &&
                  (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar32[0x1f]) goto LAB_00fae08c;
              auVar146 = vandps_avx(auVar36,auVar146);
              auVar32 = vcmpps_avx(auVar296,auVar364,4);
              auVar36 = auVar146 & auVar32;
              auVar226 = ZEXT3264(CONCAT824(uStack_5e8,
                                            CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
              auVar322._4_4_ = fVar156;
              auVar322._0_4_ = fVar133;
              auVar322._8_4_ = fVar159;
              auVar322._12_4_ = fVar162;
              auVar322._16_4_ = fVar164;
              auVar322._20_4_ = fVar166;
              auVar322._24_4_ = fVar167;
              auVar322._28_4_ = fVar168;
              if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar36 >> 0x7f,0) != '\0') ||
                    (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0xbf,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar36[0x1f] < '\0') {
                auVar146 = vandps_avx(auVar32,auVar146);
                auVar226 = ZEXT3264(auVar146);
                auVar109._4_4_ = auVar321._4_4_ * fVar233;
                auVar109._0_4_ = auVar321._0_4_ * fVar327;
                auVar109._8_4_ = auVar321._8_4_ * fVar214;
                auVar109._12_4_ = auVar321._12_4_ * fVar229;
                auVar109._16_4_ = auVar321._16_4_ * fVar249;
                auVar109._20_4_ = auVar321._20_4_ * fVar254;
                auVar109._24_4_ = auVar321._24_4_ * fVar264;
                auVar109._28_4_ = auVar31._28_4_;
                auVar110._4_4_ = auVar150._4_4_ * fVar233;
                auVar110._0_4_ = auVar150._0_4_ * fVar327;
                auVar110._8_4_ = auVar150._8_4_ * fVar214;
                auVar110._12_4_ = auVar150._12_4_ * fVar229;
                auVar110._16_4_ = auVar150._16_4_ * fVar249;
                auVar110._20_4_ = auVar150._20_4_ * fVar254;
                auVar110._24_4_ = auVar150._24_4_ * fVar264;
                auVar110._28_4_ = auVar150._28_4_;
                auVar273._8_4_ = 0x3f800000;
                auVar273._0_8_ = 0x3f8000003f800000;
                auVar273._12_4_ = 0x3f800000;
                auVar273._16_4_ = 0x3f800000;
                auVar273._20_4_ = 0x3f800000;
                auVar273._24_4_ = 0x3f800000;
                auVar273._28_4_ = 0x3f800000;
                auVar146 = vsubps_avx(auVar273,auVar109);
                local_4e0 = vblendvps_avx(auVar146,auVar109,auVar284);
                auVar146 = vsubps_avx(auVar273,auVar110);
                _local_500 = vblendvps_avx(auVar146,auVar110,auVar284);
                auVar155 = ZEXT3264(_local_500);
                local_5c0 = auVar108;
              }
            }
            auVar309 = ZEXT3264(local_7a0);
            auVar146 = auVar226._0_32_;
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0x7f,0) != '\0') ||
                  (auVar226 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar146 >> 0xbf,0) != '\0') ||
                (auVar226 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar226[0x1f] < '\0') {
              auVar31 = vsubps_avx(auVar286,auVar322);
              fVar228 = auVar322._0_4_ + local_4e0._0_4_ * auVar31._0_4_;
              fVar212 = auVar322._4_4_ + local_4e0._4_4_ * auVar31._4_4_;
              fVar233 = auVar322._8_4_ + local_4e0._8_4_ * auVar31._8_4_;
              fVar214 = auVar322._12_4_ + local_4e0._12_4_ * auVar31._12_4_;
              fVar229 = auVar322._16_4_ + local_4e0._16_4_ * auVar31._16_4_;
              fVar249 = auVar322._20_4_ + local_4e0._20_4_ * auVar31._20_4_;
              fVar254 = auVar322._24_4_ + local_4e0._24_4_ * auVar31._24_4_;
              fVar256 = auVar322._28_4_ + auVar31._28_4_;
              fVar327 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar111._4_4_ = (fVar212 + fVar212) * fVar327;
              auVar111._0_4_ = (fVar228 + fVar228) * fVar327;
              auVar111._8_4_ = (fVar233 + fVar233) * fVar327;
              auVar111._12_4_ = (fVar214 + fVar214) * fVar327;
              auVar111._16_4_ = (fVar229 + fVar229) * fVar327;
              auVar111._20_4_ = (fVar249 + fVar249) * fVar327;
              auVar111._24_4_ = (fVar254 + fVar254) * fVar327;
              auVar111._28_4_ = fVar256 + fVar256;
              auVar31 = vcmpps_avx(local_5c0,auVar111,6);
              auVar155 = ZEXT3264(auVar31);
              auVar32 = auVar146 & auVar31;
              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar32 >> 0x7f,0) != '\0') ||
                    (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0xbf,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar32[0x1f] < '\0') {
                local_3c0 = (float)local_500._0_4_ + (float)local_500._0_4_ + -1.0;
                fStack_3bc = (float)local_500._4_4_ + (float)local_500._4_4_ + -1.0;
                fStack_3b8 = (float)uStack_4f8 + (float)uStack_4f8 + -1.0;
                fStack_3b4 = uStack_4f8._4_4_ + uStack_4f8._4_4_ + -1.0;
                fStack_3b0 = (float)uStack_4f0 + (float)uStack_4f0 + -1.0;
                fStack_3ac = uStack_4f0._4_4_ + uStack_4f0._4_4_ + -1.0;
                fStack_3a8 = (float)uStack_4e8 + (float)uStack_4e8 + -1.0;
                fStack_3a4 = uStack_4e8._4_4_ + uStack_4e8._4_4_ + -1.0;
                local_500._4_4_ = fStack_3bc;
                local_500._0_4_ = local_3c0;
                uStack_4f8._0_4_ = fStack_3b8;
                uStack_4f8._4_4_ = fStack_3b4;
                uStack_4f0._0_4_ = fStack_3b0;
                uStack_4f0._4_4_ = fStack_3ac;
                auVar122 = _local_500;
                uStack_4e8._0_4_ = fStack_3a8;
                uStack_4e8._4_4_ = fStack_3a4;
                auVar32 = _local_500;
                local_3a0 = local_5c0;
                uStack_368 = uStack_8d8;
                uStack_358 = uStack_838;
                uStack_348 = uStack_848;
                uStack_338 = uStack_858;
                auVar131 = (undefined1  [8])(context->scene->geometries).items[uVar15].ptr;
                _local_500 = auVar32;
                if ((((Geometry *)auVar131)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_640 = vandps_avx(auVar31,auVar146);
                  auVar201._0_4_ = (float)(int)local_380;
                  auVar201._4_8_ = SUB128(ZEXT812(0),4);
                  auVar201._12_4_ = 0;
                  auVar176 = vshufps_avx(auVar201,auVar201,0);
                  local_300[0] = (auVar176._0_4_ + local_4e0._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_300[1] = (auVar176._4_4_ + local_4e0._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_300[2] = (auVar176._8_4_ + local_4e0._8_4_ + 2.0) * fStack_138;
                  local_300[3] = (auVar176._12_4_ + local_4e0._12_4_ + 3.0) * fStack_134;
                  fStack_2f0 = (auVar176._0_4_ + local_4e0._16_4_ + 4.0) * fStack_130;
                  fStack_2ec = (auVar176._4_4_ + local_4e0._20_4_ + 5.0) * fStack_12c;
                  fStack_2e8 = (auVar176._8_4_ + local_4e0._24_4_ + 6.0) * fStack_128;
                  fStack_2e4 = auVar176._12_4_ + local_4e0._28_4_ + 7.0;
                  uStack_4f0 = auVar122._16_8_;
                  uStack_4e8 = auVar32._24_8_;
                  local_2e0 = local_500;
                  uStack_2d8 = uStack_4f8;
                  uStack_2d0 = uStack_4f0;
                  uStack_2c8 = uStack_4e8;
                  local_2c0 = local_5c0;
                  auVar185._8_4_ = 0x7f800000;
                  auVar185._0_8_ = 0x7f8000007f800000;
                  auVar185._12_4_ = 0x7f800000;
                  auVar185._16_4_ = 0x7f800000;
                  auVar185._20_4_ = 0x7f800000;
                  auVar185._24_4_ = 0x7f800000;
                  auVar185._28_4_ = 0x7f800000;
                  auVar146 = vblendvps_avx(auVar185,local_5c0,local_640);
                  auVar31 = vshufps_avx(auVar146,auVar146,0xb1);
                  auVar31 = vminps_avx(auVar146,auVar31);
                  auVar32 = vshufpd_avx(auVar31,auVar31,5);
                  auVar31 = vminps_avx(auVar31,auVar32);
                  auVar32 = vperm2f128_avx(auVar31,auVar31,1);
                  auVar31 = vminps_avx(auVar31,auVar32);
                  auVar31 = vcmpps_avx(auVar146,auVar31,0);
                  auVar32 = local_640 & auVar31;
                  auVar146 = local_640;
                  if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar32 >> 0x7f,0) != '\0') ||
                        (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar32 >> 0xbf,0) != '\0') ||
                      (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar32[0x1f] < '\0') {
                    auVar146 = vandps_avx(auVar31,local_640);
                  }
                  uVar126 = vmovmskps_avx(auVar146);
                  uVar129 = 0;
                  if (uVar126 != 0) {
                    for (; (uVar126 >> uVar129 & 1) == 0; uVar129 = uVar129 + 1) {
                    }
                  }
                  uVar127 = (ulong)uVar129;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)auVar131)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar327 = local_300[uVar127];
                    auVar155 = ZEXT464((uint)fVar327);
                    fVar212 = 1.0 - fVar327;
                    fVar228 = fVar327 * 3.0;
                    auVar262 = ZEXT464(0x3f000000);
                    auVar176 = ZEXT416((uint)((fVar212 * -2.0 * fVar327 + fVar327 * fVar327) * 0.5))
                    ;
                    auVar176 = vshufps_avx(auVar176,auVar176,0);
                    auVar202 = ZEXT416((uint)(((fVar212 + fVar212) * (fVar228 + 2.0) +
                                              fVar212 * fVar212 * -3.0) * 0.5));
                    auVar202 = vshufps_avx(auVar202,auVar202,0);
                    auVar203 = ZEXT416((uint)(((fVar327 + fVar327) * (fVar228 + -5.0) +
                                              fVar327 * fVar228) * 0.5));
                    auVar203 = vshufps_avx(auVar203,auVar203,0);
                    uVar13 = *(undefined4 *)((long)&local_2e0 + uVar127 * 4);
                    auVar219 = ZEXT416((uint)((fVar327 * (fVar212 + fVar212) - fVar212 * fVar212) *
                                             0.5));
                    auVar219 = vshufps_avx(auVar219,auVar219,0);
                    auVar177._0_4_ =
                         auVar219._0_4_ * fVar238 +
                         auVar203._0_4_ * fVar350 +
                         auVar176._0_4_ * fVar334 + auVar202._0_4_ * fVar358;
                    auVar177._4_4_ =
                         auVar219._4_4_ * fVar250 +
                         auVar203._4_4_ * fVar354 +
                         auVar176._4_4_ * fVar342 + auVar202._4_4_ * fVar366;
                    auVar177._8_4_ =
                         auVar219._8_4_ * auVar242._8_4_ +
                         auVar203._8_4_ * auVar352._8_4_ +
                         auVar176._8_4_ * auVar336._8_4_ + auVar202._8_4_ * auVar360._8_4_;
                    auVar177._12_4_ =
                         auVar219._12_4_ * auVar242._12_4_ +
                         auVar203._12_4_ * auVar352._12_4_ +
                         auVar176._12_4_ * auVar336._12_4_ + auVar202._12_4_ * auVar360._12_4_;
                    auVar226 = ZEXT464(*(uint *)(local_2c0 + uVar127 * 4));
                    *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_2c0 + uVar127 * 4);
                    *(float *)(ray + k * 4 + 0x180) = auVar177._0_4_;
                    uVar18 = vextractps_avx(auVar177,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar18;
                    uVar18 = vextractps_avx(auVar177,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar18;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar327;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar13;
                    *(uint *)(ray + k * 4 + 0x220) = uVar16;
                    *(uint *)(ray + k * 4 + 0x240) = uVar15;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    auVar176 = *local_750;
                    local_7e0._16_8_ = *(undefined8 *)(local_758 + 0x10);
                    local_7e0._24_8_ = *(undefined8 *)(local_758 + 0x18);
                    local_700._16_8_ = *(undefined8 *)(local_758 + 0x10);
                    local_700._0_16_ = *local_750;
                    local_700._24_8_ = *(undefined8 *)(local_758 + 0x18);
                    auVar309 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    auVar297 = ZEXT3264(local_5c0);
                    local_800 = auVar131;
                    _local_740 = auVar33;
                    _local_6a0 = auVar319;
                    _local_680 = *pauVar12;
                    local_3e0 = local_4e0;
                    local_37c = uVar17;
                    local_370 = auVar242._0_8_;
                    local_360 = auVar352._0_8_;
                    local_350 = auVar360._0_8_;
                    local_340 = auVar336._0_8_;
                    while( true ) {
                      local_200 = local_300[uVar127];
                      local_1e0 = *(undefined4 *)((long)&local_2e0 + uVar127 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_2c0 + uVar127 * 4);
                      fVar212 = 1.0 - local_200;
                      fVar228 = local_200 * 3.0;
                      fVar327 = (local_200 + local_200) * (fVar228 + -5.0) + local_200 * fVar228;
                      auVar262 = ZEXT464((uint)fVar327);
                      auVar202 = ZEXT416((uint)((fVar212 * -2.0 * local_200 + local_200 * local_200)
                                               * 0.5));
                      auVar202 = vshufps_avx(auVar202,auVar202,0);
                      auVar203 = ZEXT416((uint)(((fVar212 + fVar212) * (fVar228 + 2.0) +
                                                fVar212 * fVar212 * -3.0) * 0.5));
                      auVar203 = vshufps_avx(auVar203,auVar203,0);
                      auVar219 = vshufps_avx(ZEXT416((uint)(fVar327 * 0.5)),
                                             ZEXT416((uint)(fVar327 * 0.5)),0);
                      local_830.context = context->user;
                      auVar220 = ZEXT416((uint)((local_200 * (fVar212 + fVar212) - fVar212 * fVar212
                                                ) * 0.5));
                      auVar220 = vshufps_avx(auVar220,auVar220,0);
                      auVar204._0_4_ =
                           auVar220._0_4_ * fVar238 +
                           auVar219._0_4_ * fVar350 +
                           auVar202._0_4_ * fVar334 + auVar203._0_4_ * fVar358;
                      auVar204._4_4_ =
                           auVar220._4_4_ * fVar250 +
                           auVar219._4_4_ * fVar354 +
                           auVar202._4_4_ * fVar342 + auVar203._4_4_ * fVar366;
                      auVar204._8_4_ =
                           auVar220._8_4_ * auVar242._8_4_ +
                           auVar219._8_4_ * auVar352._8_4_ +
                           auVar202._8_4_ * auVar336._8_4_ + auVar203._8_4_ * auVar360._8_4_;
                      auVar204._12_4_ =
                           auVar220._12_4_ * auVar242._12_4_ +
                           auVar219._12_4_ * auVar352._12_4_ +
                           auVar202._12_4_ * auVar336._12_4_ + auVar203._12_4_ * auVar360._12_4_;
                      auStack_250 = vshufps_avx(auVar204,auVar204,0);
                      local_260[0] = (RTCHitN)auStack_250[0];
                      local_260[1] = (RTCHitN)auStack_250[1];
                      local_260[2] = (RTCHitN)auStack_250[2];
                      local_260[3] = (RTCHitN)auStack_250[3];
                      local_260[4] = (RTCHitN)auStack_250[4];
                      local_260[5] = (RTCHitN)auStack_250[5];
                      local_260[6] = (RTCHitN)auStack_250[6];
                      local_260[7] = (RTCHitN)auStack_250[7];
                      local_260[8] = (RTCHitN)auStack_250[8];
                      local_260[9] = (RTCHitN)auStack_250[9];
                      local_260[10] = (RTCHitN)auStack_250[10];
                      local_260[0xb] = (RTCHitN)auStack_250[0xb];
                      local_260[0xc] = (RTCHitN)auStack_250[0xc];
                      local_260[0xd] = (RTCHitN)auStack_250[0xd];
                      local_260[0xe] = (RTCHitN)auStack_250[0xe];
                      local_260[0xf] = (RTCHitN)auStack_250[0xf];
                      auStack_230 = vshufps_avx(auVar204,auVar204,0x55);
                      local_240 = auStack_230;
                      auStack_210 = vshufps_avx(auVar204,auVar204,0xaa);
                      local_220 = auStack_210;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_120._0_8_;
                      uStack_1b8 = local_120._8_8_;
                      uStack_1b0 = local_120._16_8_;
                      uStack_1a8 = local_120._24_8_;
                      local_1a0 = local_560._0_8_;
                      uStack_198 = local_560._8_8_;
                      uStack_190 = local_560._16_8_;
                      uStack_188 = local_560._24_8_;
                      auVar319 = vcmpps_avx(auVar365._0_32_,auVar365._0_32_,0xf);
                      local_748[1] = auVar319;
                      *local_748 = auVar319;
                      local_180 = (local_830.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_830.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_780 = local_700._0_8_;
                      uStack_778 = local_700._8_8_;
                      uStack_770 = local_700._16_8_;
                      uStack_768 = local_700._24_8_;
                      local_830.valid = (int *)&local_780;
                      local_830.geometryUserPtr = ((Geometry *)auVar131)->userPtr;
                      local_830.hit = local_260;
                      local_830.N = 8;
                      auVar139 = local_7e0._0_16_;
                      auVar178 = auVar176;
                      local_830.ray = (RTCRayN *)ray;
                      if (((Geometry *)auVar131)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar262 = ZEXT464((uint)fVar327);
                        local_7c0 = auVar319;
                        (*((Geometry *)auVar131)->intersectionFilterN)(&local_830);
                        auVar309 = ZEXT1664(auVar309._0_16_);
                        auVar297 = ZEXT3264(local_5c0);
                        auVar365 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar178._8_8_ = uStack_778;
                        auVar178._0_8_ = local_780;
                        auVar139._8_8_ = uStack_768;
                        auVar139._0_8_ = uStack_770;
                        auVar131 = local_800;
                        auVar319 = local_7c0;
                      }
                      auVar202 = vpcmpeqd_avx(auVar178,ZEXT816(0) << 0x40);
                      auVar203 = vpcmpeqd_avx(auVar139,ZEXT816(0) << 0x40);
                      auVar226 = ZEXT1664(auVar203);
                      auVar207._16_16_ = auVar203;
                      auVar207._0_16_ = auVar202;
                      auVar146 = auVar319 & ~auVar207;
                      if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar146 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar146 >> 0x7f,0) == '\0') &&
                            (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar146 >> 0xbf,0) == '\0') &&
                          (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar146[0x1f]) {
                        auVar151._0_4_ = auVar202._0_4_ ^ auVar319._0_4_;
                        auVar151._4_4_ = auVar202._4_4_ ^ auVar319._4_4_;
                        auVar151._8_4_ = auVar202._8_4_ ^ auVar319._8_4_;
                        auVar151._12_4_ = auVar202._12_4_ ^ auVar319._12_4_;
                        auVar151._16_4_ = auVar203._0_4_ ^ auVar319._16_4_;
                        auVar151._20_4_ = auVar203._4_4_ ^ auVar319._20_4_;
                        auVar151._24_4_ = auVar203._8_4_ ^ auVar319._24_4_;
                        auVar151._28_4_ = auVar203._12_4_ ^ auVar319._28_4_;
                      }
                      else {
                        p_Var22 = context->args->filter;
                        if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((((Geometry *)auVar131)->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar226 = ZEXT1664(auVar203);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          local_7c0 = auVar319;
                          (*p_Var22)(&local_830);
                          auVar309 = ZEXT1664(auVar309._0_16_);
                          auVar297 = ZEXT3264(local_5c0);
                          auVar365 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar178._8_8_ = uStack_778;
                          auVar178._0_8_ = local_780;
                          auVar139._8_8_ = uStack_768;
                          auVar139._0_8_ = uStack_770;
                          auVar131 = local_800;
                          auVar319 = local_7c0;
                        }
                        auVar202 = vpcmpeqd_avx(auVar178,ZEXT816(0) << 0x40);
                        auVar203 = vpcmpeqd_avx(auVar139,ZEXT816(0) << 0x40);
                        auVar186._16_16_ = auVar203;
                        auVar186._0_16_ = auVar202;
                        auVar151._0_4_ = auVar202._0_4_ ^ auVar319._0_4_;
                        auVar151._4_4_ = auVar202._4_4_ ^ auVar319._4_4_;
                        auVar151._8_4_ = auVar202._8_4_ ^ auVar319._8_4_;
                        auVar151._12_4_ = auVar202._12_4_ ^ auVar319._12_4_;
                        auVar151._16_4_ = auVar203._0_4_ ^ auVar319._16_4_;
                        auVar151._20_4_ = auVar203._4_4_ ^ auVar319._20_4_;
                        auVar151._24_4_ = auVar203._8_4_ ^ auVar319._24_4_;
                        auVar151._28_4_ = auVar203._12_4_ ^ auVar319._28_4_;
                        auVar319 = auVar319 & ~auVar186;
                        if ((((((((auVar319 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar319 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar319 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar319 >> 0x7f,0) != '\0')
                              || (auVar319 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar319 >> 0xbf,0) != '\0') ||
                            (auVar319 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar319[0x1f] < '\0') {
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])local_830.hit);
                          *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar319;
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x20));
                          *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar319;
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x40));
                          *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar319;
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x60));
                          *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar319;
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x80));
                          *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar319;
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])
                                                              (local_830.hit + 0xa0));
                          *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar319;
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])
                                                              (local_830.hit + 0xc0));
                          *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar319;
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])
                                                              (local_830.hit + 0xe0));
                          *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar319;
                          auVar319 = vmaskmovps_avx(auVar151,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x100));
                          *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar319;
                        }
                      }
                      if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar151 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar151 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar151 >> 0x7f,0) == '\0') &&
                            (auVar151 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar151 >> 0xbf,0) == '\0') &&
                          (auVar151 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar151[0x1f]) {
                        *(int *)(ray + k * 4 + 0x100) = auVar309._0_4_;
                      }
                      else {
                        auVar309 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      *(undefined4 *)(local_640 + uVar127 * 4) = 0;
                      auVar202 = vshufps_avx(auVar309._0_16_,auVar309._0_16_,0);
                      auVar152._16_16_ = auVar202;
                      auVar152._0_16_ = auVar202;
                      auVar146 = vcmpps_avx(auVar297._0_32_,auVar152,2);
                      auVar319 = vandps_avx(auVar146,local_640);
                      auVar155 = ZEXT3264(auVar319);
                      local_640 = local_640 & auVar146;
                      if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_640 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_640 >> 0x7f,0) == '\0') &&
                            (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_640 >> 0xbf,0) == '\0') &&
                          (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_640[0x1f]) break;
                      auVar187._8_4_ = 0x7f800000;
                      auVar187._0_8_ = 0x7f8000007f800000;
                      auVar187._12_4_ = 0x7f800000;
                      auVar187._16_4_ = 0x7f800000;
                      auVar187._20_4_ = 0x7f800000;
                      auVar187._24_4_ = 0x7f800000;
                      auVar187._28_4_ = 0x7f800000;
                      auVar146 = vblendvps_avx(auVar187,auVar297._0_32_,auVar319);
                      auVar33 = vshufps_avx(auVar146,auVar146,0xb1);
                      auVar33 = vminps_avx(auVar146,auVar33);
                      auVar31 = vshufpd_avx(auVar33,auVar33,5);
                      auVar33 = vminps_avx(auVar33,auVar31);
                      auVar31 = vperm2f128_avx(auVar33,auVar33,1);
                      auVar33 = vminps_avx(auVar33,auVar31);
                      auVar33 = vcmpps_avx(auVar146,auVar33,0);
                      auVar31 = auVar319 & auVar33;
                      auVar146 = auVar319;
                      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar31 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar31 >> 0x7f,0) != '\0') ||
                            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar31 >> 0xbf,0) != '\0') ||
                          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar31[0x1f] < '\0') {
                        auVar146 = vandps_avx(auVar33,auVar319);
                      }
                      uVar126 = vmovmskps_avx(auVar146);
                      uVar129 = 0;
                      if (uVar126 != 0) {
                        for (; (uVar126 >> uVar129 & 1) == 0; uVar129 = uVar129 + 1) {
                        }
                      }
                      uVar127 = (ulong)uVar129;
                      local_640 = auVar319;
                    }
                    auVar309 = ZEXT3264(local_7a0);
                  }
                }
              }
            }
            fVar327 = (float)local_660._0_4_;
            fVar233 = (float)local_660._4_4_;
            fVar229 = fStack_658;
            fVar249 = fStack_654;
            fVar254 = fStack_650;
            fVar256 = fStack_64c;
            fVar263 = fStack_648;
          }
          lVar132 = lVar132 + 8;
          fVar239 = (float)local_6e0._0_4_;
          fVar251 = (float)local_6e0._4_4_;
          fVar253 = fStack_6d8;
          fVar255 = fStack_6d4;
          fVar228 = fStack_6d0;
          fVar212 = fStack_6cc;
          fVar214 = fStack_6c8;
        } while ((int)lVar132 < (int)uVar17);
      }
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar137._4_4_ = uVar13;
      auVar137._0_4_ = uVar13;
      auVar137._8_4_ = uVar13;
      auVar137._12_4_ = uVar13;
      auVar176 = vcmpps_avx(local_3f0,auVar137,2);
      uVar129 = vmovmskps_avx(auVar176);
      uVar124 = uVar124 & uVar124 + 0xf & uVar129;
    } while (uVar124 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }